

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Primitive PVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  long lVar27;
  RTCFilterFunctionN p_Var28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  bool bVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  bool bVar87;
  uint uVar88;
  uint uVar89;
  int iVar90;
  ulong uVar91;
  uint uVar92;
  ulong uVar93;
  long lVar95;
  long lVar96;
  long lVar97;
  LinearSpace3fa *pLVar98;
  bool bVar99;
  float t1;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar114 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar154;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar180;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  float fVar181;
  float fVar211;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar209;
  float fVar210;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar215;
  float fVar242;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar240;
  float fVar241;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar246;
  float fVar262;
  float fVar263;
  vfloat4 b0;
  undefined1 auVar247 [16];
  float fVar264;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar261 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar271 [16];
  float fVar278;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar341;
  float fVar342;
  float fVar354;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar353;
  float fVar355;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar359;
  float fVar370;
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar369;
  float fVar371;
  undefined1 auVar362 [16];
  float fVar367;
  float fVar368;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float in_register_0000151c;
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float fVar378;
  float fVar379;
  float fVar391;
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar383 [16];
  undefined1 auVar382 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  float fVar389;
  float fVar390;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar392;
  float fVar393;
  undefined1 auVar388 [32];
  float fVar394;
  float fVar395;
  float fVar404;
  float fVar405;
  vfloat4 a0;
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  float fVar406;
  undefined1 auVar401 [16];
  float in_register_0000159c;
  undefined1 auVar402 [32];
  undefined1 auVar403 [64];
  float fVar407;
  float fVar414;
  float fVar415;
  float fVar416;
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_609;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined1 local_508 [8];
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  LinearSpace3fa *local_430;
  Primitive *local_428;
  ulong local_420;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  uint auStack_3a8 [4];
  RTCFilterFunctionNArguments local_398;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar94;
  undefined1 auVar208 [32];
  undefined1 auVar413 [32];
  
  PVar22 = prim[1];
  uVar91 = (ulong)(byte)PVar22;
  lVar96 = uVar91 * 0x25;
  fVar181 = *(float *)(prim + lVar96 + 0x12);
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar131 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar131 = vinsertps_avx(auVar131,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar140 = vsubps_avx(auVar140,*(undefined1 (*) [16])(prim + lVar96 + 6));
  auVar125._0_4_ = fVar181 * auVar140._0_4_;
  auVar125._4_4_ = fVar181 * auVar140._4_4_;
  auVar125._8_4_ = fVar181 * auVar140._8_4_;
  auVar125._12_4_ = fVar181 * auVar140._12_4_;
  auVar247._0_4_ = fVar181 * auVar131._0_4_;
  auVar247._4_4_ = fVar181 * auVar131._4_4_;
  auVar247._8_4_ = fVar181 * auVar131._8_4_;
  auVar247._12_4_ = fVar181 * auVar131._12_4_;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 10)));
  auVar117._16_16_ = auVar131;
  auVar117._0_16_ = auVar140;
  lVar1 = uVar91 * 5;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar174._16_16_ = auVar131;
  auVar174._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar174);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 10)));
  auVar201._16_16_ = auVar131;
  auVar201._0_16_ = auVar140;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 6)));
  auVar30 = vcvtdq2ps_avx(auVar201);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xf + 10)));
  auVar202._16_16_ = auVar131;
  auVar202._0_16_ = auVar140;
  lVar97 = (ulong)(byte)PVar22 * 0x10;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + 6)));
  auVar31 = vcvtdq2ps_avx(auVar202);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + 10)));
  auVar276._16_16_ = auVar131;
  auVar276._0_16_ = auVar140;
  auVar32 = vcvtdq2ps_avx(auVar276);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + uVar91 + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar97 + uVar91 + 10)));
  auVar287._16_16_ = auVar131;
  auVar287._0_16_ = auVar140;
  auVar33 = vcvtdq2ps_avx(auVar287);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1a + 10)));
  auVar307._16_16_ = auVar131;
  auVar307._0_16_ = auVar140;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1b + 10)));
  auVar34 = vcvtdq2ps_avx(auVar307);
  auVar324._16_16_ = auVar131;
  auVar324._0_16_ = auVar140;
  auVar35 = vcvtdq2ps_avx(auVar324);
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 6)));
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0x1c + 10)));
  auVar336._16_16_ = auVar131;
  auVar336._0_16_ = auVar140;
  auVar36 = vcvtdq2ps_avx(auVar336);
  auVar140 = vshufps_avx(auVar247,auVar247,0);
  auVar131 = vshufps_avx(auVar247,auVar247,0x55);
  auVar111 = vshufps_avx(auVar247,auVar247,0xaa);
  fVar181 = auVar111._0_4_;
  fVar154 = auVar111._4_4_;
  fVar209 = auVar111._8_4_;
  fVar180 = auVar111._12_4_;
  fVar210 = auVar131._0_4_;
  fVar394 = auVar131._4_4_;
  fVar211 = auVar131._8_4_;
  fVar405 = auVar131._12_4_;
  fVar212 = auVar140._0_4_;
  fVar213 = auVar140._4_4_;
  fVar214 = auVar140._8_4_;
  fVar215 = auVar140._12_4_;
  auVar363._0_4_ = fVar212 * auVar117._0_4_ + fVar210 * auVar29._0_4_ + fVar181 * auVar30._0_4_;
  auVar363._4_4_ = fVar213 * auVar117._4_4_ + fVar394 * auVar29._4_4_ + fVar154 * auVar30._4_4_;
  auVar363._8_4_ = fVar214 * auVar117._8_4_ + fVar211 * auVar29._8_4_ + fVar209 * auVar30._8_4_;
  auVar363._12_4_ = fVar215 * auVar117._12_4_ + fVar405 * auVar29._12_4_ + fVar180 * auVar30._12_4_;
  auVar363._16_4_ = fVar212 * auVar117._16_4_ + fVar210 * auVar29._16_4_ + fVar181 * auVar30._16_4_;
  auVar363._20_4_ = fVar213 * auVar117._20_4_ + fVar394 * auVar29._20_4_ + fVar154 * auVar30._20_4_;
  auVar363._24_4_ = fVar214 * auVar117._24_4_ + fVar211 * auVar29._24_4_ + fVar209 * auVar30._24_4_;
  auVar363._28_4_ = fVar405 + in_register_000015dc + in_register_0000151c;
  auVar348._0_4_ = fVar212 * auVar31._0_4_ + fVar210 * auVar32._0_4_ + fVar181 * auVar33._0_4_;
  auVar348._4_4_ = fVar213 * auVar31._4_4_ + fVar394 * auVar32._4_4_ + fVar154 * auVar33._4_4_;
  auVar348._8_4_ = fVar214 * auVar31._8_4_ + fVar211 * auVar32._8_4_ + fVar209 * auVar33._8_4_;
  auVar348._12_4_ = fVar215 * auVar31._12_4_ + fVar405 * auVar32._12_4_ + fVar180 * auVar33._12_4_;
  auVar348._16_4_ = fVar212 * auVar31._16_4_ + fVar210 * auVar32._16_4_ + fVar181 * auVar33._16_4_;
  auVar348._20_4_ = fVar213 * auVar31._20_4_ + fVar394 * auVar32._20_4_ + fVar154 * auVar33._20_4_;
  auVar348._24_4_ = fVar214 * auVar31._24_4_ + fVar211 * auVar32._24_4_ + fVar209 * auVar33._24_4_;
  auVar348._28_4_ = fVar405 + in_register_000015dc + in_register_0000159c;
  auVar261._0_4_ = fVar212 * auVar34._0_4_ + fVar210 * auVar35._0_4_ + auVar36._0_4_ * fVar181;
  auVar261._4_4_ = fVar213 * auVar34._4_4_ + fVar394 * auVar35._4_4_ + auVar36._4_4_ * fVar154;
  auVar261._8_4_ = fVar214 * auVar34._8_4_ + fVar211 * auVar35._8_4_ + auVar36._8_4_ * fVar209;
  auVar261._12_4_ = fVar215 * auVar34._12_4_ + fVar405 * auVar35._12_4_ + auVar36._12_4_ * fVar180;
  auVar261._16_4_ = fVar212 * auVar34._16_4_ + fVar210 * auVar35._16_4_ + auVar36._16_4_ * fVar181;
  auVar261._20_4_ = fVar213 * auVar34._20_4_ + fVar394 * auVar35._20_4_ + auVar36._20_4_ * fVar154;
  auVar261._24_4_ = fVar214 * auVar34._24_4_ + fVar211 * auVar35._24_4_ + auVar36._24_4_ * fVar209;
  auVar261._28_4_ = fVar215 + fVar405 + fVar180;
  auVar140 = vshufps_avx(auVar125,auVar125,0);
  auVar131 = vshufps_avx(auVar125,auVar125,0x55);
  auVar111 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar154 = auVar111._0_4_;
  fVar209 = auVar111._4_4_;
  fVar180 = auVar111._8_4_;
  fVar210 = auVar111._12_4_;
  fVar213 = auVar131._0_4_;
  fVar214 = auVar131._4_4_;
  fVar215 = auVar131._8_4_;
  fVar240 = auVar131._12_4_;
  fVar394 = auVar140._0_4_;
  fVar211 = auVar140._4_4_;
  fVar405 = auVar140._8_4_;
  fVar212 = auVar140._12_4_;
  fVar181 = auVar117._28_4_;
  auVar175._0_4_ = fVar394 * auVar117._0_4_ + fVar213 * auVar29._0_4_ + fVar154 * auVar30._0_4_;
  auVar175._4_4_ = fVar211 * auVar117._4_4_ + fVar214 * auVar29._4_4_ + fVar209 * auVar30._4_4_;
  auVar175._8_4_ = fVar405 * auVar117._8_4_ + fVar215 * auVar29._8_4_ + fVar180 * auVar30._8_4_;
  auVar175._12_4_ = fVar212 * auVar117._12_4_ + fVar240 * auVar29._12_4_ + fVar210 * auVar30._12_4_;
  auVar175._16_4_ = fVar394 * auVar117._16_4_ + fVar213 * auVar29._16_4_ + fVar154 * auVar30._16_4_;
  auVar175._20_4_ = fVar211 * auVar117._20_4_ + fVar214 * auVar29._20_4_ + fVar209 * auVar30._20_4_;
  auVar175._24_4_ = fVar405 * auVar117._24_4_ + fVar215 * auVar29._24_4_ + fVar180 * auVar30._24_4_;
  auVar175._28_4_ = fVar181 + auVar29._28_4_ + auVar30._28_4_;
  auVar149._0_4_ = fVar394 * auVar31._0_4_ + fVar213 * auVar32._0_4_ + fVar154 * auVar33._0_4_;
  auVar149._4_4_ = fVar211 * auVar31._4_4_ + fVar214 * auVar32._4_4_ + fVar209 * auVar33._4_4_;
  auVar149._8_4_ = fVar405 * auVar31._8_4_ + fVar215 * auVar32._8_4_ + fVar180 * auVar33._8_4_;
  auVar149._12_4_ = fVar212 * auVar31._12_4_ + fVar240 * auVar32._12_4_ + fVar210 * auVar33._12_4_;
  auVar149._16_4_ = fVar394 * auVar31._16_4_ + fVar213 * auVar32._16_4_ + fVar154 * auVar33._16_4_;
  auVar149._20_4_ = fVar211 * auVar31._20_4_ + fVar214 * auVar32._20_4_ + fVar209 * auVar33._20_4_;
  auVar149._24_4_ = fVar405 * auVar31._24_4_ + fVar215 * auVar32._24_4_ + fVar180 * auVar33._24_4_;
  auVar149._28_4_ = fVar181 + auVar30._28_4_ + auVar33._28_4_;
  auVar118._0_4_ = fVar394 * auVar34._0_4_ + fVar213 * auVar35._0_4_ + auVar36._0_4_ * fVar154;
  auVar118._4_4_ = fVar211 * auVar34._4_4_ + fVar214 * auVar35._4_4_ + auVar36._4_4_ * fVar209;
  auVar118._8_4_ = fVar405 * auVar34._8_4_ + fVar215 * auVar35._8_4_ + auVar36._8_4_ * fVar180;
  auVar118._12_4_ = fVar212 * auVar34._12_4_ + fVar240 * auVar35._12_4_ + auVar36._12_4_ * fVar210;
  auVar118._16_4_ = fVar394 * auVar34._16_4_ + fVar213 * auVar35._16_4_ + auVar36._16_4_ * fVar154;
  auVar118._20_4_ = fVar211 * auVar34._20_4_ + fVar214 * auVar35._20_4_ + auVar36._20_4_ * fVar209;
  auVar118._24_4_ = fVar405 * auVar34._24_4_ + fVar215 * auVar35._24_4_ + auVar36._24_4_ * fVar180;
  auVar118._28_4_ = fVar181 + auVar32._28_4_ + fVar210;
  auVar203._8_4_ = 0x7fffffff;
  auVar203._0_8_ = 0x7fffffff7fffffff;
  auVar203._12_4_ = 0x7fffffff;
  auVar203._16_4_ = 0x7fffffff;
  auVar203._20_4_ = 0x7fffffff;
  auVar203._24_4_ = 0x7fffffff;
  auVar203._28_4_ = 0x7fffffff;
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  auVar236._16_4_ = 0x219392ef;
  auVar236._20_4_ = 0x219392ef;
  auVar236._24_4_ = 0x219392ef;
  auVar236._28_4_ = 0x219392ef;
  auVar117 = vandps_avx(auVar363,auVar203);
  auVar117 = vcmpps_avx(auVar117,auVar236,1);
  auVar29 = vblendvps_avx(auVar363,auVar236,auVar117);
  auVar117 = vandps_avx(auVar348,auVar203);
  auVar117 = vcmpps_avx(auVar117,auVar236,1);
  auVar30 = vblendvps_avx(auVar348,auVar236,auVar117);
  auVar117 = vandps_avx(auVar261,auVar203);
  auVar117 = vcmpps_avx(auVar117,auVar236,1);
  auVar117 = vblendvps_avx(auVar261,auVar236,auVar117);
  auVar31 = vrcpps_avx(auVar29);
  fVar181 = auVar31._0_4_;
  fVar209 = auVar31._4_4_;
  auVar32._4_4_ = auVar29._4_4_ * fVar209;
  auVar32._0_4_ = auVar29._0_4_ * fVar181;
  fVar210 = auVar31._8_4_;
  auVar32._8_4_ = auVar29._8_4_ * fVar210;
  fVar211 = auVar31._12_4_;
  auVar32._12_4_ = auVar29._12_4_ * fVar211;
  fVar212 = auVar31._16_4_;
  auVar32._16_4_ = auVar29._16_4_ * fVar212;
  fVar213 = auVar31._20_4_;
  auVar32._20_4_ = auVar29._20_4_ * fVar213;
  fVar214 = auVar31._24_4_;
  auVar32._24_4_ = auVar29._24_4_ * fVar214;
  auVar32._28_4_ = 0x219392ef;
  auVar308._8_4_ = 0x3f800000;
  auVar308._0_8_ = &DAT_3f8000003f800000;
  auVar308._12_4_ = 0x3f800000;
  auVar308._16_4_ = 0x3f800000;
  auVar308._20_4_ = 0x3f800000;
  auVar308._24_4_ = 0x3f800000;
  auVar308._28_4_ = 0x3f800000;
  auVar33 = vsubps_avx(auVar308,auVar32);
  fVar181 = fVar181 + fVar181 * auVar33._0_4_;
  fVar209 = fVar209 + fVar209 * auVar33._4_4_;
  fVar210 = fVar210 + fVar210 * auVar33._8_4_;
  fVar211 = fVar211 + fVar211 * auVar33._12_4_;
  fVar212 = fVar212 + fVar212 * auVar33._16_4_;
  fVar213 = fVar213 + fVar213 * auVar33._20_4_;
  fVar214 = fVar214 + fVar214 * auVar33._24_4_;
  auVar32 = vrcpps_avx(auVar30);
  fVar215 = auVar32._0_4_;
  fVar240 = auVar32._4_4_;
  auVar34._4_4_ = fVar240 * auVar30._4_4_;
  auVar34._0_4_ = fVar215 * auVar30._0_4_;
  fVar241 = auVar32._8_4_;
  auVar34._8_4_ = fVar241 * auVar30._8_4_;
  fVar242 = auVar32._12_4_;
  auVar34._12_4_ = fVar242 * auVar30._12_4_;
  fVar243 = auVar32._16_4_;
  auVar34._16_4_ = fVar243 * auVar30._16_4_;
  fVar244 = auVar32._20_4_;
  auVar34._20_4_ = fVar244 * auVar30._20_4_;
  fVar245 = auVar32._24_4_;
  auVar34._24_4_ = fVar245 * auVar30._24_4_;
  auVar34._28_4_ = auVar29._28_4_;
  auVar30 = vsubps_avx(auVar308,auVar34);
  fVar215 = fVar215 + fVar215 * auVar30._0_4_;
  fVar240 = fVar240 + fVar240 * auVar30._4_4_;
  fVar241 = fVar241 + fVar241 * auVar30._8_4_;
  fVar242 = fVar242 + fVar242 * auVar30._12_4_;
  fVar243 = fVar243 + fVar243 * auVar30._16_4_;
  fVar244 = fVar244 + fVar244 * auVar30._20_4_;
  fVar245 = fVar245 + fVar245 * auVar30._24_4_;
  auVar29 = vrcpps_avx(auVar117);
  fVar246 = auVar29._0_4_;
  fVar262 = auVar29._4_4_;
  auVar35._4_4_ = fVar262 * auVar117._4_4_;
  auVar35._0_4_ = fVar246 * auVar117._0_4_;
  fVar263 = auVar29._8_4_;
  auVar35._8_4_ = fVar263 * auVar117._8_4_;
  fVar264 = auVar29._12_4_;
  auVar35._12_4_ = fVar264 * auVar117._12_4_;
  fVar265 = auVar29._16_4_;
  auVar35._16_4_ = fVar265 * auVar117._16_4_;
  fVar266 = auVar29._20_4_;
  auVar35._20_4_ = fVar266 * auVar117._20_4_;
  fVar267 = auVar29._24_4_;
  auVar35._24_4_ = fVar267 * auVar117._24_4_;
  auVar35._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar308,auVar35);
  fVar246 = fVar246 + fVar246 * auVar117._0_4_;
  fVar262 = fVar262 + fVar262 * auVar117._4_4_;
  fVar263 = fVar263 + fVar263 * auVar117._8_4_;
  fVar264 = fVar264 + fVar264 * auVar117._12_4_;
  fVar265 = fVar265 + fVar265 * auVar117._16_4_;
  fVar266 = fVar266 + fVar266 * auVar117._20_4_;
  fVar267 = fVar267 + fVar267 * auVar117._24_4_;
  auVar140 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar96 + 0x16)) *
                           *(float *)(prim + lVar96 + 0x1a)));
  auVar37 = vshufps_avx(auVar140,auVar140,0);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar140 = vpmovsxwd_avx(auVar140);
  auVar131._8_8_ = 0;
  auVar131._0_8_ = *(ulong *)(prim + uVar91 * 7 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar131);
  auVar288._16_16_ = auVar131;
  auVar288._0_16_ = auVar140;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 6);
  auVar140 = vpmovsxwd_avx(auVar111);
  auVar117 = vcvtdq2ps_avx(auVar288);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar91 * 0xb + 0xe);
  auVar131 = vpmovsxwd_avx(auVar110);
  auVar309._16_16_ = auVar131;
  auVar309._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar309);
  auVar29 = vsubps_avx(auVar29,auVar117);
  fVar154 = auVar37._0_4_;
  fVar180 = auVar37._4_4_;
  fVar394 = auVar37._8_4_;
  fVar405 = auVar37._12_4_;
  auVar289._0_4_ = auVar29._0_4_ * fVar154 + auVar117._0_4_;
  auVar289._4_4_ = auVar29._4_4_ * fVar180 + auVar117._4_4_;
  auVar289._8_4_ = auVar29._8_4_ * fVar394 + auVar117._8_4_;
  auVar289._12_4_ = auVar29._12_4_ * fVar405 + auVar117._12_4_;
  auVar289._16_4_ = auVar29._16_4_ * fVar154 + auVar117._16_4_;
  auVar289._20_4_ = auVar29._20_4_ * fVar180 + auVar117._20_4_;
  auVar289._24_4_ = auVar29._24_4_ * fVar394 + auVar117._24_4_;
  auVar289._28_4_ = auVar29._28_4_ + auVar117._28_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar140 = vpmovsxwd_avx(auVar37);
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar91 * 9 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar221);
  auVar310._16_16_ = auVar131;
  auVar310._0_16_ = auVar140;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 6);
  auVar140 = vpmovsxwd_avx(auVar197);
  auVar117 = vcvtdq2ps_avx(auVar310);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar91 * 0xd + 0xe);
  auVar131 = vpmovsxwd_avx(auVar139);
  auVar325._16_16_ = auVar131;
  auVar325._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar325);
  auVar29 = vsubps_avx(auVar29,auVar117);
  auVar311._0_4_ = auVar117._0_4_ + auVar29._0_4_ * fVar154;
  auVar311._4_4_ = auVar117._4_4_ + auVar29._4_4_ * fVar180;
  auVar311._8_4_ = auVar117._8_4_ + auVar29._8_4_ * fVar394;
  auVar311._12_4_ = auVar117._12_4_ + auVar29._12_4_ * fVar405;
  auVar311._16_4_ = auVar117._16_4_ + auVar29._16_4_ * fVar154;
  auVar311._20_4_ = auVar117._20_4_ + auVar29._20_4_ * fVar180;
  auVar311._24_4_ = auVar117._24_4_ + auVar29._24_4_ * fVar394;
  auVar311._28_4_ = auVar117._28_4_ + auVar29._28_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 6);
  auVar140 = vpmovsxwd_avx(auVar196);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar91 * 0x12 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar115);
  auVar326._16_16_ = auVar131;
  auVar326._0_16_ = auVar140;
  uVar93 = (ulong)(uint)((int)lVar1 << 2);
  lVar96 = uVar91 * 2 + uVar93;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar140 = vpmovsxwd_avx(auVar166);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar10);
  auVar117 = vcvtdq2ps_avx(auVar326);
  auVar337._16_16_ = auVar131;
  auVar337._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar337);
  auVar29 = vsubps_avx(auVar29,auVar117);
  auVar327._0_4_ = auVar117._0_4_ + auVar29._0_4_ * fVar154;
  auVar327._4_4_ = auVar117._4_4_ + auVar29._4_4_ * fVar180;
  auVar327._8_4_ = auVar117._8_4_ + auVar29._8_4_ * fVar394;
  auVar327._12_4_ = auVar117._12_4_ + auVar29._12_4_ * fVar405;
  auVar327._16_4_ = auVar117._16_4_ + auVar29._16_4_ * fVar154;
  auVar327._20_4_ = auVar117._20_4_ + auVar29._20_4_ * fVar180;
  auVar327._24_4_ = auVar117._24_4_ + auVar29._24_4_ * fVar394;
  auVar327._28_4_ = auVar117._28_4_ + auVar29._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar93 + 6);
  auVar140 = vpmovsxwd_avx(auVar11);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *(ulong *)(prim + uVar93 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar284);
  auVar338._16_16_ = auVar131;
  auVar338._0_16_ = auVar140;
  auVar117 = vcvtdq2ps_avx(auVar338);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 6);
  auVar140 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar91 * 0x18 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar13);
  auVar349._16_16_ = auVar131;
  auVar349._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar349);
  auVar29 = vsubps_avx(auVar29,auVar117);
  auVar339._0_4_ = auVar117._0_4_ + auVar29._0_4_ * fVar154;
  auVar339._4_4_ = auVar117._4_4_ + auVar29._4_4_ * fVar180;
  auVar339._8_4_ = auVar117._8_4_ + auVar29._8_4_ * fVar394;
  auVar339._12_4_ = auVar117._12_4_ + auVar29._12_4_ * fVar405;
  auVar339._16_4_ = auVar117._16_4_ + auVar29._16_4_ * fVar154;
  auVar339._20_4_ = auVar117._20_4_ + auVar29._20_4_ * fVar180;
  auVar339._24_4_ = auVar117._24_4_ + auVar29._24_4_ * fVar394;
  auVar339._28_4_ = auVar117._28_4_ + auVar29._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 6);
  auVar140 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar91 * 0x1d + 0xe);
  auVar131 = vpmovsxwd_avx(auVar15);
  auVar350._16_16_ = auVar131;
  auVar350._0_16_ = auVar140;
  lVar96 = uVar91 + (ulong)(byte)PVar22 * 0x20;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar140 = vpmovsxwd_avx(auVar16);
  auVar117 = vcvtdq2ps_avx(auVar350);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar17);
  auVar364._16_16_ = auVar131;
  auVar364._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar364);
  auVar29 = vsubps_avx(auVar29,auVar117);
  lVar96 = (ulong)(byte)PVar22 * 0x20 - uVar91;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar96 + 6);
  auVar140 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar96 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar19);
  auVar351._0_4_ = auVar117._0_4_ + auVar29._0_4_ * fVar154;
  auVar351._4_4_ = auVar117._4_4_ + auVar29._4_4_ * fVar180;
  auVar351._8_4_ = auVar117._8_4_ + auVar29._8_4_ * fVar394;
  auVar351._12_4_ = auVar117._12_4_ + auVar29._12_4_ * fVar405;
  auVar351._16_4_ = auVar117._16_4_ + auVar29._16_4_ * fVar154;
  auVar351._20_4_ = auVar117._20_4_ + auVar29._20_4_ * fVar180;
  auVar351._24_4_ = auVar117._24_4_ + auVar29._24_4_ * fVar394;
  auVar351._28_4_ = auVar117._28_4_ + auVar29._28_4_;
  auVar365._16_16_ = auVar131;
  auVar365._0_16_ = auVar140;
  auVar117 = vcvtdq2ps_avx(auVar365);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 6);
  auVar140 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar91 * 0x23 + 0xe);
  auVar131 = vpmovsxwd_avx(auVar21);
  auVar386._16_16_ = auVar131;
  auVar386._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar386);
  auVar29 = vsubps_avx(auVar29,auVar117);
  auVar366._0_4_ = auVar117._0_4_ + auVar29._0_4_ * fVar154;
  auVar366._4_4_ = auVar117._4_4_ + auVar29._4_4_ * fVar180;
  auVar366._8_4_ = auVar117._8_4_ + auVar29._8_4_ * fVar394;
  auVar366._12_4_ = auVar117._12_4_ + auVar29._12_4_ * fVar405;
  auVar366._16_4_ = auVar117._16_4_ + auVar29._16_4_ * fVar154;
  auVar366._20_4_ = auVar117._20_4_ + auVar29._20_4_ * fVar180;
  auVar366._24_4_ = auVar117._24_4_ + auVar29._24_4_ * fVar394;
  auVar366._28_4_ = auVar117._28_4_ + fVar405;
  auVar117 = vsubps_avx(auVar289,auVar175);
  auVar268._0_4_ = fVar181 * auVar117._0_4_;
  auVar268._4_4_ = fVar209 * auVar117._4_4_;
  auVar268._8_4_ = fVar210 * auVar117._8_4_;
  auVar268._12_4_ = fVar211 * auVar117._12_4_;
  auVar36._16_4_ = fVar212 * auVar117._16_4_;
  auVar36._0_16_ = auVar268;
  auVar36._20_4_ = fVar213 * auVar117._20_4_;
  auVar36._24_4_ = fVar214 * auVar117._24_4_;
  auVar36._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar311,auVar175);
  auVar182._0_4_ = fVar181 * auVar117._0_4_;
  auVar182._4_4_ = fVar209 * auVar117._4_4_;
  auVar182._8_4_ = fVar210 * auVar117._8_4_;
  auVar182._12_4_ = fVar211 * auVar117._12_4_;
  auVar38._16_4_ = fVar212 * auVar117._16_4_;
  auVar38._0_16_ = auVar182;
  auVar38._20_4_ = fVar213 * auVar117._20_4_;
  auVar38._24_4_ = fVar214 * auVar117._24_4_;
  auVar38._28_4_ = auVar31._28_4_ + auVar33._28_4_;
  auVar117 = vsubps_avx(auVar327,auVar149);
  auVar155._0_4_ = fVar215 * auVar117._0_4_;
  auVar155._4_4_ = fVar240 * auVar117._4_4_;
  auVar155._8_4_ = fVar241 * auVar117._8_4_;
  auVar155._12_4_ = fVar242 * auVar117._12_4_;
  auVar31._16_4_ = fVar243 * auVar117._16_4_;
  auVar31._0_16_ = auVar155;
  auVar31._20_4_ = fVar244 * auVar117._20_4_;
  auVar31._24_4_ = fVar245 * auVar117._24_4_;
  auVar31._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar339,auVar149);
  auVar216._0_4_ = fVar215 * auVar117._0_4_;
  auVar216._4_4_ = fVar240 * auVar117._4_4_;
  auVar216._8_4_ = fVar241 * auVar117._8_4_;
  auVar216._12_4_ = fVar242 * auVar117._12_4_;
  auVar33._16_4_ = fVar243 * auVar117._16_4_;
  auVar33._0_16_ = auVar216;
  auVar33._20_4_ = fVar244 * auVar117._20_4_;
  auVar33._24_4_ = fVar245 * auVar117._24_4_;
  auVar33._28_4_ = auVar32._28_4_ + auVar30._28_4_;
  auVar117 = vsubps_avx(auVar351,auVar118);
  auVar126._0_4_ = fVar246 * auVar117._0_4_;
  auVar126._4_4_ = fVar262 * auVar117._4_4_;
  auVar126._8_4_ = fVar263 * auVar117._8_4_;
  auVar126._12_4_ = fVar264 * auVar117._12_4_;
  auVar30._16_4_ = fVar265 * auVar117._16_4_;
  auVar30._0_16_ = auVar126;
  auVar30._20_4_ = fVar266 * auVar117._20_4_;
  auVar30._24_4_ = fVar267 * auVar117._24_4_;
  auVar30._28_4_ = auVar117._28_4_;
  auVar117 = vsubps_avx(auVar366,auVar118);
  auVar100._0_4_ = fVar246 * auVar117._0_4_;
  auVar100._4_4_ = fVar262 * auVar117._4_4_;
  auVar100._8_4_ = fVar263 * auVar117._8_4_;
  auVar100._12_4_ = fVar264 * auVar117._12_4_;
  auVar39._16_4_ = fVar265 * auVar117._16_4_;
  auVar39._0_16_ = auVar100;
  auVar39._20_4_ = fVar266 * auVar117._20_4_;
  auVar39._24_4_ = fVar267 * auVar117._24_4_;
  auVar39._28_4_ = auVar117._28_4_;
  auVar140 = vpminsd_avx(auVar36._16_16_,auVar38._16_16_);
  auVar131 = vpminsd_avx(auVar268,auVar182);
  auVar312._16_16_ = auVar140;
  auVar312._0_16_ = auVar131;
  auVar140 = vpminsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar131 = vpminsd_avx(auVar155,auVar216);
  auVar352._16_16_ = auVar140;
  auVar352._0_16_ = auVar131;
  auVar117 = vmaxps_avx(auVar312,auVar352);
  auVar140 = vpminsd_avx(auVar30._16_16_,auVar39._16_16_);
  auVar131 = vpminsd_avx(auVar126,auVar100);
  auVar387._16_16_ = auVar140;
  auVar387._0_16_ = auVar131;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar402._4_4_ = uVar8;
  auVar402._0_4_ = uVar8;
  auVar402._8_4_ = uVar8;
  auVar402._12_4_ = uVar8;
  auVar402._16_4_ = uVar8;
  auVar402._20_4_ = uVar8;
  auVar402._24_4_ = uVar8;
  auVar402._28_4_ = uVar8;
  auVar29 = vmaxps_avx(auVar387,auVar402);
  auVar117 = vmaxps_avx(auVar117,auVar29);
  local_178._4_4_ = auVar117._4_4_ * 0.99999964;
  local_178._0_4_ = auVar117._0_4_ * 0.99999964;
  local_178._8_4_ = auVar117._8_4_ * 0.99999964;
  local_178._12_4_ = auVar117._12_4_ * 0.99999964;
  local_178._16_4_ = auVar117._16_4_ * 0.99999964;
  local_178._20_4_ = auVar117._20_4_ * 0.99999964;
  local_178._24_4_ = auVar117._24_4_ * 0.99999964;
  local_178._28_4_ = auVar117._28_4_;
  auVar140 = vpmaxsd_avx(auVar36._16_16_,auVar38._16_16_);
  auVar131 = vpmaxsd_avx(auVar268,auVar182);
  auVar204._16_16_ = auVar140;
  auVar204._0_16_ = auVar131;
  auVar140 = vpmaxsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar131 = vpmaxsd_avx(auVar155,auVar216);
  auVar176._16_16_ = auVar140;
  auVar176._0_16_ = auVar131;
  auVar117 = vminps_avx(auVar204,auVar176);
  auVar140 = vpmaxsd_avx(auVar30._16_16_,auVar39._16_16_);
  auVar131 = vpmaxsd_avx(auVar126,auVar100);
  auVar119._16_16_ = auVar140;
  auVar119._0_16_ = auVar131;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar150._4_4_ = uVar8;
  auVar150._0_4_ = uVar8;
  auVar150._8_4_ = uVar8;
  auVar150._12_4_ = uVar8;
  auVar150._16_4_ = uVar8;
  auVar150._20_4_ = uVar8;
  auVar150._24_4_ = uVar8;
  auVar150._28_4_ = uVar8;
  auVar29 = vminps_avx(auVar119,auVar150);
  auVar117 = vminps_avx(auVar117,auVar29);
  auVar29._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar29._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar29._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar29._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar29._16_4_ = auVar117._16_4_ * 1.0000004;
  auVar29._20_4_ = auVar117._20_4_ * 1.0000004;
  auVar29._24_4_ = auVar117._24_4_ * 1.0000004;
  auVar29._28_4_ = auVar117._28_4_;
  auVar117 = vcmpps_avx(local_178,auVar29,2);
  auVar140 = vpshufd_avx(ZEXT116((byte)PVar22),0);
  auVar151._16_16_ = auVar140;
  auVar151._0_16_ = auVar140;
  auVar29 = vcvtdq2ps_avx(auVar151);
  auVar29 = vcmpps_avx(_DAT_02020f40,auVar29,1);
  auVar117 = vandps_avx(auVar117,auVar29);
  uVar88 = vmovmskps_avx(auVar117);
  local_609 = uVar88 != 0;
  if (uVar88 == 0) {
    return local_609;
  }
  uVar88 = uVar88 & 0xff;
  pLVar98 = pre->ray_space + k;
  auVar120._16_16_ = mm_lookupmask_ps._240_16_;
  auVar120._0_16_ = mm_lookupmask_ps._240_16_;
  local_248 = vblendps_avx(auVar120,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar403 = ZEXT464(0) << 0x20;
  local_430 = pLVar98;
  local_428 = prim;
LAB_0120a43d:
  lVar96 = 0;
  if (uVar88 != 0) {
    for (; (uVar88 >> lVar96 & 1) == 0; lVar96 = lVar96 + 1) {
    }
  }
  local_420 = (ulong)*(uint *)(local_428 + 2);
  pGVar23 = (context->scene->geometries).items[local_420].ptr;
  fVar181 = (pGVar23->time_range).lower;
  fVar181 = pGVar23->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar181) / ((pGVar23->time_range).upper - fVar181));
  auVar140 = vroundss_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),9);
  auVar140 = vminss_avx(auVar140,ZEXT416((uint)(pGVar23->fnumTimeSegments + -1.0)));
  auVar140 = vmaxss_avx(ZEXT816(0) << 0x20,auVar140);
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                           (ulong)*(uint *)(local_428 + lVar96 * 4 + 6) *
                           pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar95 = (long)(int)auVar140._0_4_ * 0x38;
  lVar25 = *(long *)(_Var24 + lVar95);
  lVar26 = *(long *)(_Var24 + 0x10 + lVar95);
  pfVar3 = (float *)(lVar25 + lVar26 * uVar91);
  fVar154 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar180 = pfVar3[2];
  fVar210 = pfVar3[3];
  lVar1 = uVar91 + 1;
  pfVar3 = (float *)(lVar25 + lVar26 * lVar1);
  lVar97 = uVar91 + 2;
  pfVar4 = (float *)(lVar25 + lVar26 * lVar97);
  lVar2 = uVar91 + 3;
  pfVar5 = (float *)(lVar25 + lVar26 * lVar2);
  fVar394 = *pfVar5;
  fVar211 = pfVar5[1];
  fVar405 = pfVar5[2];
  fVar212 = pfVar5[3];
  lVar25 = *(long *)&pGVar23[4].fnumTimeSegments;
  lVar26 = *(long *)(lVar25 + lVar95);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar95);
  pfVar5 = (float *)(lVar26 + lVar27 * uVar91);
  fVar213 = *pfVar5;
  fVar214 = pfVar5[1];
  fVar215 = pfVar5[2];
  fVar240 = pfVar5[3];
  pfVar5 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar6 = (float *)(lVar26 + lVar27 * lVar97);
  fVar181 = fVar181 - auVar140._0_4_;
  pfVar7 = (float *)(lVar26 + lVar27 * lVar2);
  fVar241 = *pfVar7;
  fVar242 = pfVar7[1];
  fVar243 = pfVar7[2];
  fVar244 = pfVar7[3];
  fVar390 = auVar403._8_4_;
  fVar391 = auVar403._12_4_;
  fVar264 = *pfVar4 * 0.0;
  fVar265 = pfVar4[1] * 0.0;
  fVar266 = fVar390 * pfVar4[2];
  fVar267 = fVar391 * pfVar4[3];
  fVar245 = fVar264 + fVar394 * 0.0;
  fVar246 = fVar265 + fVar211 * 0.0;
  fVar262 = fVar266 + fVar390 * fVar405;
  fVar263 = fVar267 + fVar391 * fVar212;
  fVar341 = *pfVar3 * 0.0;
  fVar353 = pfVar3[1] * 0.0;
  fVar355 = fVar390 * pfVar3[2];
  fVar357 = fVar391 * pfVar3[3];
  local_5c8._0_4_ = fVar154 + fVar341 + fVar245;
  local_5c8._4_4_ = fVar209 + fVar353 + fVar246;
  fStack_5c0 = fVar180 + fVar355 + fVar262;
  fStack_5bc = fVar210 + fVar357 + fVar263;
  auVar101._0_4_ = *pfVar3 * 3.0 + fVar245;
  auVar101._4_4_ = pfVar3[1] * 3.0 + fVar246;
  auVar101._8_4_ = pfVar3[2] * 3.0 + fVar262;
  auVar101._12_4_ = pfVar3[3] * 3.0 + fVar263;
  auVar156._0_4_ = fVar154 * 3.0;
  auVar156._4_4_ = fVar209 * 3.0;
  auVar156._8_4_ = fVar180 * 3.0;
  auVar156._12_4_ = fVar210 * 3.0;
  auVar197 = vsubps_avx(auVar101,auVar156);
  fVar359 = *pfVar6 * 0.0;
  fVar367 = pfVar6[1] * 0.0;
  fVar368 = pfVar6[2] * fVar390;
  fVar370 = pfVar6[3] * fVar391;
  fVar245 = fVar359 + fVar241 * 0.0;
  fVar246 = fVar367 + fVar242 * 0.0;
  fVar262 = fVar368 + fVar243 * fVar390;
  fVar263 = fVar370 + fVar244 * fVar391;
  fVar379 = *pfVar5 * 0.0;
  fVar389 = pfVar5[1] * 0.0;
  fVar390 = fVar390 * pfVar5[2];
  fVar391 = fVar391 * pfVar5[3];
  auVar396._0_4_ = fVar379 + fVar245 + fVar213;
  auVar396._4_4_ = fVar389 + fVar246 + fVar214;
  auVar396._8_4_ = fVar390 + fVar262 + fVar215;
  auVar396._12_4_ = fVar391 + fVar263 + fVar240;
  auVar102._0_4_ = *pfVar5 * 3.0 + fVar245;
  auVar102._4_4_ = pfVar5[1] * 3.0 + fVar246;
  auVar102._8_4_ = pfVar5[2] * 3.0 + fVar262;
  auVar102._12_4_ = pfVar5[3] * 3.0 + fVar263;
  auVar269._0_4_ = fVar213 * 3.0;
  auVar269._4_4_ = fVar214 * 3.0;
  auVar269._8_4_ = fVar215 * 3.0;
  auVar269._12_4_ = fVar240 * 3.0;
  auVar110 = vsubps_avx(auVar102,auVar269);
  auVar183._0_4_ = fVar154 * 0.0;
  auVar183._4_4_ = fVar209 * 0.0;
  auVar183._8_4_ = fVar180 * 0.0;
  auVar183._12_4_ = fVar210 * 0.0;
  auVar270._0_4_ = auVar183._0_4_ + fVar341 + fVar264 + fVar394;
  auVar270._4_4_ = auVar183._4_4_ + fVar353 + fVar265 + fVar211;
  auVar270._8_4_ = auVar183._8_4_ + fVar355 + fVar266 + fVar405;
  auVar270._12_4_ = auVar183._12_4_ + fVar357 + fVar267 + fVar212;
  auVar279._0_4_ = fVar394 * 3.0;
  auVar279._4_4_ = fVar211 * 3.0;
  auVar279._8_4_ = fVar405 * 3.0;
  auVar279._12_4_ = fVar212 * 3.0;
  auVar217._0_4_ = *pfVar4 * 3.0;
  auVar217._4_4_ = pfVar4[1] * 3.0;
  auVar217._8_4_ = pfVar4[2] * 3.0;
  auVar217._12_4_ = pfVar4[3] * 3.0;
  auVar140 = vsubps_avx(auVar279,auVar217);
  auVar218._0_4_ = fVar341 + auVar140._0_4_;
  auVar218._4_4_ = fVar353 + auVar140._4_4_;
  auVar218._8_4_ = fVar355 + auVar140._8_4_;
  auVar218._12_4_ = fVar357 + auVar140._12_4_;
  auVar139 = vsubps_avx(auVar218,auVar183);
  auVar219._0_4_ = fVar213 * 0.0;
  auVar219._4_4_ = fVar214 * 0.0;
  auVar219._8_4_ = fVar215 * 0.0;
  auVar219._12_4_ = fVar240 * 0.0;
  auVar184._0_4_ = auVar219._0_4_ + fVar379 + fVar359 + fVar241;
  auVar184._4_4_ = auVar219._4_4_ + fVar389 + fVar367 + fVar242;
  auVar184._8_4_ = auVar219._8_4_ + fVar390 + fVar368 + fVar243;
  auVar184._12_4_ = auVar219._12_4_ + fVar391 + fVar370 + fVar244;
  auVar248._0_4_ = fVar241 * 3.0;
  auVar248._4_4_ = fVar242 * 3.0;
  auVar248._8_4_ = fVar243 * 3.0;
  auVar248._12_4_ = fVar244 * 3.0;
  auVar280._0_4_ = *pfVar6 * 3.0;
  auVar280._4_4_ = pfVar6[1] * 3.0;
  auVar280._8_4_ = pfVar6[2] * 3.0;
  auVar280._12_4_ = pfVar6[3] * 3.0;
  auVar140 = vsubps_avx(auVar248,auVar280);
  auVar249._0_4_ = fVar379 + auVar140._0_4_;
  auVar249._4_4_ = fVar389 + auVar140._4_4_;
  auVar249._8_4_ = fVar390 + auVar140._8_4_;
  auVar249._12_4_ = fVar391 + auVar140._12_4_;
  auVar221 = vsubps_avx(auVar249,auVar219);
  auVar140 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar131 = vshufps_avx(auVar396,auVar396,0xc9);
  fVar245 = auVar197._0_4_;
  auVar281._0_4_ = fVar245 * auVar131._0_4_;
  fVar246 = auVar197._4_4_;
  auVar281._4_4_ = fVar246 * auVar131._4_4_;
  fVar262 = auVar197._8_4_;
  auVar281._8_4_ = fVar262 * auVar131._8_4_;
  fVar263 = auVar197._12_4_;
  auVar281._12_4_ = fVar263 * auVar131._12_4_;
  auVar291._0_4_ = auVar396._0_4_ * auVar140._0_4_;
  auVar291._4_4_ = auVar396._4_4_ * auVar140._4_4_;
  auVar291._8_4_ = auVar396._8_4_ * auVar140._8_4_;
  auVar291._12_4_ = auVar396._12_4_ * auVar140._12_4_;
  auVar131 = vsubps_avx(auVar291,auVar281);
  auVar111 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar131 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar292._0_4_ = auVar131._0_4_ * fVar245;
  auVar292._4_4_ = auVar131._4_4_ * fVar246;
  auVar292._8_4_ = auVar131._8_4_ * fVar262;
  auVar292._12_4_ = auVar131._12_4_ * fVar263;
  auVar103._0_4_ = auVar140._0_4_ * auVar110._0_4_;
  auVar103._4_4_ = auVar140._4_4_ * auVar110._4_4_;
  auVar103._8_4_ = auVar140._8_4_ * auVar110._8_4_;
  auVar103._12_4_ = auVar140._12_4_ * auVar110._12_4_;
  auVar140 = vsubps_avx(auVar103,auVar292);
  auVar110 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar140 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar131 = vshufps_avx(auVar184,auVar184,0xc9);
  fVar379 = auVar139._0_4_;
  auVar293._0_4_ = fVar379 * auVar131._0_4_;
  fVar389 = auVar139._4_4_;
  auVar293._4_4_ = fVar389 * auVar131._4_4_;
  fVar390 = auVar139._8_4_;
  auVar293._8_4_ = fVar390 * auVar131._8_4_;
  fVar391 = auVar139._12_4_;
  auVar293._12_4_ = fVar391 * auVar131._12_4_;
  auVar185._0_4_ = auVar140._0_4_ * auVar184._0_4_;
  auVar185._4_4_ = auVar140._4_4_ * auVar184._4_4_;
  auVar185._8_4_ = auVar140._8_4_ * auVar184._8_4_;
  auVar185._12_4_ = auVar140._12_4_ * auVar184._12_4_;
  auVar131 = vsubps_avx(auVar185,auVar293);
  auVar37 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar131 = vshufps_avx(auVar221,auVar221,0xc9);
  auVar294._0_4_ = fVar379 * auVar131._0_4_;
  auVar294._4_4_ = fVar389 * auVar131._4_4_;
  auVar294._8_4_ = fVar390 * auVar131._8_4_;
  auVar294._12_4_ = fVar391 * auVar131._12_4_;
  auVar220._0_4_ = auVar140._0_4_ * auVar221._0_4_;
  auVar220._4_4_ = auVar140._4_4_ * auVar221._4_4_;
  auVar220._8_4_ = auVar140._8_4_ * auVar221._8_4_;
  auVar220._12_4_ = auVar140._12_4_ * auVar221._12_4_;
  auVar196 = vsubps_avx(auVar220,auVar294);
  auVar140 = vdpps_avx(auVar111,auVar111,0x7f);
  fVar209 = auVar140._0_4_;
  auVar329._4_12_ = ZEXT812(0) << 0x20;
  auVar329._0_4_ = fVar209;
  auVar131 = vrsqrtss_avx(auVar329,auVar329);
  fVar154 = auVar131._0_4_;
  auVar131 = vdpps_avx(auVar111,auVar110,0x7f);
  auVar221 = ZEXT416((uint)(fVar154 * 1.5 - fVar209 * 0.5 * fVar154 * fVar154 * fVar154));
  auVar221 = vshufps_avx(auVar221,auVar221,0);
  fVar241 = auVar221._0_4_ * auVar111._0_4_;
  fVar242 = auVar221._4_4_ * auVar111._4_4_;
  fVar243 = auVar221._8_4_ * auVar111._8_4_;
  fVar244 = auVar221._12_4_ * auVar111._12_4_;
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar104._0_4_ = auVar140._0_4_ * auVar110._0_4_;
  auVar104._4_4_ = auVar140._4_4_ * auVar110._4_4_;
  auVar104._8_4_ = auVar140._8_4_ * auVar110._8_4_;
  auVar104._12_4_ = auVar140._12_4_ * auVar110._12_4_;
  auVar140 = vshufps_avx(auVar131,auVar131,0);
  auVar282._0_4_ = auVar140._0_4_ * auVar111._0_4_;
  auVar282._4_4_ = auVar140._4_4_ * auVar111._4_4_;
  auVar282._8_4_ = auVar140._8_4_ * auVar111._8_4_;
  auVar282._12_4_ = auVar140._12_4_ * auVar111._12_4_;
  auVar115 = vsubps_avx(auVar104,auVar282);
  auVar140 = vrcpss_avx(auVar329,auVar329);
  auVar140 = ZEXT416((uint)((2.0 - fVar209 * auVar140._0_4_) * auVar140._0_4_));
  auVar111 = vshufps_avx(auVar140,auVar140,0);
  auVar140 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar264 = auVar140._0_4_;
  auVar397._4_12_ = ZEXT812(0) << 0x20;
  auVar397._0_4_ = fVar264;
  auVar131 = vrsqrtss_avx(auVar397,auVar397);
  fVar213 = auVar131._0_4_;
  lVar26 = *(long *)(_Var24 + 0x38 + lVar95);
  lVar27 = *(long *)(_Var24 + 0x48 + lVar95);
  pfVar3 = (float *)(lVar26 + lVar27 * uVar91);
  fVar154 = *pfVar3;
  fVar209 = pfVar3[1];
  fVar180 = pfVar3[2];
  fVar210 = pfVar3[3];
  pfVar3 = (float *)(lVar26 + lVar27 * lVar1);
  pfVar4 = (float *)(lVar26 + lVar27 * lVar97);
  auVar131 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar380._0_4_ = auVar140._0_4_ * auVar131._0_4_;
  auVar380._4_4_ = auVar140._4_4_ * auVar131._4_4_;
  auVar380._8_4_ = auVar140._8_4_ * auVar131._8_4_;
  auVar380._12_4_ = auVar140._12_4_ * auVar131._12_4_;
  auVar140 = vdpps_avx(auVar37,auVar131,0x7f);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar105._0_4_ = auVar37._0_4_ * auVar140._0_4_;
  auVar105._4_4_ = auVar37._4_4_ * auVar140._4_4_;
  auVar105._8_4_ = auVar37._8_4_ * auVar140._8_4_;
  auVar105._12_4_ = auVar37._12_4_ * auVar140._12_4_;
  auVar196 = vsubps_avx(auVar380,auVar105);
  pfVar5 = (float *)(lVar26 + lVar27 * lVar2);
  fVar394 = *pfVar5;
  fVar211 = pfVar5[1];
  fVar405 = pfVar5[2];
  fVar212 = pfVar5[3];
  auVar140 = ZEXT416((uint)(fVar213 * 1.5 - fVar213 * fVar213 * fVar213 * fVar264 * 0.5));
  auVar131 = vshufps_avx(auVar140,auVar140,0);
  fVar213 = auVar37._0_4_ * auVar131._0_4_;
  fVar214 = auVar37._4_4_ * auVar131._4_4_;
  fVar215 = auVar37._8_4_ * auVar131._8_4_;
  fVar240 = auVar37._12_4_ * auVar131._12_4_;
  auVar140 = vrcpss_avx(auVar397,auVar397);
  auVar140 = ZEXT416((uint)(auVar140._0_4_ * (2.0 - fVar264 * auVar140._0_4_)));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar110 = vshufps_avx(_local_5c8,_local_5c8,0xff);
  auVar398._0_4_ = auVar110._0_4_ * fVar241;
  auVar398._4_4_ = auVar110._4_4_ * fVar242;
  auVar398._8_4_ = auVar110._8_4_ * fVar243;
  auVar398._12_4_ = auVar110._12_4_ * fVar244;
  auVar37 = vshufps_avx(auVar197,auVar197,0xff);
  auVar166 = vsubps_avx(_local_5c8,auVar398);
  auVar283._0_4_ =
       auVar37._0_4_ * fVar241 + auVar110._0_4_ * auVar221._0_4_ * auVar115._0_4_ * auVar111._0_4_;
  auVar283._4_4_ =
       auVar37._4_4_ * fVar242 + auVar110._4_4_ * auVar221._4_4_ * auVar115._4_4_ * auVar111._4_4_;
  auVar283._8_4_ =
       auVar37._8_4_ * fVar243 + auVar110._8_4_ * auVar221._8_4_ * auVar115._8_4_ * auVar111._8_4_;
  auVar283._12_4_ =
       auVar37._12_4_ * fVar244 +
       auVar110._12_4_ * auVar221._12_4_ * auVar115._12_4_ * auVar111._12_4_;
  auVar197 = vsubps_avx(auVar197,auVar283);
  local_5c8._0_4_ = (float)local_5c8._0_4_ + auVar398._0_4_;
  local_5c8._4_4_ = (float)local_5c8._4_4_ + auVar398._4_4_;
  fStack_5c0 = fStack_5c0 + auVar398._8_4_;
  fStack_5bc = fStack_5bc + auVar398._12_4_;
  auVar111 = vshufps_avx(auVar270,auVar270,0xff);
  auVar157._0_4_ = auVar111._0_4_ * fVar213;
  auVar157._4_4_ = auVar111._4_4_ * fVar214;
  auVar157._8_4_ = auVar111._8_4_ * fVar215;
  auVar157._12_4_ = auVar111._12_4_ * fVar240;
  auVar110 = vshufps_avx(auVar139,auVar139,0xff);
  auVar115 = vsubps_avx(auVar270,auVar157);
  auVar106._0_4_ =
       auVar110._0_4_ * fVar213 + auVar111._0_4_ * auVar131._0_4_ * auVar140._0_4_ * auVar196._0_4_;
  auVar106._4_4_ =
       auVar110._4_4_ * fVar214 + auVar111._4_4_ * auVar131._4_4_ * auVar140._4_4_ * auVar196._4_4_;
  auVar106._8_4_ =
       auVar110._8_4_ * fVar215 + auVar111._8_4_ * auVar131._8_4_ * auVar140._8_4_ * auVar196._8_4_;
  auVar106._12_4_ =
       auVar110._12_4_ * fVar240 +
       auVar111._12_4_ * auVar131._12_4_ * auVar140._12_4_ * auVar196._12_4_;
  auVar139 = vsubps_avx(auVar139,auVar106);
  local_578._4_4_ = auVar270._4_4_ + auVar157._4_4_;
  local_578._0_4_ = auVar270._0_4_ + auVar157._0_4_;
  fStack_570 = auVar270._8_4_ + auVar157._8_4_;
  fStack_56c = auVar270._12_4_ + auVar157._12_4_;
  fVar341 = *pfVar4 * 0.0;
  fVar353 = pfVar4[1] * 0.0;
  fVar355 = pfVar4[2] * 0.0;
  fVar357 = pfVar4[3] * 0.0;
  fVar407 = fVar341 + fVar394 * 0.0;
  fVar414 = fVar353 + fVar211 * 0.0;
  fVar415 = fVar355 + fVar405 * 0.0;
  fVar416 = fVar357 + fVar212 * 0.0;
  auVar107._0_4_ = fVar407 + *pfVar3 * 3.0;
  auVar107._4_4_ = fVar414 + pfVar3[1] * 3.0;
  auVar107._8_4_ = fVar415 + pfVar3[2] * 3.0;
  auVar107._12_4_ = fVar416 + pfVar3[3] * 3.0;
  auVar158._0_4_ = fVar154 * 3.0;
  auVar158._4_4_ = fVar209 * 3.0;
  auVar158._8_4_ = fVar180 * 3.0;
  auVar158._12_4_ = fVar210 * 3.0;
  auVar196 = vsubps_avx(auVar107,auVar158);
  lVar26 = *(long *)(lVar25 + 0x38 + lVar95);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar95);
  auVar140 = *(undefined1 (*) [16])(lVar26 + lVar97 * lVar25);
  pfVar5 = (float *)(lVar26 + lVar25 * lVar2);
  fVar213 = *pfVar5;
  fVar214 = pfVar5[1];
  fVar215 = pfVar5[2];
  fVar240 = pfVar5[3];
  fVar264 = auVar140._0_4_ * 0.0;
  fVar265 = auVar140._4_4_ * 0.0;
  fVar266 = auVar140._8_4_ * 0.0;
  fVar267 = auVar140._12_4_ * 0.0;
  fVar359 = fVar264 + fVar213 * 0.0;
  fVar367 = fVar265 + fVar214 * 0.0;
  fVar368 = fVar266 + fVar215 * 0.0;
  fVar370 = fVar267 + fVar240 * 0.0;
  pfVar5 = (float *)(lVar26 + lVar1 * lVar25);
  auVar399._0_4_ = *pfVar5 * 3.0 + fVar359;
  auVar399._4_4_ = pfVar5[1] * 3.0 + fVar367;
  auVar399._8_4_ = pfVar5[2] * 3.0 + fVar368;
  auVar399._12_4_ = pfVar5[3] * 3.0 + fVar370;
  pfVar6 = (float *)(lVar26 + uVar91 * lVar25);
  fVar241 = *pfVar6;
  fVar242 = pfVar6[1];
  fVar243 = pfVar6[2];
  fVar244 = pfVar6[3];
  auVar295._0_4_ = fVar241 * 3.0;
  auVar295._4_4_ = fVar242 * 3.0;
  auVar295._8_4_ = fVar243 * 3.0;
  auVar295._12_4_ = fVar244 * 3.0;
  auVar131 = vsubps_avx(auVar399,auVar295);
  auVar296._0_4_ = fVar394 * 3.0;
  auVar296._4_4_ = fVar211 * 3.0;
  auVar296._8_4_ = fVar405 * 3.0;
  auVar296._12_4_ = fVar212 * 3.0;
  auVar360._0_4_ = *pfVar4 * 3.0;
  auVar360._4_4_ = pfVar4[1] * 3.0;
  auVar360._8_4_ = pfVar4[2] * 3.0;
  auVar360._12_4_ = pfVar4[3] * 3.0;
  auVar111 = vsubps_avx(auVar296,auVar360);
  fVar342 = *pfVar3 * 0.0;
  fVar354 = pfVar3[1] * 0.0;
  fVar356 = pfVar3[2] * 0.0;
  fVar358 = pfVar3[3] * 0.0;
  auVar297._0_4_ = fVar342 + auVar111._0_4_;
  auVar297._4_4_ = fVar354 + auVar111._4_4_;
  auVar297._8_4_ = fVar356 + auVar111._8_4_;
  auVar297._12_4_ = fVar358 + auVar111._12_4_;
  auVar361._0_4_ = fVar154 + fVar342 + fVar407;
  auVar361._4_4_ = fVar209 + fVar354 + fVar414;
  auVar361._8_4_ = fVar180 + fVar356 + fVar415;
  auVar361._12_4_ = fVar210 + fVar358 + fVar416;
  auVar330._0_4_ = fVar154 * 0.0;
  auVar330._4_4_ = fVar209 * 0.0;
  auVar330._8_4_ = fVar180 * 0.0;
  auVar330._12_4_ = fVar210 * 0.0;
  local_558._0_4_ = auVar330._0_4_ + fVar342 + fVar394 + fVar341;
  local_558._4_4_ = auVar330._4_4_ + fVar354 + fVar211 + fVar353;
  fStack_550 = auVar330._8_4_ + fVar356 + fVar405 + fVar355;
  fStack_54c = auVar330._12_4_ + fVar358 + fVar212 + fVar357;
  auVar10 = vsubps_avx(auVar297,auVar330);
  auVar127._0_4_ = fVar213 * 3.0;
  auVar127._4_4_ = fVar214 * 3.0;
  auVar127._8_4_ = fVar215 * 3.0;
  auVar127._12_4_ = fVar240 * 3.0;
  auVar222._0_4_ = auVar140._0_4_ * 3.0;
  auVar222._4_4_ = auVar140._4_4_ * 3.0;
  auVar222._8_4_ = auVar140._8_4_ * 3.0;
  auVar222._12_4_ = auVar140._12_4_ * 3.0;
  auVar140 = vsubps_avx(auVar127,auVar222);
  fVar154 = *pfVar5 * 0.0;
  fVar209 = pfVar5[1] * 0.0;
  fVar180 = pfVar5[2] * 0.0;
  fVar210 = pfVar5[3] * 0.0;
  auVar128._0_4_ = fVar154 + auVar140._0_4_;
  auVar128._4_4_ = fVar209 + auVar140._4_4_;
  auVar128._8_4_ = fVar180 + auVar140._8_4_;
  auVar128._12_4_ = fVar210 + auVar140._12_4_;
  auVar159._0_4_ = fVar241 + fVar154 + fVar359;
  auVar159._4_4_ = fVar242 + fVar209 + fVar367;
  auVar159._8_4_ = fVar243 + fVar180 + fVar368;
  auVar159._12_4_ = fVar244 + fVar210 + fVar370;
  auVar108._0_4_ = fVar241 * 0.0;
  auVar108._4_4_ = fVar242 * 0.0;
  auVar108._8_4_ = fVar243 * 0.0;
  auVar108._12_4_ = fVar244 * 0.0;
  auVar186._0_4_ = auVar108._0_4_ + fVar154 + fVar264 + fVar213;
  auVar186._4_4_ = auVar108._4_4_ + fVar209 + fVar265 + fVar214;
  auVar186._8_4_ = auVar108._8_4_ + fVar180 + fVar266 + fVar215;
  auVar186._12_4_ = auVar108._12_4_ + fVar210 + fVar267 + fVar240;
  auVar110 = vsubps_avx(auVar128,auVar108);
  auVar140 = vshufps_avx(auVar159,auVar159,0xc9);
  fVar212 = auVar196._0_4_;
  auVar129._0_4_ = fVar212 * auVar140._0_4_;
  fVar213 = auVar196._4_4_;
  auVar129._4_4_ = fVar213 * auVar140._4_4_;
  fVar214 = auVar196._8_4_;
  auVar129._8_4_ = fVar214 * auVar140._8_4_;
  fVar215 = auVar196._12_4_;
  auVar129._12_4_ = fVar215 * auVar140._12_4_;
  auVar140 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar160._0_4_ = auVar140._0_4_ * auVar159._0_4_;
  auVar160._4_4_ = auVar140._4_4_ * auVar159._4_4_;
  auVar160._8_4_ = auVar140._8_4_ * auVar159._8_4_;
  auVar160._12_4_ = auVar140._12_4_ * auVar159._12_4_;
  auVar111 = vsubps_avx(auVar160,auVar129);
  auVar161._0_4_ = auVar131._0_4_ * auVar140._0_4_;
  auVar161._4_4_ = auVar131._4_4_ * auVar140._4_4_;
  auVar161._8_4_ = auVar131._8_4_ * auVar140._8_4_;
  auVar161._12_4_ = auVar131._12_4_ * auVar140._12_4_;
  auVar140 = vshufps_avx(auVar131,auVar131,0xc9);
  auVar223._0_4_ = fVar212 * auVar140._0_4_;
  auVar223._4_4_ = fVar213 * auVar140._4_4_;
  auVar223._8_4_ = fVar214 * auVar140._8_4_;
  auVar223._12_4_ = fVar215 * auVar140._12_4_;
  auVar37 = vsubps_avx(auVar161,auVar223);
  auVar140 = vshufps_avx(auVar186,auVar186,0xc9);
  fVar240 = auVar10._0_4_;
  auVar224._0_4_ = fVar240 * auVar140._0_4_;
  fVar241 = auVar10._4_4_;
  auVar224._4_4_ = fVar241 * auVar140._4_4_;
  fVar242 = auVar10._8_4_;
  auVar224._8_4_ = fVar242 * auVar140._8_4_;
  fVar243 = auVar10._12_4_;
  auVar224._12_4_ = fVar243 * auVar140._12_4_;
  auVar140 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar187._0_4_ = auVar140._0_4_ * auVar186._0_4_;
  auVar187._4_4_ = auVar140._4_4_ * auVar186._4_4_;
  auVar187._8_4_ = auVar140._8_4_ * auVar186._8_4_;
  auVar187._12_4_ = auVar140._12_4_ * auVar186._12_4_;
  auVar221 = vsubps_avx(auVar187,auVar224);
  auVar111 = vshufps_avx(auVar111,auVar111,0xc9);
  auVar130._0_4_ = auVar140._0_4_ * auVar110._0_4_;
  auVar130._4_4_ = auVar140._4_4_ * auVar110._4_4_;
  auVar130._8_4_ = auVar140._8_4_ * auVar110._8_4_;
  auVar130._12_4_ = auVar140._12_4_ * auVar110._12_4_;
  auVar140 = vshufps_avx(auVar110,auVar110,0xc9);
  auVar109._0_4_ = fVar240 * auVar140._0_4_;
  auVar109._4_4_ = fVar241 * auVar140._4_4_;
  auVar109._8_4_ = fVar242 * auVar140._8_4_;
  auVar109._12_4_ = fVar243 * auVar140._12_4_;
  auVar140 = vdpps_avx(auVar111,auVar111,0x7f);
  auVar11 = vsubps_avx(auVar130,auVar109);
  fVar209 = auVar140._0_4_;
  auVar110 = ZEXT416((uint)fVar209);
  auVar131 = vrsqrtss_avx(auVar110,auVar110);
  fVar154 = auVar131._0_4_;
  auVar131 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar225._0_4_ = auVar140._0_4_ * auVar131._0_4_;
  auVar225._4_4_ = auVar140._4_4_ * auVar131._4_4_;
  auVar225._8_4_ = auVar140._8_4_ * auVar131._8_4_;
  auVar225._12_4_ = auVar140._12_4_ * auVar131._12_4_;
  auVar140 = vdpps_avx(auVar111,auVar131,0x7f);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar162._0_4_ = auVar111._0_4_ * auVar140._0_4_;
  auVar162._4_4_ = auVar111._4_4_ * auVar140._4_4_;
  auVar162._8_4_ = auVar111._8_4_ * auVar140._8_4_;
  auVar162._12_4_ = auVar111._12_4_ * auVar140._12_4_;
  auVar284 = vsubps_avx(auVar225,auVar162);
  auVar140 = vrcpss_avx(auVar110,auVar110);
  auVar140 = ZEXT416((uint)(auVar140._0_4_ * (2.0 - fVar209 * auVar140._0_4_)));
  auVar110 = vshufps_avx(auVar140,auVar140,0);
  auVar37 = vshufps_avx(auVar221,auVar221,0xc9);
  auVar140 = ZEXT416((uint)(fVar154 * 1.5 - fVar209 * 0.5 * fVar154 * fVar154 * fVar154));
  auVar221 = vshufps_avx(auVar140,auVar140,0);
  fVar394 = auVar111._0_4_ * auVar221._0_4_;
  fVar211 = auVar111._4_4_ * auVar221._4_4_;
  fVar405 = auVar111._8_4_ * auVar221._8_4_;
  fVar244 = auVar111._12_4_ * auVar221._12_4_;
  auVar140 = vdpps_avx(auVar37,auVar37,0x7f);
  fVar209 = auVar140._0_4_;
  auVar111 = ZEXT416((uint)fVar209);
  auVar131 = vrsqrtss_avx(auVar111,auVar111);
  fVar154 = auVar131._0_4_;
  auVar131 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar250._0_4_ = auVar140._0_4_ * auVar131._0_4_;
  auVar250._4_4_ = auVar140._4_4_ * auVar131._4_4_;
  auVar250._8_4_ = auVar140._8_4_ * auVar131._8_4_;
  auVar250._12_4_ = auVar140._12_4_ * auVar131._12_4_;
  auVar140 = vdpps_avx(auVar37,auVar131,0x7f);
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar226._0_4_ = auVar37._0_4_ * auVar140._0_4_;
  auVar226._4_4_ = auVar37._4_4_ * auVar140._4_4_;
  auVar226._8_4_ = auVar37._8_4_ * auVar140._8_4_;
  auVar226._12_4_ = auVar37._12_4_ * auVar140._12_4_;
  auVar11 = vsubps_avx(auVar250,auVar226);
  auVar140 = vrcpss_avx(auVar111,auVar111);
  auVar140 = ZEXT416((uint)(auVar140._0_4_ * (2.0 - fVar209 * auVar140._0_4_)));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  auVar131 = ZEXT416((uint)(fVar154 * 1.5 - fVar209 * 0.5 * fVar154 * fVar154 * fVar154));
  auVar131 = vshufps_avx(auVar131,auVar131,0);
  fVar154 = auVar37._0_4_ * auVar131._0_4_;
  fVar209 = auVar37._4_4_ * auVar131._4_4_;
  fVar180 = auVar37._8_4_ * auVar131._8_4_;
  fVar210 = auVar37._12_4_ * auVar131._12_4_;
  auVar111 = vshufps_avx(auVar196,auVar196,0xff);
  auVar37 = vshufps_avx(auVar361,auVar361,0xff);
  auVar227._0_4_ = fVar394 * auVar37._0_4_;
  auVar227._4_4_ = fVar211 * auVar37._4_4_;
  auVar227._8_4_ = fVar405 * auVar37._8_4_;
  auVar227._12_4_ = fVar244 * auVar37._12_4_;
  auVar132._0_4_ =
       fVar394 * auVar111._0_4_ + auVar221._0_4_ * auVar284._0_4_ * auVar110._0_4_ * auVar37._0_4_;
  auVar132._4_4_ =
       fVar211 * auVar111._4_4_ + auVar221._4_4_ * auVar284._4_4_ * auVar110._4_4_ * auVar37._4_4_;
  auVar132._8_4_ =
       fVar405 * auVar111._8_4_ + auVar221._8_4_ * auVar284._8_4_ * auVar110._8_4_ * auVar37._8_4_;
  auVar132._12_4_ =
       fVar244 * auVar111._12_4_ +
       auVar221._12_4_ * auVar284._12_4_ * auVar110._12_4_ * auVar37._12_4_;
  auVar37 = vsubps_avx(auVar361,auVar227);
  auVar221 = vsubps_avx(auVar196,auVar132);
  auVar111 = vshufps_avx(auVar10,auVar10,0xff);
  auVar110 = vshufps_avx(_local_558,_local_558,0xff);
  auVar163._0_4_ = auVar110._0_4_ * fVar154;
  auVar163._4_4_ = auVar110._4_4_ * fVar209;
  auVar163._8_4_ = auVar110._8_4_ * fVar180;
  auVar163._12_4_ = auVar110._12_4_ * fVar210;
  auVar112._0_4_ =
       auVar111._0_4_ * fVar154 + auVar110._0_4_ * auVar131._0_4_ * auVar11._0_4_ * auVar140._0_4_;
  auVar112._4_4_ =
       auVar111._4_4_ * fVar209 + auVar110._4_4_ * auVar131._4_4_ * auVar11._4_4_ * auVar140._4_4_;
  auVar112._8_4_ =
       auVar111._8_4_ * fVar180 + auVar110._8_4_ * auVar131._8_4_ * auVar11._8_4_ * auVar140._8_4_;
  auVar112._12_4_ =
       auVar111._12_4_ * fVar210 +
       auVar110._12_4_ * auVar131._12_4_ * auVar11._12_4_ * auVar140._12_4_;
  auVar111 = vsubps_avx(_local_558,auVar163);
  auVar381._0_4_ = (float)local_558._0_4_ + auVar163._0_4_;
  auVar381._4_4_ = (float)local_558._4_4_ + auVar163._4_4_;
  auVar381._8_4_ = fStack_550 + auVar163._8_4_;
  auVar381._12_4_ = fStack_54c + auVar163._12_4_;
  auVar110 = vsubps_avx(auVar10,auVar112);
  local_468 = auVar197._0_4_;
  fStack_464 = auVar197._4_4_;
  fStack_460 = auVar197._8_4_;
  fStack_45c = auVar197._12_4_;
  local_598 = auVar166._0_4_;
  fStack_594 = auVar166._4_4_;
  fStack_590 = auVar166._8_4_;
  fStack_58c = auVar166._12_4_;
  auVar140 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
  auVar131 = vshufps_avx(ZEXT416((uint)(1.0 - fVar181)),ZEXT416((uint)(1.0 - fVar181)),0);
  fVar210 = auVar140._0_4_;
  fVar394 = auVar140._4_4_;
  fVar211 = auVar140._8_4_;
  fVar405 = auVar140._12_4_;
  fVar181 = auVar131._0_4_;
  fVar154 = auVar131._4_4_;
  fVar209 = auVar131._8_4_;
  fVar180 = auVar131._12_4_;
  local_3d8._0_4_ = fVar181 * local_598 + fVar210 * auVar37._0_4_;
  local_3d8._4_4_ = fVar154 * fStack_594 + fVar394 * auVar37._4_4_;
  fStack_3d0 = fVar209 * fStack_590 + fVar211 * auVar37._8_4_;
  fStack_3cc = fVar180 * fStack_58c + fVar405 * auVar37._12_4_;
  fVar264 = fVar181 * (local_598 + local_468 * 0.33333334) +
            fVar210 * (auVar37._0_4_ + auVar221._0_4_ * 0.33333334);
  fVar265 = fVar154 * (fStack_594 + fStack_464 * 0.33333334) +
            fVar394 * (auVar37._4_4_ + auVar221._4_4_ * 0.33333334);
  fVar266 = fVar209 * (fStack_590 + fStack_460 * 0.33333334) +
            fVar211 * (auVar37._8_4_ + auVar221._8_4_ * 0.33333334);
  fVar267 = fVar180 * (fStack_58c + fStack_45c * 0.33333334) +
            fVar405 * (auVar37._12_4_ + auVar221._12_4_ * 0.33333334);
  local_538 = auVar139._0_4_;
  fStack_534 = auVar139._4_4_;
  fStack_530 = auVar139._8_4_;
  fStack_52c = auVar139._12_4_;
  auVar188._0_4_ = local_538 * 0.33333334;
  auVar188._4_4_ = fStack_534 * 0.33333334;
  auVar188._8_4_ = fStack_530 * 0.33333334;
  auVar188._12_4_ = fStack_52c * 0.33333334;
  auVar140 = vsubps_avx(auVar115,auVar188);
  auVar251._0_4_ = (fVar379 + auVar106._0_4_) * 0.33333334;
  auVar251._4_4_ = (fVar389 + auVar106._4_4_) * 0.33333334;
  auVar251._8_4_ = (fVar390 + auVar106._8_4_) * 0.33333334;
  auVar251._12_4_ = (fVar391 + auVar106._12_4_) * 0.33333334;
  auVar131 = vsubps_avx(_local_578,auVar251);
  auVar164._0_4_ = auVar110._0_4_ * 0.33333334;
  auVar164._4_4_ = auVar110._4_4_ * 0.33333334;
  auVar164._8_4_ = auVar110._8_4_ * 0.33333334;
  auVar164._12_4_ = auVar110._12_4_ * 0.33333334;
  auVar110 = vsubps_avx(auVar111,auVar164);
  auVar133._0_4_ = (fVar240 + auVar112._0_4_) * 0.33333334;
  auVar133._4_4_ = (fVar241 + auVar112._4_4_) * 0.33333334;
  auVar133._8_4_ = (fVar242 + auVar112._8_4_) * 0.33333334;
  auVar133._12_4_ = (fVar243 + auVar112._12_4_) * 0.33333334;
  auVar37 = vsubps_avx(auVar381,auVar133);
  local_3e8._0_4_ = fVar181 * auVar140._0_4_ + fVar210 * auVar110._0_4_;
  local_3e8._4_4_ = fVar154 * auVar140._4_4_ + fVar394 * auVar110._4_4_;
  fStack_3e0 = fVar209 * auVar140._8_4_ + fVar211 * auVar110._8_4_;
  fStack_3dc = fVar180 * auVar140._12_4_ + fVar405 * auVar110._12_4_;
  local_3f8._0_4_ = fVar210 * auVar111._0_4_ + auVar115._0_4_ * fVar181;
  local_3f8._4_4_ = fVar394 * auVar111._4_4_ + auVar115._4_4_ * fVar154;
  fStack_3f0 = fVar211 * auVar111._8_4_ + auVar115._8_4_ * fVar209;
  fStack_3ec = fVar405 * auVar111._12_4_ + auVar115._12_4_ * fVar180;
  local_408._0_4_ = fVar181 * (float)local_5c8._0_4_ + fVar210 * (auVar361._0_4_ + auVar227._0_4_);
  local_408._4_4_ = fVar154 * (float)local_5c8._4_4_ + fVar394 * (auVar361._4_4_ + auVar227._4_4_);
  fStack_400 = fVar209 * fStack_5c0 + fVar211 * (auVar361._8_4_ + auVar227._8_4_);
  fStack_3fc = fVar180 * fStack_5bc + fVar405 * (auVar361._12_4_ + auVar227._12_4_);
  local_418._0_4_ =
       ((float)local_5c8._0_4_ + (fVar245 + auVar283._0_4_) * 0.33333334) * fVar181 +
       fVar210 * (auVar361._0_4_ + auVar227._0_4_ + (fVar212 + auVar132._0_4_) * 0.33333334);
  local_418._4_4_ =
       ((float)local_5c8._4_4_ + (fVar246 + auVar283._4_4_) * 0.33333334) * fVar154 +
       fVar394 * (auVar361._4_4_ + auVar227._4_4_ + (fVar213 + auVar132._4_4_) * 0.33333334);
  fStack_410 = (fStack_5c0 + (fVar262 + auVar283._8_4_) * 0.33333334) * fVar209 +
               fVar211 * (auVar361._8_4_ + auVar227._8_4_ + (fVar214 + auVar132._8_4_) * 0.33333334)
  ;
  fStack_40c = (fStack_5bc + (fVar263 + auVar283._12_4_) * 0.33333334) * fVar180 +
               fVar405 * (auVar361._12_4_ + auVar227._12_4_ +
                         (fVar215 + auVar132._12_4_) * 0.33333334);
  fVar244 = fVar181 * auVar131._0_4_ + fVar210 * auVar37._0_4_;
  fVar245 = fVar154 * auVar131._4_4_ + fVar394 * auVar37._4_4_;
  fVar246 = fVar209 * auVar131._8_4_ + fVar211 * auVar37._8_4_;
  fVar262 = fVar180 * auVar131._12_4_ + fVar405 * auVar37._12_4_;
  fVar240 = (auVar270._0_4_ + auVar157._0_4_) * fVar181 + fVar210 * auVar381._0_4_;
  fVar241 = (auVar270._4_4_ + auVar157._4_4_) * fVar154 + fVar394 * auVar381._4_4_;
  fVar242 = (auVar270._8_4_ + auVar157._8_4_) * fVar209 + fVar211 * auVar381._8_4_;
  fVar243 = (auVar270._12_4_ + auVar157._12_4_) * fVar180 + fVar405 * auVar381._12_4_;
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_288 = vsubps_avx(_local_3d8,auVar140);
  auVar111 = vmovsldup_avx(local_288);
  auVar131 = vmovshdup_avx(local_288);
  auVar110 = vshufps_avx(local_288,local_288,0xaa);
  fVar181 = (pLVar98->vx).field_0.m128[0];
  fVar154 = (pLVar98->vx).field_0.m128[1];
  fVar209 = (pLVar98->vx).field_0.m128[2];
  fVar180 = (pLVar98->vx).field_0.m128[3];
  fVar210 = (pLVar98->vy).field_0.m128[0];
  fVar394 = (pLVar98->vy).field_0.m128[1];
  fVar211 = (pLVar98->vy).field_0.m128[2];
  fVar405 = (pLVar98->vy).field_0.m128[3];
  fVar212 = (pLVar98->vz).field_0.m128[0];
  fVar213 = (pLVar98->vz).field_0.m128[1];
  fVar214 = (pLVar98->vz).field_0.m128[2];
  fVar215 = (pLVar98->vz).field_0.m128[3];
  local_4e8._0_4_ = fVar181 * auVar111._0_4_ + fVar210 * auVar131._0_4_ + fVar212 * auVar110._0_4_;
  local_4e8._4_4_ = fVar154 * auVar111._4_4_ + fVar394 * auVar131._4_4_ + fVar213 * auVar110._4_4_;
  fStack_4e0 = fVar209 * auVar111._8_4_ + fVar211 * auVar131._8_4_ + fVar214 * auVar110._8_4_;
  fStack_4dc = fVar180 * auVar111._12_4_ + fVar405 * auVar131._12_4_ + fVar215 * auVar110._12_4_;
  auVar83._4_4_ = fVar265;
  auVar83._0_4_ = fVar264;
  auVar83._8_4_ = fVar266;
  auVar83._12_4_ = fVar267;
  local_298 = vsubps_avx(auVar83,auVar140);
  auVar110 = vshufps_avx(local_298,local_298,0xaa);
  auVar131 = vmovshdup_avx(local_298);
  auVar111 = vmovsldup_avx(local_298);
  auVar382._0_8_ =
       CONCAT44(fVar154 * auVar111._4_4_ + fVar394 * auVar131._4_4_ + fVar213 * auVar110._4_4_,
                fVar181 * auVar111._0_4_ + fVar210 * auVar131._0_4_ + fVar212 * auVar110._0_4_);
  auVar382._8_4_ = fVar209 * auVar111._8_4_ + fVar211 * auVar131._8_4_ + fVar214 * auVar110._8_4_;
  auVar382._12_4_ =
       fVar180 * auVar111._12_4_ + fVar405 * auVar131._12_4_ + fVar215 * auVar110._12_4_;
  local_2a8 = vsubps_avx(_local_3e8,auVar140);
  auVar110 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar131 = vmovshdup_avx(local_2a8);
  auVar111 = vmovsldup_avx(local_2a8);
  auVar400._0_4_ = fVar181 * auVar111._0_4_ + fVar210 * auVar131._0_4_ + fVar212 * auVar110._0_4_;
  auVar400._4_4_ = fVar154 * auVar111._4_4_ + fVar394 * auVar131._4_4_ + fVar213 * auVar110._4_4_;
  auVar400._8_4_ = fVar209 * auVar111._8_4_ + fVar211 * auVar131._8_4_ + fVar214 * auVar110._8_4_;
  auVar400._12_4_ =
       fVar180 * auVar111._12_4_ + fVar405 * auVar131._12_4_ + fVar215 * auVar110._12_4_;
  local_2b8 = vsubps_avx(_local_3f8,auVar140);
  auVar110 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar131 = vmovshdup_avx(local_2b8);
  auVar111 = vmovsldup_avx(local_2b8);
  auVar134._0_4_ = auVar111._0_4_ * fVar181 + auVar131._0_4_ * fVar210 + fVar212 * auVar110._0_4_;
  auVar134._4_4_ = auVar111._4_4_ * fVar154 + auVar131._4_4_ * fVar394 + fVar213 * auVar110._4_4_;
  auVar134._8_4_ = auVar111._8_4_ * fVar209 + auVar131._8_4_ * fVar211 + fVar214 * auVar110._8_4_;
  auVar134._12_4_ =
       auVar111._12_4_ * fVar180 + auVar131._12_4_ * fVar405 + fVar215 * auVar110._12_4_;
  local_2c8 = vsubps_avx(_local_408,auVar140);
  auVar110 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar131 = vmovshdup_avx(local_2c8);
  auVar111 = vmovsldup_avx(local_2c8);
  auVar298._0_4_ = auVar111._0_4_ * fVar181 + auVar131._0_4_ * fVar210 + auVar110._0_4_ * fVar212;
  auVar298._4_4_ = auVar111._4_4_ * fVar154 + auVar131._4_4_ * fVar394 + auVar110._4_4_ * fVar213;
  auVar298._8_4_ = auVar111._8_4_ * fVar209 + auVar131._8_4_ * fVar211 + auVar110._8_4_ * fVar214;
  auVar298._12_4_ =
       auVar111._12_4_ * fVar180 + auVar131._12_4_ * fVar405 + auVar110._12_4_ * fVar215;
  local_2d8 = vsubps_avx(_local_418,auVar140);
  auVar110 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar131 = vmovshdup_avx(local_2d8);
  auVar111 = vmovsldup_avx(local_2d8);
  auVar315._0_4_ = auVar111._0_4_ * fVar181 + auVar131._0_4_ * fVar210 + auVar110._0_4_ * fVar212;
  auVar315._4_4_ = auVar111._4_4_ * fVar154 + auVar131._4_4_ * fVar394 + auVar110._4_4_ * fVar213;
  auVar315._8_4_ = auVar111._8_4_ * fVar209 + auVar131._8_4_ * fVar211 + auVar110._8_4_ * fVar214;
  auVar315._12_4_ =
       auVar111._12_4_ * fVar180 + auVar131._12_4_ * fVar405 + auVar110._12_4_ * fVar215;
  auVar81._4_4_ = fVar245;
  auVar81._0_4_ = fVar244;
  auVar81._8_4_ = fVar246;
  auVar81._12_4_ = fVar262;
  local_2e8 = vsubps_avx(auVar81,auVar140);
  auVar110 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar131 = vmovshdup_avx(local_2e8);
  auVar111 = vmovsldup_avx(local_2e8);
  auVar331._0_4_ = auVar111._0_4_ * fVar181 + auVar131._0_4_ * fVar210 + auVar110._0_4_ * fVar212;
  auVar331._4_4_ = auVar111._4_4_ * fVar154 + auVar131._4_4_ * fVar394 + auVar110._4_4_ * fVar213;
  auVar331._8_4_ = auVar111._8_4_ * fVar209 + auVar131._8_4_ * fVar211 + auVar110._8_4_ * fVar214;
  auVar331._12_4_ =
       auVar111._12_4_ * fVar180 + auVar131._12_4_ * fVar405 + auVar110._12_4_ * fVar215;
  auVar79._4_4_ = fVar241;
  auVar79._0_4_ = fVar240;
  auVar79._8_4_ = fVar242;
  auVar79._12_4_ = fVar243;
  local_2f8 = vsubps_avx(auVar79,auVar140);
  auVar111 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar140 = vmovshdup_avx(local_2f8);
  auVar131 = vmovsldup_avx(local_2f8);
  auVar113._0_4_ = fVar181 * auVar131._0_4_ + fVar210 * auVar140._0_4_ + fVar212 * auVar111._0_4_;
  auVar113._4_4_ = fVar154 * auVar131._4_4_ + fVar394 * auVar140._4_4_ + fVar213 * auVar111._4_4_;
  auVar113._8_4_ = fVar209 * auVar131._8_4_ + fVar211 * auVar140._8_4_ + fVar214 * auVar111._8_4_;
  auVar113._12_4_ =
       fVar180 * auVar131._12_4_ + fVar405 * auVar140._12_4_ + fVar215 * auVar111._12_4_;
  auVar110 = vmovlhps_avx(_local_4e8,auVar298);
  auVar37 = vmovlhps_avx(auVar382,auVar315);
  auVar221 = vmovlhps_avx(auVar400,auVar331);
  _local_3c8 = vmovlhps_avx(auVar134,auVar113);
  auVar140 = vminps_avx(auVar110,auVar37);
  auVar131 = vminps_avx(auVar221,_local_3c8);
  auVar111 = vminps_avx(auVar140,auVar131);
  auVar140 = vmaxps_avx(auVar110,auVar37);
  auVar131 = vmaxps_avx(auVar221,_local_3c8);
  auVar140 = vmaxps_avx(auVar140,auVar131);
  auVar131 = vshufpd_avx(auVar111,auVar111,3);
  auVar111 = vminps_avx(auVar111,auVar131);
  auVar131 = vshufpd_avx(auVar140,auVar140,3);
  auVar131 = vmaxps_avx(auVar140,auVar131);
  auVar271._8_4_ = 0x7fffffff;
  auVar271._0_8_ = 0x7fffffff7fffffff;
  auVar271._12_4_ = 0x7fffffff;
  auVar140 = vandps_avx(auVar111,auVar271);
  auVar131 = vandps_avx(auVar131,auVar271);
  auVar140 = vmaxps_avx(auVar140,auVar131);
  auVar131 = vmovshdup_avx(auVar140);
  auVar140 = vmaxss_avx(auVar131,auVar140);
  fVar154 = auVar140._0_4_ * 9.536743e-07;
  register0x00001548 = auVar382._0_8_;
  local_3b8 = auVar382._0_8_;
  auVar140 = vshufps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),0);
  local_138._16_16_ = auVar140;
  local_138._0_16_ = auVar140;
  auVar114._0_8_ = auVar140._0_8_ ^ 0x8000000080000000;
  auVar114._8_4_ = auVar140._8_4_ ^ 0x80000000;
  auVar114._12_4_ = auVar140._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar114;
  local_158._0_16_ = auVar114;
  local_318 = vpshufd_avx(ZEXT416(*(uint *)(local_428 + 2)),0);
  local_328 = vpshufd_avx(ZEXT416(*(uint *)(local_428 + lVar96 * 4 + 6)),0);
  bVar87 = false;
  uVar91 = 0;
  fVar181 = *(float *)(ray + k * 4 + 0x30);
  _local_258 = vsubps_avx(auVar37,auVar110);
  _local_268 = vsubps_avx(auVar221,auVar37);
  _local_278 = vsubps_avx(_local_3c8,auVar221);
  _local_338 = vsubps_avx(_local_408,_local_3d8);
  auVar84._4_4_ = fVar265;
  auVar84._0_4_ = fVar264;
  auVar84._8_4_ = fVar266;
  auVar84._12_4_ = fVar267;
  _local_348 = vsubps_avx(_local_418,auVar84);
  auVar82._4_4_ = fVar245;
  auVar82._0_4_ = fVar244;
  auVar82._8_4_ = fVar246;
  auVar82._12_4_ = fVar262;
  _local_358 = vsubps_avx(auVar82,_local_3e8);
  auVar80._4_4_ = fVar241;
  auVar80._0_4_ = fVar240;
  auVar80._8_4_ = fVar242;
  auVar80._12_4_ = fVar243;
  _local_368 = vsubps_avx(auVar80,_local_3f8);
  _local_5c8 = ZEXT816(0x3f80000000000000);
  local_308 = _local_5c8;
  do {
    auVar140 = vshufps_avx(_local_5c8,_local_5c8,0x50);
    auVar408._8_4_ = 0x3f800000;
    auVar408._0_8_ = &DAT_3f8000003f800000;
    auVar408._12_4_ = 0x3f800000;
    auVar413._16_4_ = 0x3f800000;
    auVar413._0_16_ = auVar408;
    auVar413._20_4_ = 0x3f800000;
    auVar413._24_4_ = 0x3f800000;
    auVar413._28_4_ = 0x3f800000;
    auVar131 = vsubps_avx(auVar408,auVar140);
    fVar209 = auVar140._0_4_;
    fVar180 = auVar140._4_4_;
    fVar210 = auVar140._8_4_;
    fVar394 = auVar140._12_4_;
    fVar211 = auVar131._0_4_;
    fVar405 = auVar131._4_4_;
    fVar212 = auVar131._8_4_;
    fVar213 = auVar131._12_4_;
    auVar165._0_4_ = auVar298._0_4_ * fVar209 + fVar211 * (float)local_4e8._0_4_;
    auVar165._4_4_ = auVar298._4_4_ * fVar180 + fVar405 * (float)local_4e8._4_4_;
    auVar165._8_4_ = auVar298._0_4_ * fVar210 + fVar212 * (float)local_4e8._0_4_;
    auVar165._12_4_ = auVar298._4_4_ * fVar394 + fVar213 * (float)local_4e8._4_4_;
    auVar135._0_4_ = auVar315._0_4_ * fVar209 + local_3b8._0_4_ * fVar211;
    auVar135._4_4_ = auVar315._4_4_ * fVar180 + local_3b8._4_4_ * fVar405;
    auVar135._8_4_ = auVar315._0_4_ * fVar210 + local_3b8._8_4_ * fVar212;
    auVar135._12_4_ = auVar315._4_4_ * fVar394 + local_3b8._12_4_ * fVar213;
    auVar228._0_4_ = auVar331._0_4_ * fVar209 + auVar400._0_4_ * fVar211;
    auVar228._4_4_ = auVar331._4_4_ * fVar180 + auVar400._4_4_ * fVar405;
    auVar228._8_4_ = auVar331._0_4_ * fVar210 + auVar400._0_4_ * fVar212;
    auVar228._12_4_ = auVar331._4_4_ * fVar394 + auVar400._4_4_ * fVar213;
    auVar189._0_4_ = auVar113._0_4_ * fVar209 + auVar134._0_4_ * fVar211;
    auVar189._4_4_ = auVar113._4_4_ * fVar180 + auVar134._4_4_ * fVar405;
    auVar189._8_4_ = auVar113._0_4_ * fVar210 + auVar134._0_4_ * fVar212;
    auVar189._12_4_ = auVar113._4_4_ * fVar394 + auVar134._4_4_ * fVar213;
    auVar140 = vmovshdup_avx(local_308);
    auVar131 = vshufps_avx(local_308,local_308,0);
    auVar313._16_16_ = auVar131;
    auVar313._0_16_ = auVar131;
    auVar111 = vshufps_avx(local_308,local_308,0x55);
    auVar121._16_16_ = auVar111;
    auVar121._0_16_ = auVar111;
    auVar117 = vsubps_avx(auVar121,auVar313);
    auVar111 = vshufps_avx(auVar165,auVar165,0);
    auVar197 = vshufps_avx(auVar165,auVar165,0x55);
    auVar139 = vshufps_avx(auVar135,auVar135,0);
    auVar196 = vshufps_avx(auVar135,auVar135,0x55);
    auVar115 = vshufps_avx(auVar228,auVar228,0);
    auVar166 = vshufps_avx(auVar228,auVar228,0x55);
    auVar10 = vshufps_avx(auVar189,auVar189,0);
    auVar11 = vshufps_avx(auVar189,auVar189,0x55);
    auVar140 = ZEXT416((uint)((auVar140._0_4_ - local_308._0_4_) * 0.04761905));
    auVar140 = vshufps_avx(auVar140,auVar140,0);
    auVar328._0_4_ = auVar131._0_4_ + auVar117._0_4_ * 0.0;
    auVar328._4_4_ = auVar131._4_4_ + auVar117._4_4_ * 0.14285715;
    auVar328._8_4_ = auVar131._8_4_ + auVar117._8_4_ * 0.2857143;
    auVar328._12_4_ = auVar131._12_4_ + auVar117._12_4_ * 0.42857146;
    auVar328._16_4_ = auVar131._0_4_ + auVar117._16_4_ * 0.5714286;
    auVar328._20_4_ = auVar131._4_4_ + auVar117._20_4_ * 0.71428573;
    auVar328._24_4_ = auVar131._8_4_ + auVar117._24_4_ * 0.8571429;
    auVar328._28_4_ = auVar131._12_4_ + auVar117._28_4_;
    auVar30 = vsubps_avx(auVar413,auVar328);
    fVar355 = auVar139._0_4_;
    fVar359 = auVar139._4_4_;
    fVar389 = auVar139._8_4_;
    fVar391 = auVar139._12_4_;
    fVar209 = auVar30._0_4_;
    fVar211 = auVar30._4_4_;
    fVar214 = auVar30._8_4_;
    fVar353 = auVar30._12_4_;
    fVar392 = auVar111._12_4_;
    fVar367 = auVar30._16_4_;
    fVar368 = auVar30._20_4_;
    fVar370 = auVar30._24_4_;
    fVar407 = auVar196._0_4_;
    fVar415 = auVar196._4_4_;
    fVar278 = auVar196._8_4_;
    fVar378 = auVar196._12_4_;
    local_508._0_4_ = auVar197._0_4_;
    local_508._4_4_ = auVar197._4_4_;
    fStack_500 = auVar197._8_4_;
    fStack_4fc = auVar197._12_4_;
    fVar180 = auVar115._0_4_;
    fVar394 = auVar115._4_4_;
    fVar212 = auVar115._8_4_;
    fVar215 = auVar115._12_4_;
    fVar357 = auVar328._0_4_ * fVar180 + fVar355 * fVar209;
    fVar379 = auVar328._4_4_ * fVar394 + fVar359 * fVar211;
    fVar390 = auVar328._8_4_ * fVar212 + fVar389 * fVar214;
    fVar342 = auVar328._12_4_ * fVar215 + fVar391 * fVar353;
    fVar354 = auVar328._16_4_ * fVar180 + fVar355 * fVar367;
    fVar356 = auVar328._20_4_ * fVar394 + fVar359 * fVar368;
    fVar358 = auVar328._24_4_ * fVar212 + fVar389 * fVar370;
    fVar210 = auVar166._0_4_;
    fVar405 = auVar166._4_4_;
    fVar213 = auVar166._8_4_;
    fVar263 = auVar166._12_4_;
    fVar414 = auVar328._0_4_ * fVar210 + fVar407 * fVar209;
    fVar416 = auVar328._4_4_ * fVar405 + fVar415 * fVar211;
    fVar369 = auVar328._8_4_ * fVar213 + fVar278 * fVar214;
    fVar371 = auVar328._12_4_ * fVar263 + fVar378 * fVar353;
    fVar372 = auVar328._16_4_ * fVar210 + fVar407 * fVar367;
    fVar374 = auVar328._20_4_ * fVar405 + fVar415 * fVar368;
    fVar376 = auVar328._24_4_ * fVar213 + fVar278 * fVar370;
    auVar131 = vshufps_avx(auVar165,auVar165,0xaa);
    auVar197 = vshufps_avx(auVar165,auVar165,0xff);
    fVar341 = fVar215 + 0.0;
    auVar139 = vshufps_avx(auVar135,auVar135,0xaa);
    auVar196 = vshufps_avx(auVar135,auVar135,0xff);
    auVar122._0_4_ =
         fVar209 * (fVar355 * auVar328._0_4_ + auVar111._0_4_ * fVar209) + auVar328._0_4_ * fVar357;
    auVar122._4_4_ =
         fVar211 * (fVar359 * auVar328._4_4_ + auVar111._4_4_ * fVar211) + auVar328._4_4_ * fVar379;
    auVar122._8_4_ =
         fVar214 * (fVar389 * auVar328._8_4_ + auVar111._8_4_ * fVar214) + auVar328._8_4_ * fVar390;
    auVar122._12_4_ =
         fVar353 * (fVar391 * auVar328._12_4_ + fVar392 * fVar353) + auVar328._12_4_ * fVar342;
    auVar122._16_4_ =
         fVar367 * (fVar355 * auVar328._16_4_ + auVar111._0_4_ * fVar367) +
         auVar328._16_4_ * fVar354;
    auVar122._20_4_ =
         fVar368 * (fVar359 * auVar328._20_4_ + auVar111._4_4_ * fVar368) +
         auVar328._20_4_ * fVar356;
    auVar122._24_4_ =
         fVar370 * (fVar389 * auVar328._24_4_ + auVar111._8_4_ * fVar370) +
         auVar328._24_4_ * fVar358;
    auVar122._28_4_ = fVar392 + 1.0 + fVar263;
    auVar205._0_4_ =
         fVar209 * (fVar407 * auVar328._0_4_ + fVar209 * (float)local_508._0_4_) +
         auVar328._0_4_ * fVar414;
    auVar205._4_4_ =
         fVar211 * (fVar415 * auVar328._4_4_ + fVar211 * (float)local_508._4_4_) +
         auVar328._4_4_ * fVar416;
    auVar205._8_4_ =
         fVar214 * (fVar278 * auVar328._8_4_ + fVar214 * fStack_500) + auVar328._8_4_ * fVar369;
    auVar205._12_4_ =
         fVar353 * (fVar378 * auVar328._12_4_ + fVar353 * fStack_4fc) + auVar328._12_4_ * fVar371;
    auVar205._16_4_ =
         fVar367 * (fVar407 * auVar328._16_4_ + fVar367 * (float)local_508._0_4_) +
         auVar328._16_4_ * fVar372;
    auVar205._20_4_ =
         fVar368 * (fVar415 * auVar328._20_4_ + fVar368 * (float)local_508._4_4_) +
         auVar328._20_4_ * fVar374;
    auVar205._24_4_ =
         fVar370 * (fVar278 * auVar328._24_4_ + fVar370 * fStack_500) + auVar328._24_4_ * fVar376;
    auVar205._28_4_ = fVar392 + 1.0 + fVar263;
    auVar237._0_4_ =
         fVar209 * fVar357 + auVar328._0_4_ * (auVar10._0_4_ * auVar328._0_4_ + fVar209 * fVar180);
    auVar237._4_4_ =
         fVar211 * fVar379 + auVar328._4_4_ * (auVar10._4_4_ * auVar328._4_4_ + fVar211 * fVar394);
    auVar237._8_4_ =
         fVar214 * fVar390 + auVar328._8_4_ * (auVar10._8_4_ * auVar328._8_4_ + fVar214 * fVar212);
    auVar237._12_4_ =
         fVar353 * fVar342 +
         auVar328._12_4_ * (auVar10._12_4_ * auVar328._12_4_ + fVar353 * fVar215);
    auVar237._16_4_ =
         fVar367 * fVar354 + auVar328._16_4_ * (auVar10._0_4_ * auVar328._16_4_ + fVar367 * fVar180)
    ;
    auVar237._20_4_ =
         fVar368 * fVar356 + auVar328._20_4_ * (auVar10._4_4_ * auVar328._20_4_ + fVar368 * fVar394)
    ;
    auVar237._24_4_ =
         fVar370 * fVar358 + auVar328._24_4_ * (auVar10._8_4_ * auVar328._24_4_ + fVar370 * fVar212)
    ;
    auVar237._28_4_ = fVar263 + fVar341;
    auVar340._0_4_ =
         fVar209 * fVar414 + auVar328._0_4_ * (auVar11._0_4_ * auVar328._0_4_ + fVar209 * fVar210);
    auVar340._4_4_ =
         fVar211 * fVar416 + auVar328._4_4_ * (auVar11._4_4_ * auVar328._4_4_ + fVar211 * fVar405);
    auVar340._8_4_ =
         fVar214 * fVar369 + auVar328._8_4_ * (auVar11._8_4_ * auVar328._8_4_ + fVar214 * fVar213);
    auVar340._12_4_ =
         fVar353 * fVar371 +
         auVar328._12_4_ * (auVar11._12_4_ * auVar328._12_4_ + fVar353 * fVar263);
    auVar340._16_4_ =
         fVar367 * fVar372 + auVar328._16_4_ * (auVar11._0_4_ * auVar328._16_4_ + fVar367 * fVar210)
    ;
    auVar340._20_4_ =
         fVar368 * fVar374 + auVar328._20_4_ * (auVar11._4_4_ * auVar328._20_4_ + fVar368 * fVar405)
    ;
    auVar340._24_4_ =
         fVar370 * fVar376 + auVar328._24_4_ * (auVar11._8_4_ * auVar328._24_4_ + fVar370 * fVar213)
    ;
    auVar340._28_4_ = fVar341 + fVar263 + 0.0;
    local_78._0_4_ = fVar209 * auVar122._0_4_ + auVar328._0_4_ * auVar237._0_4_;
    local_78._4_4_ = fVar211 * auVar122._4_4_ + auVar328._4_4_ * auVar237._4_4_;
    local_78._8_4_ = fVar214 * auVar122._8_4_ + auVar328._8_4_ * auVar237._8_4_;
    local_78._12_4_ = fVar353 * auVar122._12_4_ + auVar328._12_4_ * auVar237._12_4_;
    local_78._16_4_ = fVar367 * auVar122._16_4_ + auVar328._16_4_ * auVar237._16_4_;
    local_78._20_4_ = fVar368 * auVar122._20_4_ + auVar328._20_4_ * auVar237._20_4_;
    local_78._24_4_ = fVar370 * auVar122._24_4_ + auVar328._24_4_ * auVar237._24_4_;
    local_78._28_4_ = fVar392 + fVar391 + fVar263 + 0.0;
    local_98._0_4_ = fVar209 * auVar205._0_4_ + auVar328._0_4_ * auVar340._0_4_;
    local_98._4_4_ = fVar211 * auVar205._4_4_ + auVar328._4_4_ * auVar340._4_4_;
    local_98._8_4_ = fVar214 * auVar205._8_4_ + auVar328._8_4_ * auVar340._8_4_;
    local_98._12_4_ = fVar353 * auVar205._12_4_ + auVar328._12_4_ * auVar340._12_4_;
    local_98._16_4_ = fVar367 * auVar205._16_4_ + auVar328._16_4_ * auVar340._16_4_;
    local_98._20_4_ = fVar368 * auVar205._20_4_ + auVar328._20_4_ * auVar340._20_4_;
    local_98._24_4_ = fVar370 * auVar205._24_4_ + auVar328._24_4_ * auVar340._24_4_;
    local_98._28_4_ = fVar392 + fVar391 + fVar341;
    auVar31 = vsubps_avx(auVar237,auVar122);
    auVar117 = vsubps_avx(auVar340,auVar205);
    local_558._0_4_ = auVar140._0_4_;
    local_558._4_4_ = auVar140._4_4_;
    fStack_550 = auVar140._8_4_;
    fStack_54c = auVar140._12_4_;
    local_d8 = (float)local_558._0_4_ * auVar31._0_4_ * 3.0;
    fStack_d4 = (float)local_558._4_4_ * auVar31._4_4_ * 3.0;
    auVar40._4_4_ = fStack_d4;
    auVar40._0_4_ = local_d8;
    fStack_d0 = fStack_550 * auVar31._8_4_ * 3.0;
    auVar40._8_4_ = fStack_d0;
    fStack_cc = fStack_54c * auVar31._12_4_ * 3.0;
    auVar40._12_4_ = fStack_cc;
    fStack_c8 = (float)local_558._0_4_ * auVar31._16_4_ * 3.0;
    auVar40._16_4_ = fStack_c8;
    fStack_c4 = (float)local_558._4_4_ * auVar31._20_4_ * 3.0;
    auVar40._20_4_ = fStack_c4;
    fStack_c0 = fStack_550 * auVar31._24_4_ * 3.0;
    auVar40._24_4_ = fStack_c0;
    auVar40._28_4_ = auVar31._28_4_;
    fVar379 = (float)local_558._0_4_ * auVar117._0_4_ * 3.0;
    fVar389 = (float)local_558._4_4_ * auVar117._4_4_ * 3.0;
    auVar41._4_4_ = fVar389;
    auVar41._0_4_ = fVar379;
    fVar390 = fStack_550 * auVar117._8_4_ * 3.0;
    auVar41._8_4_ = fVar390;
    fVar391 = fStack_54c * auVar117._12_4_ * 3.0;
    auVar41._12_4_ = fVar391;
    fVar342 = (float)local_558._0_4_ * auVar117._16_4_ * 3.0;
    auVar41._16_4_ = fVar342;
    fVar354 = (float)local_558._4_4_ * auVar117._20_4_ * 3.0;
    auVar41._20_4_ = fVar354;
    fVar356 = fStack_550 * auVar117._24_4_ * 3.0;
    auVar41._24_4_ = fVar356;
    auVar41._28_4_ = auVar237._28_4_;
    auVar29 = vsubps_avx(local_78,auVar40);
    auVar117 = vperm2f128_avx(auVar29,auVar29,1);
    auVar117 = vshufps_avx(auVar117,auVar29,0x30);
    auVar117 = vshufps_avx(auVar29,auVar117,0x29);
    auVar32 = vsubps_avx(local_98,auVar41);
    auVar29 = vperm2f128_avx(auVar32,auVar32,1);
    auVar29 = vshufps_avx(auVar29,auVar32,0x30);
    auVar33 = vshufps_avx(auVar32,auVar29,0x29);
    fVar395 = auVar139._0_4_;
    fVar404 = auVar139._4_4_;
    fVar406 = auVar139._8_4_;
    fVar180 = auVar196._0_4_;
    fVar405 = auVar196._4_4_;
    fVar215 = auVar196._8_4_;
    fVar355 = auVar196._12_4_;
    fVar393 = auVar197._12_4_;
    auVar140 = vshufps_avx(auVar228,auVar228,0xaa);
    fVar210 = auVar140._0_4_;
    fVar212 = auVar140._4_4_;
    fVar263 = auVar140._8_4_;
    fVar357 = auVar140._12_4_;
    fVar371 = auVar328._0_4_ * fVar210 + fVar395 * fVar209;
    fVar372 = auVar328._4_4_ * fVar212 + fVar404 * fVar211;
    fVar374 = auVar328._8_4_ * fVar263 + fVar406 * fVar214;
    fVar376 = auVar328._12_4_ * fVar357 + auVar139._12_4_ * fVar353;
    fVar373 = auVar328._16_4_ * fVar210 + fVar395 * fVar367;
    fVar375 = auVar328._20_4_ * fVar212 + fVar404 * fVar368;
    fVar377 = auVar328._24_4_ * fVar263 + fVar406 * fVar370;
    fVar378 = fVar393 + fVar392 + fVar378;
    auVar140 = vshufps_avx(auVar228,auVar228,0xff);
    fVar394 = auVar140._0_4_;
    fVar213 = auVar140._4_4_;
    fVar341 = auVar140._8_4_;
    fVar359 = auVar140._12_4_;
    fVar358 = auVar328._0_4_ * fVar394 + fVar209 * fVar180;
    fVar407 = auVar328._4_4_ * fVar213 + fVar211 * fVar405;
    fVar414 = auVar328._8_4_ * fVar341 + fVar214 * fVar215;
    fVar415 = auVar328._12_4_ * fVar359 + fVar353 * fVar355;
    fVar416 = auVar328._16_4_ * fVar394 + fVar367 * fVar180;
    fVar278 = auVar328._20_4_ * fVar213 + fVar368 * fVar405;
    fVar369 = auVar328._24_4_ * fVar341 + fVar370 * fVar215;
    auVar140 = vshufps_avx(auVar189,auVar189,0xaa);
    auVar111 = vshufps_avx(auVar189,auVar189,0xff);
    fVar392 = auVar111._12_4_;
    auVar123._0_4_ =
         auVar328._0_4_ * fVar371 + fVar209 * (fVar395 * auVar328._0_4_ + auVar131._0_4_ * fVar209);
    auVar123._4_4_ =
         auVar328._4_4_ * fVar372 + fVar211 * (fVar404 * auVar328._4_4_ + auVar131._4_4_ * fVar211);
    auVar123._8_4_ =
         auVar328._8_4_ * fVar374 + fVar214 * (fVar406 * auVar328._8_4_ + auVar131._8_4_ * fVar214);
    auVar123._12_4_ =
         auVar328._12_4_ * fVar376 +
         fVar353 * (auVar139._12_4_ * auVar328._12_4_ + auVar131._12_4_ * fVar353);
    auVar123._16_4_ =
         auVar328._16_4_ * fVar373 +
         fVar367 * (fVar395 * auVar328._16_4_ + auVar131._0_4_ * fVar367);
    auVar123._20_4_ =
         auVar328._20_4_ * fVar375 +
         fVar368 * (fVar404 * auVar328._20_4_ + auVar131._4_4_ * fVar368);
    auVar123._24_4_ =
         auVar328._24_4_ * fVar377 +
         fVar370 * (fVar406 * auVar328._24_4_ + auVar131._8_4_ * fVar370);
    auVar123._28_4_ = fVar392 + auVar32._28_4_ + auVar29._28_4_;
    auVar388._0_4_ =
         auVar328._0_4_ * fVar358 + fVar209 * (auVar328._0_4_ * fVar180 + auVar197._0_4_ * fVar209);
    auVar388._4_4_ =
         auVar328._4_4_ * fVar407 + fVar211 * (auVar328._4_4_ * fVar405 + auVar197._4_4_ * fVar211);
    auVar388._8_4_ =
         auVar328._8_4_ * fVar414 + fVar214 * (auVar328._8_4_ * fVar215 + auVar197._8_4_ * fVar214);
    auVar388._12_4_ =
         auVar328._12_4_ * fVar415 + fVar353 * (auVar328._12_4_ * fVar355 + fVar393 * fVar353);
    auVar388._16_4_ =
         auVar328._16_4_ * fVar416 +
         fVar367 * (auVar328._16_4_ * fVar180 + auVar197._0_4_ * fVar367);
    auVar388._20_4_ =
         auVar328._20_4_ * fVar278 +
         fVar368 * (auVar328._20_4_ * fVar405 + auVar197._4_4_ * fVar368);
    auVar388._24_4_ =
         auVar328._24_4_ * fVar369 +
         fVar370 * (auVar328._24_4_ * fVar215 + auVar197._8_4_ * fVar370);
    auVar388._28_4_ = fVar392 + auVar29._28_4_ + auVar237._28_4_;
    auVar29 = vperm2f128_avx(local_78,local_78,1);
    auVar29 = vshufps_avx(auVar29,local_78,0x30);
    auVar34 = vshufps_avx(local_78,auVar29,0x29);
    auVar238._0_4_ =
         fVar209 * fVar371 + auVar328._0_4_ * (auVar140._0_4_ * auVar328._0_4_ + fVar209 * fVar210);
    auVar238._4_4_ =
         fVar211 * fVar372 + auVar328._4_4_ * (auVar140._4_4_ * auVar328._4_4_ + fVar211 * fVar212);
    auVar238._8_4_ =
         fVar214 * fVar374 + auVar328._8_4_ * (auVar140._8_4_ * auVar328._8_4_ + fVar214 * fVar263);
    auVar238._12_4_ =
         fVar353 * fVar376 +
         auVar328._12_4_ * (auVar140._12_4_ * auVar328._12_4_ + fVar353 * fVar357);
    auVar238._16_4_ =
         fVar367 * fVar373 +
         auVar328._16_4_ * (auVar140._0_4_ * auVar328._16_4_ + fVar367 * fVar210);
    auVar238._20_4_ =
         fVar368 * fVar375 +
         auVar328._20_4_ * (auVar140._4_4_ * auVar328._20_4_ + fVar368 * fVar212);
    auVar238._24_4_ =
         fVar370 * fVar377 +
         auVar328._24_4_ * (auVar140._8_4_ * auVar328._24_4_ + fVar370 * fVar263);
    auVar238._28_4_ = fVar378 + auVar140._12_4_ + fVar357;
    auVar277._0_4_ =
         fVar209 * fVar358 + auVar328._0_4_ * (auVar111._0_4_ * auVar328._0_4_ + fVar209 * fVar394);
    auVar277._4_4_ =
         fVar211 * fVar407 + auVar328._4_4_ * (auVar111._4_4_ * auVar328._4_4_ + fVar211 * fVar213);
    auVar277._8_4_ =
         fVar214 * fVar414 + auVar328._8_4_ * (auVar111._8_4_ * auVar328._8_4_ + fVar214 * fVar341);
    auVar277._12_4_ =
         fVar353 * fVar415 + auVar328._12_4_ * (fVar392 * auVar328._12_4_ + fVar353 * fVar359);
    auVar277._16_4_ =
         fVar367 * fVar416 +
         auVar328._16_4_ * (auVar111._0_4_ * auVar328._16_4_ + fVar367 * fVar394);
    auVar277._20_4_ =
         fVar368 * fVar278 +
         auVar328._20_4_ * (auVar111._4_4_ * auVar328._20_4_ + fVar368 * fVar213);
    auVar277._24_4_ =
         fVar370 * fVar369 +
         auVar328._24_4_ * (auVar111._8_4_ * auVar328._24_4_ + fVar370 * fVar341);
    auVar277._28_4_ = fVar393 + fVar355 + fVar392 + fVar359;
    auVar290._0_4_ = fVar209 * auVar123._0_4_ + auVar328._0_4_ * auVar238._0_4_;
    auVar290._4_4_ = fVar211 * auVar123._4_4_ + auVar328._4_4_ * auVar238._4_4_;
    auVar290._8_4_ = fVar214 * auVar123._8_4_ + auVar328._8_4_ * auVar238._8_4_;
    auVar290._12_4_ = fVar353 * auVar123._12_4_ + auVar328._12_4_ * auVar238._12_4_;
    auVar290._16_4_ = fVar367 * auVar123._16_4_ + auVar328._16_4_ * auVar238._16_4_;
    auVar290._20_4_ = fVar368 * auVar123._20_4_ + auVar328._20_4_ * auVar238._20_4_;
    auVar290._24_4_ = fVar370 * auVar123._24_4_ + auVar328._24_4_ * auVar238._24_4_;
    auVar290._28_4_ = fVar378 + fVar392 + fVar359;
    auVar314._0_4_ = fVar209 * auVar388._0_4_ + auVar328._0_4_ * auVar277._0_4_;
    auVar314._4_4_ = fVar211 * auVar388._4_4_ + auVar328._4_4_ * auVar277._4_4_;
    auVar314._8_4_ = fVar214 * auVar388._8_4_ + auVar328._8_4_ * auVar277._8_4_;
    auVar314._12_4_ = fVar353 * auVar388._12_4_ + auVar328._12_4_ * auVar277._12_4_;
    auVar314._16_4_ = fVar367 * auVar388._16_4_ + auVar328._16_4_ * auVar277._16_4_;
    auVar314._20_4_ = fVar368 * auVar388._20_4_ + auVar328._20_4_ * auVar277._20_4_;
    auVar314._24_4_ = fVar370 * auVar388._24_4_ + auVar328._24_4_ * auVar277._24_4_;
    auVar314._28_4_ = auVar30._28_4_ + auVar328._28_4_;
    auVar29 = vsubps_avx(auVar238,auVar123);
    auVar30 = vsubps_avx(auVar277,auVar388);
    local_f8 = (float)local_558._0_4_ * auVar29._0_4_ * 3.0;
    fStack_f4 = (float)local_558._4_4_ * auVar29._4_4_ * 3.0;
    auVar42._4_4_ = fStack_f4;
    auVar42._0_4_ = local_f8;
    fStack_f0 = fStack_550 * auVar29._8_4_ * 3.0;
    auVar42._8_4_ = fStack_f0;
    fStack_ec = fStack_54c * auVar29._12_4_ * 3.0;
    auVar42._12_4_ = fStack_ec;
    fStack_e8 = (float)local_558._0_4_ * auVar29._16_4_ * 3.0;
    auVar42._16_4_ = fStack_e8;
    fStack_e4 = (float)local_558._4_4_ * auVar29._20_4_ * 3.0;
    auVar42._20_4_ = fStack_e4;
    fStack_e0 = fStack_550 * auVar29._24_4_ * 3.0;
    auVar42._24_4_ = fStack_e0;
    auVar42._28_4_ = auVar277._28_4_;
    local_118 = (float)local_558._0_4_ * auVar30._0_4_ * 3.0;
    fStack_114 = (float)local_558._4_4_ * auVar30._4_4_ * 3.0;
    auVar43._4_4_ = fStack_114;
    auVar43._0_4_ = local_118;
    fStack_110 = fStack_550 * auVar30._8_4_ * 3.0;
    auVar43._8_4_ = fStack_110;
    fStack_10c = fStack_54c * auVar30._12_4_ * 3.0;
    auVar43._12_4_ = fStack_10c;
    local_558._0_4_ = (float)local_558._0_4_ * auVar30._16_4_ * 3.0;
    auVar43._16_4_ = local_558._0_4_;
    local_558._4_4_ = (float)local_558._4_4_ * auVar30._20_4_ * 3.0;
    auVar43._20_4_ = local_558._4_4_;
    fStack_550 = fStack_550 * auVar30._24_4_ * 3.0;
    auVar43._24_4_ = fStack_550;
    auVar43._28_4_ = fStack_54c;
    auVar29 = vperm2f128_avx(auVar290,auVar290,1);
    auVar29 = vshufps_avx(auVar29,auVar290,0x30);
    auVar35 = vshufps_avx(auVar290,auVar29,0x29);
    auVar30 = vsubps_avx(auVar290,auVar42);
    auVar29 = vperm2f128_avx(auVar30,auVar30,1);
    auVar29 = vshufps_avx(auVar29,auVar30,0x30);
    auVar36 = vshufps_avx(auVar30,auVar29,0x29);
    auVar30 = vsubps_avx(auVar314,auVar43);
    auVar29 = vperm2f128_avx(auVar30,auVar30,1);
    auVar29 = vshufps_avx(auVar29,auVar30,0x30);
    auVar38 = vshufps_avx(auVar30,auVar29,0x29);
    auVar32 = vsubps_avx(auVar290,local_78);
    auVar118 = vsubps_avx(auVar35,auVar34);
    fVar209 = auVar118._0_4_ + auVar32._0_4_;
    fVar180 = auVar118._4_4_ + auVar32._4_4_;
    fVar210 = auVar118._8_4_ + auVar32._8_4_;
    fVar394 = auVar118._12_4_ + auVar32._12_4_;
    fVar211 = auVar118._16_4_ + auVar32._16_4_;
    fVar405 = auVar118._20_4_ + auVar32._20_4_;
    fVar212 = auVar118._24_4_ + auVar32._24_4_;
    auVar30 = vperm2f128_avx(local_98,local_98,1);
    auVar30 = vshufps_avx(auVar30,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar30,0x29);
    auVar30 = vperm2f128_avx(auVar314,auVar314,1);
    auVar30 = vshufps_avx(auVar30,auVar314,0x30);
    auVar39 = vshufps_avx(auVar314,auVar30,0x29);
    auVar30 = vsubps_avx(auVar314,local_98);
    auVar119 = vsubps_avx(auVar39,local_b8);
    fVar213 = auVar30._0_4_ + auVar119._0_4_;
    fVar214 = auVar30._4_4_ + auVar119._4_4_;
    fVar215 = auVar30._8_4_ + auVar119._8_4_;
    fVar263 = auVar30._12_4_ + auVar119._12_4_;
    fVar341 = auVar30._16_4_ + auVar119._16_4_;
    fVar353 = auVar30._20_4_ + auVar119._20_4_;
    fVar355 = auVar30._24_4_ + auVar119._24_4_;
    fVar357 = auVar30._28_4_;
    auVar44._4_4_ = local_98._4_4_ * fVar180;
    auVar44._0_4_ = local_98._0_4_ * fVar209;
    auVar44._8_4_ = local_98._8_4_ * fVar210;
    auVar44._12_4_ = local_98._12_4_ * fVar394;
    auVar44._16_4_ = local_98._16_4_ * fVar211;
    auVar44._20_4_ = local_98._20_4_ * fVar405;
    auVar44._24_4_ = local_98._24_4_ * fVar212;
    auVar44._28_4_ = fVar357;
    auVar45._4_4_ = fVar214 * local_78._4_4_;
    auVar45._0_4_ = fVar213 * local_78._0_4_;
    auVar45._8_4_ = fVar215 * local_78._8_4_;
    auVar45._12_4_ = fVar263 * local_78._12_4_;
    auVar45._16_4_ = fVar341 * local_78._16_4_;
    auVar45._20_4_ = fVar353 * local_78._20_4_;
    auVar45._24_4_ = fVar355 * local_78._24_4_;
    auVar45._28_4_ = auVar29._28_4_;
    auVar30 = vsubps_avx(auVar44,auVar45);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar31._28_4_;
    fVar379 = local_98._0_4_ + fVar379;
    fVar389 = local_98._4_4_ + fVar389;
    fVar390 = local_98._8_4_ + fVar390;
    fVar391 = local_98._12_4_ + fVar391;
    fVar342 = local_98._16_4_ + fVar342;
    fVar354 = local_98._20_4_ + fVar354;
    fVar356 = local_98._24_4_ + fVar356;
    auVar46._4_4_ = fVar389 * fVar180;
    auVar46._0_4_ = fVar379 * fVar209;
    auVar46._8_4_ = fVar390 * fVar210;
    auVar46._12_4_ = fVar391 * fVar394;
    auVar46._16_4_ = fVar342 * fVar211;
    auVar46._20_4_ = fVar354 * fVar405;
    auVar46._24_4_ = fVar356 * fVar212;
    auVar46._28_4_ = fVar357;
    auVar47._4_4_ = fVar214 * fStack_d4;
    auVar47._0_4_ = fVar213 * local_d8;
    auVar47._8_4_ = fVar215 * fStack_d0;
    auVar47._12_4_ = fVar263 * fStack_cc;
    auVar47._16_4_ = fVar341 * fStack_c8;
    auVar47._20_4_ = fVar353 * fStack_c4;
    auVar47._24_4_ = fVar355 * fStack_c0;
    auVar47._28_4_ = fStack_bc;
    auVar31 = vsubps_avx(auVar46,auVar47);
    auVar48._4_4_ = auVar33._4_4_ * fVar180;
    auVar48._0_4_ = auVar33._0_4_ * fVar209;
    auVar48._8_4_ = auVar33._8_4_ * fVar210;
    auVar48._12_4_ = auVar33._12_4_ * fVar394;
    auVar48._16_4_ = auVar33._16_4_ * fVar211;
    auVar48._20_4_ = auVar33._20_4_ * fVar405;
    auVar48._24_4_ = auVar33._24_4_ * fVar212;
    auVar48._28_4_ = fVar357;
    local_508._0_4_ = auVar117._0_4_;
    local_508._4_4_ = auVar117._4_4_;
    fStack_500 = auVar117._8_4_;
    fStack_4fc = auVar117._12_4_;
    fStack_4f8 = auVar117._16_4_;
    fStack_4f4 = auVar117._20_4_;
    fStack_4f0 = auVar117._24_4_;
    auVar49._4_4_ = fVar214 * (float)local_508._4_4_;
    auVar49._0_4_ = fVar213 * (float)local_508._0_4_;
    auVar49._8_4_ = fVar215 * fStack_500;
    auVar49._12_4_ = fVar263 * fStack_4fc;
    auVar49._16_4_ = fVar341 * fStack_4f8;
    auVar49._20_4_ = fVar353 * fStack_4f4;
    auVar49._24_4_ = fVar355 * fStack_4f0;
    auVar49._28_4_ = 0x40400000;
    auVar149 = vsubps_avx(auVar48,auVar49);
    auVar50._4_4_ = local_b8._4_4_ * fVar180;
    auVar50._0_4_ = local_b8._0_4_ * fVar209;
    auVar50._8_4_ = local_b8._8_4_ * fVar210;
    auVar50._12_4_ = local_b8._12_4_ * fVar394;
    auVar50._16_4_ = local_b8._16_4_ * fVar211;
    auVar50._20_4_ = local_b8._20_4_ * fVar405;
    auVar50._24_4_ = local_b8._24_4_ * fVar212;
    auVar50._28_4_ = fVar357;
    auVar51._4_4_ = auVar34._4_4_ * fVar214;
    auVar51._0_4_ = auVar34._0_4_ * fVar213;
    auVar51._8_4_ = auVar34._8_4_ * fVar215;
    auVar51._12_4_ = auVar34._12_4_ * fVar263;
    auVar51._16_4_ = auVar34._16_4_ * fVar341;
    auVar51._20_4_ = auVar34._20_4_ * fVar353;
    auVar51._24_4_ = auVar34._24_4_ * fVar355;
    auVar51._28_4_ = local_b8._28_4_;
    auVar150 = vsubps_avx(auVar50,auVar51);
    auVar52._4_4_ = auVar314._4_4_ * fVar180;
    auVar52._0_4_ = auVar314._0_4_ * fVar209;
    auVar52._8_4_ = auVar314._8_4_ * fVar210;
    auVar52._12_4_ = auVar314._12_4_ * fVar394;
    auVar52._16_4_ = auVar314._16_4_ * fVar211;
    auVar52._20_4_ = auVar314._20_4_ * fVar405;
    auVar52._24_4_ = auVar314._24_4_ * fVar212;
    auVar52._28_4_ = fVar357;
    auVar53._4_4_ = fVar214 * auVar290._4_4_;
    auVar53._0_4_ = fVar213 * auVar290._0_4_;
    auVar53._8_4_ = fVar215 * auVar290._8_4_;
    auVar53._12_4_ = fVar263 * auVar290._12_4_;
    auVar53._16_4_ = fVar341 * auVar290._16_4_;
    auVar53._20_4_ = fVar353 * auVar290._20_4_;
    auVar53._24_4_ = fVar355 * auVar290._24_4_;
    auVar53._28_4_ = auVar33._28_4_;
    auVar151 = vsubps_avx(auVar52,auVar53);
    local_f8 = auVar290._0_4_ + local_f8;
    fStack_f4 = auVar290._4_4_ + fStack_f4;
    fStack_f0 = auVar290._8_4_ + fStack_f0;
    fStack_ec = auVar290._12_4_ + fStack_ec;
    fStack_e8 = auVar290._16_4_ + fStack_e8;
    fStack_e4 = auVar290._20_4_ + fStack_e4;
    fStack_e0 = auVar290._24_4_ + fStack_e0;
    fStack_dc = auVar290._28_4_ + auVar277._28_4_;
    local_118 = auVar314._0_4_ + local_118;
    fStack_114 = auVar314._4_4_ + fStack_114;
    fStack_110 = auVar314._8_4_ + fStack_110;
    fStack_10c = auVar314._12_4_ + fStack_10c;
    fStack_108 = auVar314._16_4_ + (float)local_558._0_4_;
    fStack_104 = auVar314._20_4_ + (float)local_558._4_4_;
    fStack_100 = auVar314._24_4_ + fStack_550;
    fStack_fc = auVar314._28_4_ + fStack_54c;
    auVar54._4_4_ = fStack_114 * fVar180;
    auVar54._0_4_ = local_118 * fVar209;
    auVar54._8_4_ = fStack_110 * fVar210;
    auVar54._12_4_ = fStack_10c * fVar394;
    auVar54._16_4_ = fStack_108 * fVar211;
    auVar54._20_4_ = fStack_104 * fVar405;
    auVar54._24_4_ = fStack_100 * fVar212;
    auVar54._28_4_ = auVar314._28_4_ + fStack_54c;
    auVar55._4_4_ = fStack_f4 * fVar214;
    auVar55._0_4_ = local_f8 * fVar213;
    auVar55._8_4_ = fStack_f0 * fVar215;
    auVar55._12_4_ = fStack_ec * fVar263;
    auVar55._16_4_ = fStack_e8 * fVar341;
    auVar55._20_4_ = fStack_e4 * fVar353;
    auVar55._24_4_ = fStack_e0 * fVar355;
    auVar55._28_4_ = fStack_dc;
    auVar174 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = auVar38._4_4_ * fVar180;
    auVar56._0_4_ = auVar38._0_4_ * fVar209;
    auVar56._8_4_ = auVar38._8_4_ * fVar210;
    auVar56._12_4_ = auVar38._12_4_ * fVar394;
    auVar56._16_4_ = auVar38._16_4_ * fVar211;
    auVar56._20_4_ = auVar38._20_4_ * fVar405;
    auVar56._24_4_ = auVar38._24_4_ * fVar212;
    auVar56._28_4_ = fStack_dc;
    auVar57._4_4_ = fVar214 * auVar36._4_4_;
    auVar57._0_4_ = fVar213 * auVar36._0_4_;
    auVar57._8_4_ = fVar215 * auVar36._8_4_;
    auVar57._12_4_ = fVar263 * auVar36._12_4_;
    auVar57._16_4_ = fVar341 * auVar36._16_4_;
    auVar57._20_4_ = fVar353 * auVar36._20_4_;
    auVar57._24_4_ = fVar355 * auVar36._24_4_;
    auVar57._28_4_ = auVar36._28_4_;
    auVar175 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = auVar39._4_4_ * fVar180;
    auVar58._0_4_ = auVar39._0_4_ * fVar209;
    auVar58._8_4_ = auVar39._8_4_ * fVar210;
    auVar58._12_4_ = auVar39._12_4_ * fVar394;
    auVar58._16_4_ = auVar39._16_4_ * fVar211;
    auVar58._20_4_ = auVar39._20_4_ * fVar405;
    auVar58._24_4_ = auVar39._24_4_ * fVar212;
    auVar58._28_4_ = auVar118._28_4_ + auVar32._28_4_;
    auVar59._4_4_ = auVar35._4_4_ * fVar214;
    auVar59._0_4_ = auVar35._0_4_ * fVar213;
    auVar59._8_4_ = auVar35._8_4_ * fVar215;
    auVar59._12_4_ = auVar35._12_4_ * fVar263;
    auVar59._16_4_ = auVar35._16_4_ * fVar341;
    auVar59._20_4_ = auVar35._20_4_ * fVar353;
    auVar59._24_4_ = auVar35._24_4_ * fVar355;
    auVar59._28_4_ = fVar357 + auVar119._28_4_;
    auVar118 = vsubps_avx(auVar58,auVar59);
    auVar29 = vminps_avx(auVar30,auVar31);
    auVar117 = vmaxps_avx(auVar30,auVar31);
    auVar30 = vminps_avx(auVar149,auVar150);
    auVar30 = vminps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar149,auVar150);
    auVar117 = vmaxps_avx(auVar117,auVar29);
    auVar31 = vminps_avx(auVar151,auVar174);
    auVar29 = vmaxps_avx(auVar151,auVar174);
    auVar32 = vminps_avx(auVar175,auVar118);
    auVar31 = vminps_avx(auVar31,auVar32);
    auVar31 = vminps_avx(auVar30,auVar31);
    auVar30 = vmaxps_avx(auVar175,auVar118);
    auVar29 = vmaxps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar117,auVar29);
    auVar117 = vcmpps_avx(auVar31,local_138,2);
    auVar29 = vcmpps_avx(auVar29,local_158,5);
    auVar117 = vandps_avx(auVar29,auVar117);
    auVar29 = local_248 & auVar117;
    uVar89 = 0;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar29 = vsubps_avx(auVar34,local_78);
      auVar30 = vsubps_avx(auVar35,auVar290);
      fVar180 = auVar29._0_4_ + auVar30._0_4_;
      fVar210 = auVar29._4_4_ + auVar30._4_4_;
      fVar394 = auVar29._8_4_ + auVar30._8_4_;
      fVar211 = auVar29._12_4_ + auVar30._12_4_;
      fVar405 = auVar29._16_4_ + auVar30._16_4_;
      fVar212 = auVar29._20_4_ + auVar30._20_4_;
      fVar213 = auVar29._24_4_ + auVar30._24_4_;
      auVar31 = vsubps_avx(local_b8,local_98);
      auVar32 = vsubps_avx(auVar39,auVar314);
      fVar214 = auVar31._0_4_ + auVar32._0_4_;
      fVar215 = auVar31._4_4_ + auVar32._4_4_;
      fVar263 = auVar31._8_4_ + auVar32._8_4_;
      fVar341 = auVar31._12_4_ + auVar32._12_4_;
      fVar353 = auVar31._16_4_ + auVar32._16_4_;
      fVar355 = auVar31._20_4_ + auVar32._20_4_;
      fVar357 = auVar31._24_4_ + auVar32._24_4_;
      fVar209 = auVar32._28_4_;
      auVar60._4_4_ = local_98._4_4_ * fVar210;
      auVar60._0_4_ = local_98._0_4_ * fVar180;
      auVar60._8_4_ = local_98._8_4_ * fVar394;
      auVar60._12_4_ = local_98._12_4_ * fVar211;
      auVar60._16_4_ = local_98._16_4_ * fVar405;
      auVar60._20_4_ = local_98._20_4_ * fVar212;
      auVar60._24_4_ = local_98._24_4_ * fVar213;
      auVar60._28_4_ = local_98._28_4_;
      auVar61._4_4_ = local_78._4_4_ * fVar215;
      auVar61._0_4_ = local_78._0_4_ * fVar214;
      auVar61._8_4_ = local_78._8_4_ * fVar263;
      auVar61._12_4_ = local_78._12_4_ * fVar341;
      auVar61._16_4_ = local_78._16_4_ * fVar353;
      auVar61._20_4_ = local_78._20_4_ * fVar355;
      auVar61._24_4_ = local_78._24_4_ * fVar357;
      auVar61._28_4_ = local_78._28_4_;
      auVar32 = vsubps_avx(auVar60,auVar61);
      auVar62._4_4_ = fVar389 * fVar210;
      auVar62._0_4_ = fVar379 * fVar180;
      auVar62._8_4_ = fVar390 * fVar394;
      auVar62._12_4_ = fVar391 * fVar211;
      auVar62._16_4_ = fVar342 * fVar405;
      auVar62._20_4_ = fVar354 * fVar212;
      auVar62._24_4_ = fVar356 * fVar213;
      auVar62._28_4_ = local_98._28_4_;
      auVar63._4_4_ = fVar215 * fStack_d4;
      auVar63._0_4_ = fVar214 * local_d8;
      auVar63._8_4_ = fVar263 * fStack_d0;
      auVar63._12_4_ = fVar341 * fStack_cc;
      auVar63._16_4_ = fVar353 * fStack_c8;
      auVar63._20_4_ = fVar355 * fStack_c4;
      auVar63._24_4_ = fVar357 * fStack_c0;
      auVar63._28_4_ = fVar209;
      auVar118 = vsubps_avx(auVar62,auVar63);
      auVar64._4_4_ = fVar210 * auVar33._4_4_;
      auVar64._0_4_ = fVar180 * auVar33._0_4_;
      auVar64._8_4_ = fVar394 * auVar33._8_4_;
      auVar64._12_4_ = fVar211 * auVar33._12_4_;
      auVar64._16_4_ = fVar405 * auVar33._16_4_;
      auVar64._20_4_ = fVar212 * auVar33._20_4_;
      auVar64._24_4_ = fVar213 * auVar33._24_4_;
      auVar64._28_4_ = fVar209;
      auVar65._4_4_ = fVar215 * (float)local_508._4_4_;
      auVar65._0_4_ = fVar214 * (float)local_508._0_4_;
      auVar65._8_4_ = fVar263 * fStack_500;
      auVar65._12_4_ = fVar341 * fStack_4fc;
      auVar65._16_4_ = fVar353 * fStack_4f8;
      auVar65._20_4_ = fVar355 * fStack_4f4;
      auVar65._24_4_ = fVar357 * fStack_4f0;
      auVar65._28_4_ = local_98._28_4_ + auVar237._28_4_;
      auVar33 = vsubps_avx(auVar64,auVar65);
      auVar66._4_4_ = local_b8._4_4_ * fVar210;
      auVar66._0_4_ = local_b8._0_4_ * fVar180;
      auVar66._8_4_ = local_b8._8_4_ * fVar394;
      auVar66._12_4_ = local_b8._12_4_ * fVar211;
      auVar66._16_4_ = local_b8._16_4_ * fVar405;
      auVar66._20_4_ = local_b8._20_4_ * fVar212;
      auVar66._24_4_ = local_b8._24_4_ * fVar213;
      auVar66._28_4_ = local_98._28_4_ + auVar237._28_4_;
      auVar67._4_4_ = auVar34._4_4_ * fVar215;
      auVar67._0_4_ = auVar34._0_4_ * fVar214;
      auVar67._8_4_ = auVar34._8_4_ * fVar263;
      auVar67._12_4_ = auVar34._12_4_ * fVar341;
      auVar67._16_4_ = auVar34._16_4_ * fVar353;
      auVar67._20_4_ = auVar34._20_4_ * fVar355;
      uVar8 = auVar34._28_4_;
      auVar67._24_4_ = auVar34._24_4_ * fVar357;
      auVar67._28_4_ = uVar8;
      auVar34 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = auVar314._4_4_ * fVar210;
      auVar68._0_4_ = auVar314._0_4_ * fVar180;
      auVar68._8_4_ = auVar314._8_4_ * fVar394;
      auVar68._12_4_ = auVar314._12_4_ * fVar211;
      auVar68._16_4_ = auVar314._16_4_ * fVar405;
      auVar68._20_4_ = auVar314._20_4_ * fVar212;
      auVar68._24_4_ = auVar314._24_4_ * fVar213;
      auVar68._28_4_ = auVar314._28_4_;
      auVar69._4_4_ = auVar290._4_4_ * fVar215;
      auVar69._0_4_ = auVar290._0_4_ * fVar214;
      auVar69._8_4_ = auVar290._8_4_ * fVar263;
      auVar69._12_4_ = auVar290._12_4_ * fVar341;
      auVar69._16_4_ = auVar290._16_4_ * fVar353;
      auVar69._20_4_ = auVar290._20_4_ * fVar355;
      auVar69._24_4_ = auVar290._24_4_ * fVar357;
      auVar69._28_4_ = auVar290._28_4_;
      auVar119 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = fVar210 * fStack_114;
      auVar70._0_4_ = fVar180 * local_118;
      auVar70._8_4_ = fVar394 * fStack_110;
      auVar70._12_4_ = fVar211 * fStack_10c;
      auVar70._16_4_ = fVar405 * fStack_108;
      auVar70._20_4_ = fVar212 * fStack_104;
      auVar70._24_4_ = fVar213 * fStack_100;
      auVar70._28_4_ = auVar314._28_4_;
      auVar71._4_4_ = fVar215 * fStack_f4;
      auVar71._0_4_ = fVar214 * local_f8;
      auVar71._8_4_ = fVar263 * fStack_f0;
      auVar71._12_4_ = fVar341 * fStack_ec;
      auVar71._16_4_ = fVar353 * fStack_e8;
      auVar71._20_4_ = fVar355 * fStack_e4;
      auVar71._24_4_ = fVar357 * fStack_e0;
      auVar71._28_4_ = uVar8;
      auVar149 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = fVar210 * auVar38._4_4_;
      auVar72._0_4_ = fVar180 * auVar38._0_4_;
      auVar72._8_4_ = fVar394 * auVar38._8_4_;
      auVar72._12_4_ = fVar211 * auVar38._12_4_;
      auVar72._16_4_ = fVar405 * auVar38._16_4_;
      auVar72._20_4_ = fVar212 * auVar38._20_4_;
      auVar72._24_4_ = fVar213 * auVar38._24_4_;
      auVar72._28_4_ = uVar8;
      auVar73._4_4_ = fVar215 * auVar36._4_4_;
      auVar73._0_4_ = fVar214 * auVar36._0_4_;
      auVar73._8_4_ = fVar263 * auVar36._8_4_;
      auVar73._12_4_ = fVar341 * auVar36._12_4_;
      auVar73._16_4_ = fVar353 * auVar36._16_4_;
      auVar73._20_4_ = fVar355 * auVar36._20_4_;
      auVar73._24_4_ = fVar357 * auVar36._24_4_;
      auVar73._28_4_ = local_b8._28_4_;
      auVar36 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar39._4_4_ * fVar210;
      auVar74._0_4_ = auVar39._0_4_ * fVar180;
      auVar74._8_4_ = auVar39._8_4_ * fVar394;
      auVar74._12_4_ = auVar39._12_4_ * fVar211;
      auVar74._16_4_ = auVar39._16_4_ * fVar405;
      auVar74._20_4_ = auVar39._20_4_ * fVar212;
      auVar74._24_4_ = auVar39._24_4_ * fVar213;
      auVar74._28_4_ = auVar29._28_4_ + auVar30._28_4_;
      auVar75._4_4_ = auVar35._4_4_ * fVar215;
      auVar75._0_4_ = auVar35._0_4_ * fVar214;
      auVar75._8_4_ = auVar35._8_4_ * fVar263;
      auVar75._12_4_ = auVar35._12_4_ * fVar341;
      auVar75._16_4_ = auVar35._16_4_ * fVar353;
      auVar75._20_4_ = auVar35._20_4_ * fVar355;
      auVar75._24_4_ = auVar35._24_4_ * fVar357;
      auVar75._28_4_ = auVar31._28_4_ + fVar209;
      auVar35 = vsubps_avx(auVar74,auVar75);
      auVar30 = vminps_avx(auVar32,auVar118);
      auVar29 = vmaxps_avx(auVar32,auVar118);
      auVar31 = vminps_avx(auVar33,auVar34);
      auVar31 = vminps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx(auVar33,auVar34);
      auVar29 = vmaxps_avx(auVar29,auVar30);
      auVar32 = vminps_avx(auVar119,auVar149);
      auVar30 = vmaxps_avx(auVar119,auVar149);
      auVar33 = vminps_avx(auVar36,auVar35);
      auVar32 = vminps_avx(auVar32,auVar33);
      auVar32 = vminps_avx(auVar31,auVar32);
      auVar31 = vmaxps_avx(auVar36,auVar35);
      auVar30 = vmaxps_avx(auVar30,auVar31);
      auVar30 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vcmpps_avx(auVar32,local_138,2);
      auVar30 = vcmpps_avx(auVar30,local_158,5);
      auVar29 = vandps_avx(auVar30,auVar29);
      auVar117 = vandps_avx(auVar117,local_248);
      auVar30 = auVar117 & auVar29;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar29,auVar117);
        uVar89 = vmovmskps_avx(auVar117);
      }
    }
    if (uVar89 != 0) {
      auStack_3a8[uVar91] = uVar89;
      uVar9 = vmovlps_avx(local_308);
      *(undefined8 *)(afStack_228 + uVar91 * 2) = uVar9;
      uVar93 = vmovlps_avx(_local_5c8);
      auStack_58[uVar91] = uVar93;
      uVar91 = (ulong)((int)uVar91 + 1);
    }
    auVar403 = ZEXT864(0) << 0x20;
    do {
      if ((int)uVar91 == 0) {
        if (bVar87) {
          return local_609;
        }
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar124._4_4_ = uVar8;
        auVar124._0_4_ = uVar8;
        auVar124._8_4_ = uVar8;
        auVar124._12_4_ = uVar8;
        auVar124._16_4_ = uVar8;
        auVar124._20_4_ = uVar8;
        auVar124._24_4_ = uVar8;
        auVar124._28_4_ = uVar8;
        auVar117 = vcmpps_avx(local_178,auVar124,2);
        uVar89 = vmovmskps_avx(auVar117);
        uVar88 = uVar88 & uVar88 + 0xff & uVar89;
        local_609 = uVar88 != 0;
        if (!local_609) {
          return local_609;
        }
        goto LAB_0120a43d;
      }
      uVar92 = (int)uVar91 - 1;
      uVar94 = (ulong)uVar92;
      uVar89 = auStack_3a8[uVar94];
      fVar209 = afStack_228[uVar94 * 2];
      fVar180 = afStack_228[uVar94 * 2 + 1];
      register0x00001588 = 0;
      local_5c8 = (undefined1  [8])auStack_58[uVar94];
      uVar93 = 0;
      if (uVar89 != 0) {
        for (; (uVar89 >> uVar93 & 1) == 0; uVar93 = uVar93 + 1) {
        }
      }
      uVar89 = uVar89 - 1 & uVar89;
      auStack_3a8[uVar94] = uVar89;
      if (uVar89 == 0) {
        uVar91 = (ulong)uVar92;
      }
      auVar252._8_4_ = 0x3f800000;
      auVar252._0_8_ = &DAT_3f8000003f800000;
      auVar252._12_4_ = 0x3f800000;
      fVar394 = (float)(uVar93 + 1) * 0.14285715;
      fVar210 = (1.0 - (float)uVar93 * 0.14285715) * fVar209 + fVar180 * (float)uVar93 * 0.14285715;
      fVar209 = (1.0 - fVar394) * fVar209 + fVar180 * fVar394;
      fVar180 = fVar209 - fVar210;
      if (0.16666667 <= fVar180) break;
      auVar140 = vshufps_avx(_local_5c8,_local_5c8,0x50);
      auVar131 = vsubps_avx(auVar252,auVar140);
      fVar394 = auVar140._0_4_;
      fVar211 = auVar140._4_4_;
      fVar405 = auVar140._8_4_;
      fVar212 = auVar140._12_4_;
      fVar213 = auVar131._0_4_;
      fVar214 = auVar131._4_4_;
      fVar215 = auVar131._8_4_;
      fVar263 = auVar131._12_4_;
      auVar190._0_4_ = auVar298._0_4_ * fVar394 + fVar213 * (float)local_4e8._0_4_;
      auVar190._4_4_ = auVar298._4_4_ * fVar211 + fVar214 * (float)local_4e8._4_4_;
      auVar190._8_4_ = auVar298._0_4_ * fVar405 + fVar215 * (float)local_4e8._0_4_;
      auVar190._12_4_ = auVar298._4_4_ * fVar212 + fVar263 * (float)local_4e8._4_4_;
      auVar229._0_4_ = auVar315._0_4_ * fVar394 + fVar213 * (float)local_3b8._0_4_;
      auVar229._4_4_ = auVar315._4_4_ * fVar211 + fVar214 * (float)local_3b8._4_4_;
      auVar229._8_4_ = auVar315._0_4_ * fVar405 + fVar215 * fStack_3b0;
      auVar229._12_4_ = auVar315._4_4_ * fVar212 + fVar263 * fStack_3ac;
      auVar253._0_4_ = auVar331._0_4_ * fVar394 + fVar213 * auVar400._0_4_;
      auVar253._4_4_ = auVar331._4_4_ * fVar211 + fVar214 * auVar400._4_4_;
      auVar253._8_4_ = auVar331._0_4_ * fVar405 + fVar215 * auVar400._0_4_;
      auVar253._12_4_ = auVar331._4_4_ * fVar212 + fVar263 * auVar400._4_4_;
      auVar136._0_4_ = auVar113._0_4_ * fVar394 + auVar134._0_4_ * fVar213;
      auVar136._4_4_ = auVar113._4_4_ * fVar211 + auVar134._4_4_ * fVar214;
      auVar136._8_4_ = auVar113._0_4_ * fVar405 + auVar134._0_4_ * fVar215;
      auVar136._12_4_ = auVar113._4_4_ * fVar212 + auVar134._4_4_ * fVar263;
      auVar177._16_16_ = auVar190;
      auVar177._0_16_ = auVar190;
      auVar206._16_16_ = auVar229;
      auVar206._0_16_ = auVar229;
      auVar239._16_16_ = auVar253;
      auVar239._0_16_ = auVar253;
      auVar117 = vshufps_avx(ZEXT2032(CONCAT416(fVar209,ZEXT416((uint)fVar210))),
                             ZEXT2032(CONCAT416(fVar209,ZEXT416((uint)fVar210))),0);
      auVar29 = vsubps_avx(auVar206,auVar177);
      fVar394 = auVar117._0_4_;
      fVar211 = auVar117._4_4_;
      fVar405 = auVar117._8_4_;
      fVar212 = auVar117._12_4_;
      fVar213 = auVar117._16_4_;
      fVar214 = auVar117._20_4_;
      fVar215 = auVar117._24_4_;
      auVar178._0_4_ = auVar190._0_4_ + auVar29._0_4_ * fVar394;
      auVar178._4_4_ = auVar190._4_4_ + auVar29._4_4_ * fVar211;
      auVar178._8_4_ = auVar190._8_4_ + auVar29._8_4_ * fVar405;
      auVar178._12_4_ = auVar190._12_4_ + auVar29._12_4_ * fVar212;
      auVar178._16_4_ = auVar190._0_4_ + auVar29._16_4_ * fVar213;
      auVar178._20_4_ = auVar190._4_4_ + auVar29._20_4_ * fVar214;
      auVar178._24_4_ = auVar190._8_4_ + auVar29._24_4_ * fVar215;
      auVar178._28_4_ = auVar190._12_4_ + auVar29._28_4_;
      auVar29 = vsubps_avx(auVar239,auVar206);
      auVar207._0_4_ = auVar229._0_4_ + auVar29._0_4_ * fVar394;
      auVar207._4_4_ = auVar229._4_4_ + auVar29._4_4_ * fVar211;
      auVar207._8_4_ = auVar229._8_4_ + auVar29._8_4_ * fVar405;
      auVar207._12_4_ = auVar229._12_4_ + auVar29._12_4_ * fVar212;
      auVar207._16_4_ = auVar229._0_4_ + auVar29._16_4_ * fVar213;
      auVar207._20_4_ = auVar229._4_4_ + auVar29._20_4_ * fVar214;
      auVar207._24_4_ = auVar229._8_4_ + auVar29._24_4_ * fVar215;
      auVar207._28_4_ = auVar229._12_4_ + auVar29._28_4_;
      auVar140 = vsubps_avx(auVar136,auVar253);
      auVar152._0_4_ = auVar253._0_4_ + auVar140._0_4_ * fVar394;
      auVar152._4_4_ = auVar253._4_4_ + auVar140._4_4_ * fVar211;
      auVar152._8_4_ = auVar253._8_4_ + auVar140._8_4_ * fVar405;
      auVar152._12_4_ = auVar253._12_4_ + auVar140._12_4_ * fVar212;
      auVar152._16_4_ = auVar253._0_4_ + auVar140._0_4_ * fVar213;
      auVar152._20_4_ = auVar253._4_4_ + auVar140._4_4_ * fVar214;
      auVar152._24_4_ = auVar253._8_4_ + auVar140._8_4_ * fVar215;
      auVar152._28_4_ = auVar253._12_4_ + auVar140._12_4_;
      auVar29 = vsubps_avx(auVar207,auVar178);
      auVar179._0_4_ = auVar178._0_4_ + fVar394 * auVar29._0_4_;
      auVar179._4_4_ = auVar178._4_4_ + fVar211 * auVar29._4_4_;
      auVar179._8_4_ = auVar178._8_4_ + fVar405 * auVar29._8_4_;
      auVar179._12_4_ = auVar178._12_4_ + fVar212 * auVar29._12_4_;
      auVar179._16_4_ = auVar178._16_4_ + fVar213 * auVar29._16_4_;
      auVar179._20_4_ = auVar178._20_4_ + fVar214 * auVar29._20_4_;
      auVar179._24_4_ = auVar178._24_4_ + fVar215 * auVar29._24_4_;
      auVar179._28_4_ = auVar178._28_4_ + auVar29._28_4_;
      auVar29 = vsubps_avx(auVar152,auVar207);
      auVar153._0_4_ = auVar207._0_4_ + fVar394 * auVar29._0_4_;
      auVar153._4_4_ = auVar207._4_4_ + fVar211 * auVar29._4_4_;
      auVar153._8_4_ = auVar207._8_4_ + fVar405 * auVar29._8_4_;
      auVar153._12_4_ = auVar207._12_4_ + fVar212 * auVar29._12_4_;
      auVar153._16_4_ = auVar207._16_4_ + fVar213 * auVar29._16_4_;
      auVar153._20_4_ = auVar207._20_4_ + fVar214 * auVar29._20_4_;
      auVar153._24_4_ = auVar207._24_4_ + fVar215 * auVar29._24_4_;
      auVar153._28_4_ = auVar207._28_4_ + auVar29._28_4_;
      auVar29 = vsubps_avx(auVar153,auVar179);
      auVar191._0_4_ = auVar179._0_4_ + fVar394 * auVar29._0_4_;
      auVar191._4_4_ = auVar179._4_4_ + fVar211 * auVar29._4_4_;
      auVar191._8_4_ = auVar179._8_4_ + fVar405 * auVar29._8_4_;
      auVar191._12_4_ = auVar179._12_4_ + fVar212 * auVar29._12_4_;
      auVar208._16_4_ = auVar179._16_4_ + fVar213 * auVar29._16_4_;
      auVar208._0_16_ = auVar191;
      auVar208._20_4_ = auVar179._20_4_ + fVar214 * auVar29._20_4_;
      auVar208._24_4_ = auVar179._24_4_ + fVar215 * auVar29._24_4_;
      auVar208._28_4_ = auVar179._28_4_ + auVar207._28_4_;
      fVar394 = auVar29._4_4_ * 3.0;
      auVar166 = auVar208._16_16_;
      auVar139 = vshufps_avx(ZEXT416((uint)(fVar180 * 0.33333334)),
                             ZEXT416((uint)(fVar180 * 0.33333334)),0);
      auVar316._0_4_ = auVar191._0_4_ + auVar139._0_4_ * auVar29._0_4_ * 3.0;
      auVar316._4_4_ = auVar191._4_4_ + auVar139._4_4_ * fVar394;
      auVar316._8_4_ = auVar191._8_4_ + auVar139._8_4_ * auVar29._8_4_ * 3.0;
      auVar316._12_4_ = auVar191._12_4_ + auVar139._12_4_ * auVar29._12_4_ * 3.0;
      auVar111 = vshufpd_avx(auVar191,auVar191,3);
      auVar197 = vshufpd_avx(auVar166,auVar166,3);
      auVar140 = vsubps_avx(auVar111,auVar191);
      auVar131 = vsubps_avx(auVar197,auVar166);
      auVar137._0_4_ = auVar140._0_4_ + auVar131._0_4_;
      auVar137._4_4_ = auVar140._4_4_ + auVar131._4_4_;
      auVar137._8_4_ = auVar140._8_4_ + auVar131._8_4_;
      auVar137._12_4_ = auVar140._12_4_ + auVar131._12_4_;
      auVar140 = vmovshdup_avx(auVar191);
      auVar131 = vmovshdup_avx(auVar316);
      auVar196 = vshufps_avx(auVar137,auVar137,0);
      auVar115 = vshufps_avx(auVar137,auVar137,0x55);
      fVar214 = auVar115._0_4_;
      fVar215 = auVar115._4_4_;
      fVar263 = auVar115._8_4_;
      fVar341 = auVar115._12_4_;
      fVar211 = auVar196._0_4_;
      fVar405 = auVar196._4_4_;
      fVar212 = auVar196._8_4_;
      fVar213 = auVar196._12_4_;
      auVar299._0_4_ = fVar211 * auVar191._0_4_ + fVar214 * auVar140._0_4_;
      auVar299._4_4_ = fVar405 * auVar191._4_4_ + fVar215 * auVar140._4_4_;
      auVar299._8_4_ = fVar212 * auVar191._8_4_ + fVar263 * auVar140._8_4_;
      auVar299._12_4_ = fVar213 * auVar191._12_4_ + fVar341 * auVar140._12_4_;
      auVar317._0_4_ = auVar316._0_4_ * fVar211 + fVar214 * auVar131._0_4_;
      auVar317._4_4_ = auVar316._4_4_ * fVar405 + fVar215 * auVar131._4_4_;
      auVar317._8_4_ = auVar316._8_4_ * fVar212 + fVar263 * auVar131._8_4_;
      auVar317._12_4_ = auVar316._12_4_ * fVar213 + fVar341 * auVar131._12_4_;
      auVar131 = vshufps_avx(auVar299,auVar299,0xe8);
      auVar196 = vshufps_avx(auVar317,auVar317,0xe8);
      auVar140 = vcmpps_avx(auVar131,auVar196,1);
      uVar89 = vextractps_avx(auVar140,0);
      auVar115 = auVar317;
      if ((uVar89 & 1) == 0) {
        auVar115 = auVar299;
      }
      auVar138._0_4_ = auVar139._0_4_ * auVar29._16_4_ * 3.0;
      auVar138._4_4_ = auVar139._4_4_ * fVar394;
      auVar138._8_4_ = auVar139._8_4_ * auVar29._24_4_ * 3.0;
      auVar138._12_4_ = auVar139._12_4_ * auVar117._28_4_;
      auVar11 = vsubps_avx(auVar166,auVar138);
      auVar139 = vmovshdup_avx(auVar11);
      auVar166 = vmovshdup_avx(auVar166);
      fVar394 = auVar11._0_4_;
      fVar353 = auVar11._4_4_;
      auVar409._0_4_ = fVar211 * fVar394 + fVar214 * auVar139._0_4_;
      auVar409._4_4_ = fVar405 * fVar353 + fVar215 * auVar139._4_4_;
      auVar409._8_4_ = fVar212 * auVar11._8_4_ + fVar263 * auVar139._8_4_;
      auVar409._12_4_ = fVar213 * auVar11._12_4_ + fVar341 * auVar139._12_4_;
      auVar383._0_4_ = fVar211 * auVar208._16_4_ + fVar214 * auVar166._0_4_;
      auVar383._4_4_ = fVar405 * auVar208._20_4_ + fVar215 * auVar166._4_4_;
      auVar383._8_4_ = fVar212 * auVar208._24_4_ + fVar263 * auVar166._8_4_;
      auVar383._12_4_ = fVar213 * auVar208._28_4_ + fVar341 * auVar166._12_4_;
      auVar166 = vshufps_avx(auVar409,auVar409,0xe8);
      auVar10 = vshufps_avx(auVar383,auVar383,0xe8);
      auVar139 = vcmpps_avx(auVar166,auVar10,1);
      uVar89 = vextractps_avx(auVar139,0);
      auVar284 = auVar383;
      if ((uVar89 & 1) == 0) {
        auVar284 = auVar409;
      }
      auVar115 = vmaxss_avx(auVar284,auVar115);
      auVar131 = vminps_avx(auVar131,auVar196);
      auVar196 = vminps_avx(auVar166,auVar10);
      auVar196 = vminps_avx(auVar131,auVar196);
      auVar140 = vshufps_avx(auVar140,auVar140,0x55);
      auVar140 = vblendps_avx(auVar140,auVar139,2);
      auVar139 = vpslld_avx(auVar140,0x1f);
      auVar140 = vshufpd_avx(auVar317,auVar317,1);
      auVar140 = vinsertps_avx(auVar140,auVar383,0x9c);
      auVar131 = vshufpd_avx(auVar299,auVar299,1);
      auVar131 = vinsertps_avx(auVar131,auVar409,0x9c);
      auVar140 = vblendvps_avx(auVar131,auVar140,auVar139);
      auVar131 = vmovshdup_avx(auVar140);
      auVar140 = vmaxss_avx(auVar131,auVar140);
      fVar212 = auVar196._0_4_;
      auVar131 = vmovshdup_avx(auVar196);
      fVar405 = auVar140._0_4_;
      fVar213 = auVar131._0_4_;
      fVar211 = auVar115._0_4_;
      if ((0.0001 <= fVar212) || (fVar405 <= -0.0001)) {
        if ((-0.0001 < fVar211 && fVar213 < 0.0001) ||
           ((fVar212 < 0.0001 && -0.0001 < fVar211 || (fVar213 < 0.0001 && -0.0001 < fVar405))))
        goto LAB_0120ba8d;
LAB_0120c6c8:
        bVar76 = true;
        auVar403 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0120ba8d:
        auVar403 = ZEXT864(0) << 0x20;
        auVar139 = vcmpps_avx(auVar196,ZEXT816(0) << 0x20,1);
        auVar131 = vcmpss_avx(auVar115,ZEXT416(0),1);
        auVar410._8_4_ = 0x3f800000;
        auVar410._0_8_ = &DAT_3f8000003f800000;
        auVar410._12_4_ = 0x3f800000;
        auVar254._8_4_ = 0xbf800000;
        auVar254._0_8_ = 0xbf800000bf800000;
        auVar254._12_4_ = 0xbf800000;
        auVar131 = vblendvps_avx(auVar410,auVar254,auVar131);
        auVar139 = vblendvps_avx(auVar410,auVar254,auVar139);
        auVar166 = vcmpss_avx(auVar131,auVar139,4);
        auVar166 = vpshufd_avx(ZEXT416(auVar166._0_4_ & 1),0x50);
        auVar166 = vpslld_avx(auVar166,0x1f);
        auVar166 = vpsrad_avx(auVar166,0x1f);
        auVar166 = vpandn_avx(auVar166,_DAT_02020eb0);
        auVar10 = vmovshdup_avx(auVar139);
        fVar214 = auVar10._0_4_;
        if ((auVar139._0_4_ != fVar214) || (NAN(auVar139._0_4_) || NAN(fVar214))) {
          if ((fVar213 != fVar212) || (NAN(fVar213) || NAN(fVar212))) {
            fVar212 = -fVar212 / (fVar213 - fVar212);
            auVar139 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar212) * 0.0 + fVar212)));
          }
          else {
            auVar139 = vcmpss_avx(auVar196,ZEXT416(0),0);
            auVar139 = vpshufd_avx(ZEXT416(auVar139._0_4_ & 1),0x50);
            auVar139 = vpslld_avx(auVar139,0x1f);
            auVar139 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar139);
          }
          auVar10 = vcmpps_avx(auVar166,auVar139,1);
          auVar196 = vblendps_avx(auVar166,auVar139,2);
          auVar139 = vblendps_avx(auVar139,auVar166,2);
          auVar166 = vblendvps_avx(auVar139,auVar196,auVar10);
        }
        auVar140 = vcmpss_avx(auVar140,ZEXT416(0),1);
        auVar167._8_4_ = 0xbf800000;
        auVar167._0_8_ = 0xbf800000bf800000;
        auVar167._12_4_ = 0xbf800000;
        auVar140 = vblendvps_avx(auVar410,auVar167,auVar140);
        fVar212 = auVar140._0_4_;
        if ((auVar131._0_4_ != fVar212) || (NAN(auVar131._0_4_) || NAN(fVar212))) {
          if ((fVar405 != fVar211) || (NAN(fVar405) || NAN(fVar211))) {
            fVar211 = -fVar211 / (fVar405 - fVar211);
            auVar140 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar211) * 0.0 + fVar211)));
          }
          else {
            auVar140 = vcmpss_avx(auVar115,ZEXT416(0),0);
            auVar140 = vpshufd_avx(ZEXT416(auVar140._0_4_ & 1),0x50);
            auVar140 = vpslld_avx(auVar140,0x1f);
            auVar140 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar140);
          }
          auVar139 = vcmpps_avx(auVar166,auVar140,1);
          auVar131 = vblendps_avx(auVar166,auVar140,2);
          auVar140 = vblendps_avx(auVar140,auVar166,2);
          auVar166 = vblendvps_avx(auVar140,auVar131,auVar139);
        }
        if ((fVar214 != fVar212) || (NAN(fVar214) || NAN(fVar212))) {
          auVar140 = vcmpps_avx(auVar166,auVar410,1);
          auVar131 = vinsertps_avx(auVar166,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar255._4_12_ = auVar166._4_12_;
          auVar255._0_4_ = 0x3f800000;
          auVar166 = vblendvps_avx(auVar255,auVar131,auVar140);
        }
        auVar140 = vcmpps_avx(auVar166,_DAT_01fec6f0,1);
        auVar77._12_4_ = 0;
        auVar77._0_12_ = auVar166._4_12_;
        auVar131 = vinsertps_avx(auVar166,ZEXT416(0x3f800000),0x10);
        auVar140 = vblendvps_avx(auVar131,auVar77 << 0x20,auVar140);
        auVar131 = vmovshdup_avx(auVar140);
        bVar76 = true;
        if (auVar140._0_4_ <= auVar131._0_4_) {
          auVar141._0_4_ = auVar140._0_4_ + -0.1;
          auVar141._4_4_ = auVar140._4_4_ + 0.1;
          auVar141._8_4_ = auVar140._8_4_ + 0.0;
          auVar141._12_4_ = auVar140._12_4_ + 0.0;
          auVar139 = vshufpd_avx(auVar316,auVar316,3);
          auVar192._8_8_ = 0x3f80000000000000;
          auVar192._0_8_ = 0x3f80000000000000;
          auVar140 = vcmpps_avx(auVar141,auVar192,1);
          auVar78._12_4_ = 0;
          auVar78._0_12_ = auVar141._4_12_;
          auVar131 = vinsertps_avx(auVar141,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar140 = vblendvps_avx(auVar131,auVar78 << 0x20,auVar140);
          auVar131 = vshufpd_avx(auVar11,auVar11,3);
          auVar196 = vshufps_avx(auVar140,auVar140,0x50);
          auVar115 = vsubps_avx(auVar410,auVar196);
          local_468 = auVar111._0_4_;
          fStack_464 = auVar111._4_4_;
          fStack_460 = auVar111._8_4_;
          fStack_45c = auVar111._12_4_;
          fVar211 = auVar196._0_4_;
          fVar405 = auVar196._4_4_;
          fVar212 = auVar196._8_4_;
          fVar213 = auVar196._12_4_;
          local_598 = auVar197._0_4_;
          fStack_594 = auVar197._4_4_;
          fStack_590 = auVar197._8_4_;
          fStack_58c = auVar197._12_4_;
          fVar214 = auVar115._0_4_;
          fVar215 = auVar115._4_4_;
          fVar263 = auVar115._8_4_;
          fVar341 = auVar115._12_4_;
          auVar168._0_4_ = fVar211 * local_468 + fVar214 * auVar191._0_4_;
          auVar168._4_4_ = fVar405 * fStack_464 + fVar215 * auVar191._4_4_;
          auVar168._8_4_ = fVar212 * fStack_460 + fVar263 * auVar191._0_4_;
          auVar168._12_4_ = fVar213 * fStack_45c + fVar341 * auVar191._4_4_;
          auVar230._0_4_ = fVar211 * auVar139._0_4_ + fVar214 * auVar316._0_4_;
          auVar230._4_4_ = fVar405 * auVar139._4_4_ + fVar215 * auVar316._4_4_;
          auVar230._8_4_ = fVar212 * auVar139._8_4_ + fVar263 * auVar316._0_4_;
          auVar230._12_4_ = fVar213 * auVar139._12_4_ + fVar341 * auVar316._4_4_;
          auVar285._0_4_ = fVar211 * auVar131._0_4_ + fVar214 * fVar394;
          auVar285._4_4_ = fVar405 * auVar131._4_4_ + fVar215 * fVar353;
          auVar285._8_4_ = fVar212 * auVar131._8_4_ + fVar263 * fVar394;
          auVar285._12_4_ = fVar213 * auVar131._12_4_ + fVar341 * fVar353;
          auVar300._0_4_ = fVar211 * local_598 + fVar214 * auVar208._16_4_;
          auVar300._4_4_ = fVar405 * fStack_594 + fVar215 * auVar208._20_4_;
          auVar300._8_4_ = fVar212 * fStack_590 + fVar263 * auVar208._16_4_;
          auVar300._12_4_ = fVar213 * fStack_58c + fVar341 * auVar208._20_4_;
          auVar197 = vsubps_avx(auVar410,auVar140);
          auVar131 = vmovshdup_avx(_local_5c8);
          auVar111 = vmovsldup_avx(_local_5c8);
          local_5c8._0_4_ = auVar197._0_4_ * auVar111._0_4_ + auVar131._0_4_ * auVar140._0_4_;
          local_5c8._4_4_ = auVar197._4_4_ * auVar111._4_4_ + auVar131._4_4_ * auVar140._4_4_;
          fStack_5c0 = auVar197._8_4_ * auVar111._8_4_ + auVar131._8_4_ * auVar140._8_4_;
          fStack_5bc = auVar197._12_4_ * auVar111._12_4_ + auVar131._12_4_ * auVar140._12_4_;
          auVar11 = vmovshdup_avx(_local_5c8);
          auVar140 = vsubps_avx(auVar230,auVar168);
          auVar256._0_4_ = auVar140._0_4_ * 3.0;
          auVar256._4_4_ = auVar140._4_4_ * 3.0;
          auVar256._8_4_ = auVar140._8_4_ * 3.0;
          auVar256._12_4_ = auVar140._12_4_ * 3.0;
          auVar140 = vsubps_avx(auVar285,auVar230);
          auVar272._0_4_ = auVar140._0_4_ * 3.0;
          auVar272._4_4_ = auVar140._4_4_ * 3.0;
          auVar272._8_4_ = auVar140._8_4_ * 3.0;
          auVar272._12_4_ = auVar140._12_4_ * 3.0;
          auVar140 = vsubps_avx(auVar300,auVar285);
          auVar318._0_4_ = auVar140._0_4_ * 3.0;
          auVar318._4_4_ = auVar140._4_4_ * 3.0;
          auVar318._8_4_ = auVar140._8_4_ * 3.0;
          auVar318._12_4_ = auVar140._12_4_ * 3.0;
          auVar131 = vminps_avx(auVar272,auVar318);
          auVar140 = vmaxps_avx(auVar272,auVar318);
          auVar131 = vminps_avx(auVar256,auVar131);
          auVar140 = vmaxps_avx(auVar256,auVar140);
          auVar111 = vshufpd_avx(auVar131,auVar131,3);
          auVar197 = vshufpd_avx(auVar140,auVar140,3);
          auVar131 = vminps_avx(auVar131,auVar111);
          auVar140 = vmaxps_avx(auVar140,auVar197);
          auVar111 = vshufps_avx(ZEXT416((uint)(1.0 / fVar180)),ZEXT416((uint)(1.0 / fVar180)),0);
          auVar257._0_4_ = auVar111._0_4_ * auVar131._0_4_;
          auVar257._4_4_ = auVar111._4_4_ * auVar131._4_4_;
          auVar257._8_4_ = auVar111._8_4_ * auVar131._8_4_;
          auVar257._12_4_ = auVar111._12_4_ * auVar131._12_4_;
          auVar273._0_4_ = auVar140._0_4_ * auVar111._0_4_;
          auVar273._4_4_ = auVar140._4_4_ * auVar111._4_4_;
          auVar273._8_4_ = auVar140._8_4_ * auVar111._8_4_;
          auVar273._12_4_ = auVar140._12_4_ * auVar111._12_4_;
          auVar115 = ZEXT416((uint)(1.0 / (auVar11._0_4_ - (float)local_5c8._0_4_)));
          auVar140 = vshufpd_avx(auVar168,auVar168,3);
          auVar131 = vshufpd_avx(auVar230,auVar230,3);
          auVar111 = vshufpd_avx(auVar285,auVar285,3);
          auVar197 = vshufpd_avx(auVar300,auVar300,3);
          auVar140 = vsubps_avx(auVar140,auVar168);
          auVar139 = vsubps_avx(auVar131,auVar230);
          auVar196 = vsubps_avx(auVar111,auVar285);
          auVar197 = vsubps_avx(auVar197,auVar300);
          auVar131 = vminps_avx(auVar140,auVar139);
          auVar140 = vmaxps_avx(auVar140,auVar139);
          auVar111 = vminps_avx(auVar196,auVar197);
          auVar111 = vminps_avx(auVar131,auVar111);
          auVar131 = vmaxps_avx(auVar196,auVar197);
          auVar140 = vmaxps_avx(auVar140,auVar131);
          auVar131 = vshufps_avx(auVar115,auVar115,0);
          auVar332._0_4_ = auVar131._0_4_ * auVar111._0_4_;
          auVar332._4_4_ = auVar131._4_4_ * auVar111._4_4_;
          auVar332._8_4_ = auVar131._8_4_ * auVar111._8_4_;
          auVar332._12_4_ = auVar131._12_4_ * auVar111._12_4_;
          auVar343._0_4_ = auVar131._0_4_ * auVar140._0_4_;
          auVar343._4_4_ = auVar131._4_4_ * auVar140._4_4_;
          auVar343._8_4_ = auVar131._8_4_ * auVar140._8_4_;
          auVar343._12_4_ = auVar131._12_4_ * auVar140._12_4_;
          auVar140 = vmovsldup_avx(_local_5c8);
          auVar286._4_12_ = auVar140._4_12_;
          auVar286._0_4_ = fVar210;
          auVar301._4_12_ = local_5c8._4_12_;
          auVar301._0_4_ = fVar209;
          auVar116._0_4_ = (fVar209 + fVar210) * 0.5;
          auVar116._4_4_ = ((float)local_5c8._4_4_ + auVar140._4_4_) * 0.5;
          auVar116._8_4_ = (fStack_5c0 + auVar140._8_4_) * 0.5;
          auVar116._12_4_ = (fStack_5bc + auVar140._12_4_) * 0.5;
          auVar140 = vshufps_avx(auVar116,auVar116,0);
          fVar394 = auVar140._0_4_;
          fVar211 = auVar140._4_4_;
          fVar405 = auVar140._8_4_;
          fVar212 = auVar140._12_4_;
          local_518 = auVar110._0_4_;
          fStack_514 = auVar110._4_4_;
          fStack_510 = auVar110._8_4_;
          fStack_50c = auVar110._12_4_;
          auVar231._0_4_ = fVar394 * (float)local_258._0_4_ + local_518;
          auVar231._4_4_ = fVar211 * (float)local_258._4_4_ + fStack_514;
          auVar231._8_4_ = fVar405 * fStack_250 + fStack_510;
          auVar231._12_4_ = fVar212 * fStack_24c + fStack_50c;
          local_528 = auVar37._0_4_;
          fStack_524 = auVar37._4_4_;
          fStack_520 = auVar37._8_4_;
          fStack_51c = auVar37._12_4_;
          auVar319._0_4_ = fVar394 * (float)local_268._0_4_ + local_528;
          auVar319._4_4_ = fVar211 * (float)local_268._4_4_ + fStack_524;
          auVar319._8_4_ = fVar405 * fStack_260 + fStack_520;
          auVar319._12_4_ = fVar212 * fStack_25c + fStack_51c;
          local_538 = auVar221._0_4_;
          fStack_534 = auVar221._4_4_;
          fStack_530 = auVar221._8_4_;
          fStack_52c = auVar221._12_4_;
          auVar362._0_4_ = fVar394 * (float)local_278._0_4_ + local_538;
          auVar362._4_4_ = fVar211 * (float)local_278._4_4_ + fStack_534;
          auVar362._8_4_ = fVar405 * fStack_270 + fStack_530;
          auVar362._12_4_ = fVar212 * fStack_26c + fStack_52c;
          auVar140 = vsubps_avx(auVar319,auVar231);
          auVar232._0_4_ = auVar140._0_4_ * fVar394 + auVar231._0_4_;
          auVar232._4_4_ = auVar140._4_4_ * fVar211 + auVar231._4_4_;
          auVar232._8_4_ = auVar140._8_4_ * fVar405 + auVar231._8_4_;
          auVar232._12_4_ = auVar140._12_4_ * fVar212 + auVar231._12_4_;
          auVar140 = vsubps_avx(auVar362,auVar319);
          auVar320._0_4_ = auVar319._0_4_ + auVar140._0_4_ * fVar394;
          auVar320._4_4_ = auVar319._4_4_ + auVar140._4_4_ * fVar211;
          auVar320._8_4_ = auVar319._8_4_ + auVar140._8_4_ * fVar405;
          auVar320._12_4_ = auVar319._12_4_ + auVar140._12_4_ * fVar212;
          auVar140 = vsubps_avx(auVar320,auVar232);
          fVar394 = auVar232._0_4_ + auVar140._0_4_ * fVar394;
          fVar211 = auVar232._4_4_ + auVar140._4_4_ * fVar211;
          auVar169._0_8_ = CONCAT44(fVar211,fVar394);
          auVar169._8_4_ = auVar232._8_4_ + auVar140._8_4_ * fVar405;
          auVar169._12_4_ = auVar232._12_4_ + auVar140._12_4_ * fVar212;
          fVar405 = auVar140._0_4_ * 3.0;
          fVar212 = auVar140._4_4_ * 3.0;
          auVar233._0_8_ = CONCAT44(fVar212,fVar405);
          auVar233._8_4_ = auVar140._8_4_ * 3.0;
          auVar233._12_4_ = auVar140._12_4_ * 3.0;
          auVar321._8_8_ = auVar169._0_8_;
          auVar321._0_8_ = auVar169._0_8_;
          auVar140 = vshufpd_avx(auVar169,auVar169,3);
          auVar131 = vshufps_avx(auVar116,auVar116,0x55);
          auVar196 = vsubps_avx(auVar140,auVar321);
          auVar322._0_4_ = auVar131._0_4_ * auVar196._0_4_ + fVar394;
          auVar322._4_4_ = auVar131._4_4_ * auVar196._4_4_ + fVar211;
          auVar322._8_4_ = auVar131._8_4_ * auVar196._8_4_ + fVar394;
          auVar322._12_4_ = auVar131._12_4_ * auVar196._12_4_ + fVar211;
          auVar384._8_8_ = auVar233._0_8_;
          auVar384._0_8_ = auVar233._0_8_;
          auVar140 = vshufpd_avx(auVar233,auVar233,1);
          auVar140 = vsubps_avx(auVar140,auVar384);
          auVar234._0_4_ = fVar405 + auVar131._0_4_ * auVar140._0_4_;
          auVar234._4_4_ = fVar212 + auVar131._4_4_ * auVar140._4_4_;
          auVar234._8_4_ = fVar405 + auVar131._8_4_ * auVar140._8_4_;
          auVar234._12_4_ = fVar212 + auVar131._12_4_ * auVar140._12_4_;
          auVar131 = vmovshdup_avx(auVar234);
          auVar385._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
          auVar385._8_4_ = auVar131._8_4_ ^ 0x80000000;
          auVar385._12_4_ = auVar131._12_4_ ^ 0x80000000;
          auVar111 = vmovshdup_avx(auVar196);
          auVar140 = vunpcklps_avx(auVar111,auVar385);
          auVar197 = vshufps_avx(auVar140,auVar385,4);
          auVar170._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
          auVar170._8_4_ = -auVar196._8_4_;
          auVar170._12_4_ = -auVar196._12_4_;
          auVar140 = vmovlhps_avx(auVar170,auVar234);
          auVar139 = vshufps_avx(auVar140,auVar234,8);
          auVar140 = ZEXT416((uint)(auVar111._0_4_ * auVar234._0_4_ -
                                   auVar131._0_4_ * auVar196._0_4_));
          auVar131 = vshufps_avx(auVar140,auVar140,0);
          auVar140 = vdivps_avx(auVar197,auVar131);
          auVar131 = vdivps_avx(auVar139,auVar131);
          auVar139 = vinsertps_avx(auVar257,auVar332,0x1c);
          auVar196 = vinsertps_avx(auVar273,auVar343,0x1c);
          auVar115 = vinsertps_avx(auVar332,auVar257,0x4c);
          auVar166 = vinsertps_avx(auVar343,auVar273,0x4c);
          auVar111 = vmovsldup_avx(auVar140);
          auVar344._0_4_ = auVar111._0_4_ * auVar139._0_4_;
          auVar344._4_4_ = auVar111._4_4_ * auVar139._4_4_;
          auVar344._8_4_ = auVar111._8_4_ * auVar139._8_4_;
          auVar344._12_4_ = auVar111._12_4_ * auVar139._12_4_;
          auVar333._0_4_ = auVar111._0_4_ * auVar196._0_4_;
          auVar333._4_4_ = auVar111._4_4_ * auVar196._4_4_;
          auVar333._8_4_ = auVar111._8_4_ * auVar196._8_4_;
          auVar333._12_4_ = auVar111._12_4_ * auVar196._12_4_;
          auVar197 = vminps_avx(auVar344,auVar333);
          auVar111 = vmaxps_avx(auVar333,auVar344);
          auVar10 = vmovsldup_avx(auVar131);
          auVar411._0_4_ = auVar10._0_4_ * auVar115._0_4_;
          auVar411._4_4_ = auVar10._4_4_ * auVar115._4_4_;
          auVar411._8_4_ = auVar10._8_4_ * auVar115._8_4_;
          auVar411._12_4_ = auVar10._12_4_ * auVar115._12_4_;
          auVar334._0_4_ = auVar10._0_4_ * auVar166._0_4_;
          auVar334._4_4_ = auVar10._4_4_ * auVar166._4_4_;
          auVar334._8_4_ = auVar10._8_4_ * auVar166._8_4_;
          auVar334._12_4_ = auVar10._12_4_ * auVar166._12_4_;
          auVar10 = vminps_avx(auVar411,auVar334);
          auVar142._0_4_ = auVar197._0_4_ + auVar10._0_4_;
          auVar142._4_4_ = auVar197._4_4_ + auVar10._4_4_;
          auVar142._8_4_ = auVar197._8_4_ + auVar10._8_4_;
          auVar142._12_4_ = auVar197._12_4_ + auVar10._12_4_;
          auVar197 = vmaxps_avx(auVar334,auVar411);
          auVar10 = vsubps_avx(auVar286,auVar116);
          auVar284 = vsubps_avx(auVar301,auVar116);
          auVar302._0_4_ = auVar111._0_4_ + auVar197._0_4_;
          auVar302._4_4_ = auVar111._4_4_ + auVar197._4_4_;
          auVar302._8_4_ = auVar111._8_4_ + auVar197._8_4_;
          auVar302._12_4_ = auVar111._12_4_ + auVar197._12_4_;
          auVar345._8_8_ = 0x3f800000;
          auVar345._0_8_ = 0x3f800000;
          auVar111 = vsubps_avx(auVar345,auVar302);
          auVar197 = vsubps_avx(auVar345,auVar142);
          fVar215 = auVar10._0_4_;
          auVar346._0_4_ = fVar215 * auVar111._0_4_;
          fVar263 = auVar10._4_4_;
          auVar346._4_4_ = fVar263 * auVar111._4_4_;
          fVar341 = auVar10._8_4_;
          auVar346._8_4_ = fVar341 * auVar111._8_4_;
          fVar353 = auVar10._12_4_;
          auVar346._12_4_ = fVar353 * auVar111._12_4_;
          fVar405 = auVar284._0_4_;
          auVar303._0_4_ = auVar111._0_4_ * fVar405;
          fVar212 = auVar284._4_4_;
          auVar303._4_4_ = auVar111._4_4_ * fVar212;
          fVar213 = auVar284._8_4_;
          auVar303._8_4_ = auVar111._8_4_ * fVar213;
          fVar214 = auVar284._12_4_;
          auVar303._12_4_ = auVar111._12_4_ * fVar214;
          auVar401._0_4_ = fVar215 * auVar197._0_4_;
          auVar401._4_4_ = fVar263 * auVar197._4_4_;
          auVar401._8_4_ = fVar341 * auVar197._8_4_;
          auVar401._12_4_ = fVar353 * auVar197._12_4_;
          auVar143._0_4_ = fVar405 * auVar197._0_4_;
          auVar143._4_4_ = fVar212 * auVar197._4_4_;
          auVar143._8_4_ = fVar213 * auVar197._8_4_;
          auVar143._12_4_ = fVar214 * auVar197._12_4_;
          auVar111 = vminps_avx(auVar346,auVar401);
          auVar197 = vminps_avx(auVar303,auVar143);
          auVar10 = vminps_avx(auVar111,auVar197);
          auVar111 = vmaxps_avx(auVar401,auVar346);
          auVar197 = vmaxps_avx(auVar143,auVar303);
          auVar284 = vshufps_avx(auVar116,auVar116,0x54);
          auVar197 = vmaxps_avx(auVar197,auVar111);
          auVar12 = vshufps_avx(auVar322,auVar322,0);
          auVar13 = vshufps_avx(auVar322,auVar322,0x55);
          auVar111 = vhaddps_avx(auVar10,auVar10);
          auVar197 = vhaddps_avx(auVar197,auVar197);
          auVar304._0_4_ = auVar12._0_4_ * auVar140._0_4_ + auVar13._0_4_ * auVar131._0_4_;
          auVar304._4_4_ = auVar12._4_4_ * auVar140._4_4_ + auVar13._4_4_ * auVar131._4_4_;
          auVar304._8_4_ = auVar12._8_4_ * auVar140._8_4_ + auVar13._8_4_ * auVar131._8_4_;
          auVar304._12_4_ = auVar12._12_4_ * auVar140._12_4_ + auVar13._12_4_ * auVar131._12_4_;
          auVar10 = vsubps_avx(auVar284,auVar304);
          fVar394 = auVar10._0_4_ + auVar111._0_4_;
          fVar211 = auVar10._0_4_ + auVar197._0_4_;
          auVar111 = vmaxss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar394));
          auVar197 = vminss_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar209));
          if (auVar111._0_4_ <= auVar197._0_4_) {
            auVar111 = vmovshdup_avx(auVar140);
            auVar193._0_4_ = auVar139._0_4_ * auVar111._0_4_;
            auVar193._4_4_ = auVar139._4_4_ * auVar111._4_4_;
            auVar193._8_4_ = auVar139._8_4_ * auVar111._8_4_;
            auVar193._12_4_ = auVar139._12_4_ * auVar111._12_4_;
            auVar144._0_4_ = auVar196._0_4_ * auVar111._0_4_;
            auVar144._4_4_ = auVar196._4_4_ * auVar111._4_4_;
            auVar144._8_4_ = auVar196._8_4_ * auVar111._8_4_;
            auVar144._12_4_ = auVar196._12_4_ * auVar111._12_4_;
            auVar197 = vminps_avx(auVar193,auVar144);
            auVar111 = vmaxps_avx(auVar144,auVar193);
            auVar139 = vmovshdup_avx(auVar131);
            auVar258._0_4_ = auVar139._0_4_ * auVar115._0_4_;
            auVar258._4_4_ = auVar139._4_4_ * auVar115._4_4_;
            auVar258._8_4_ = auVar139._8_4_ * auVar115._8_4_;
            auVar258._12_4_ = auVar139._12_4_ * auVar115._12_4_;
            auVar194._0_4_ = auVar139._0_4_ * auVar166._0_4_;
            auVar194._4_4_ = auVar139._4_4_ * auVar166._4_4_;
            auVar194._8_4_ = auVar139._8_4_ * auVar166._8_4_;
            auVar194._12_4_ = auVar139._12_4_ * auVar166._12_4_;
            auVar139 = vminps_avx(auVar258,auVar194);
            auVar274._0_4_ = auVar197._0_4_ + auVar139._0_4_;
            auVar274._4_4_ = auVar197._4_4_ + auVar139._4_4_;
            auVar274._8_4_ = auVar197._8_4_ + auVar139._8_4_;
            auVar274._12_4_ = auVar197._12_4_ + auVar139._12_4_;
            auVar197 = vmaxps_avx(auVar194,auVar258);
            auVar145._0_4_ = auVar111._0_4_ + auVar197._0_4_;
            auVar145._4_4_ = auVar111._4_4_ + auVar197._4_4_;
            auVar145._8_4_ = auVar111._8_4_ + auVar197._8_4_;
            auVar145._12_4_ = auVar111._12_4_ + auVar197._12_4_;
            auVar111 = vsubps_avx(auVar192,auVar145);
            auVar197 = vsubps_avx(auVar192,auVar274);
            auVar259._0_4_ = fVar215 * auVar111._0_4_;
            auVar259._4_4_ = fVar263 * auVar111._4_4_;
            auVar259._8_4_ = fVar341 * auVar111._8_4_;
            auVar259._12_4_ = fVar353 * auVar111._12_4_;
            auVar275._0_4_ = fVar215 * auVar197._0_4_;
            auVar275._4_4_ = fVar263 * auVar197._4_4_;
            auVar275._8_4_ = fVar341 * auVar197._8_4_;
            auVar275._12_4_ = fVar353 * auVar197._12_4_;
            auVar146._0_4_ = fVar405 * auVar111._0_4_;
            auVar146._4_4_ = fVar212 * auVar111._4_4_;
            auVar146._8_4_ = fVar213 * auVar111._8_4_;
            auVar146._12_4_ = fVar214 * auVar111._12_4_;
            auVar195._0_4_ = fVar405 * auVar197._0_4_;
            auVar195._4_4_ = fVar212 * auVar197._4_4_;
            auVar195._8_4_ = fVar213 * auVar197._8_4_;
            auVar195._12_4_ = fVar214 * auVar197._12_4_;
            auVar111 = vminps_avx(auVar259,auVar275);
            auVar197 = vminps_avx(auVar146,auVar195);
            auVar111 = vminps_avx(auVar111,auVar197);
            auVar197 = vmaxps_avx(auVar275,auVar259);
            auVar139 = vmaxps_avx(auVar195,auVar146);
            auVar111 = vhaddps_avx(auVar111,auVar111);
            auVar197 = vmaxps_avx(auVar139,auVar197);
            auVar197 = vhaddps_avx(auVar197,auVar197);
            auVar139 = vmovshdup_avx(auVar10);
            auVar196 = ZEXT416((uint)(auVar139._0_4_ + auVar111._0_4_));
            auVar111 = vmaxss_avx(_local_5c8,auVar196);
            auVar139 = ZEXT416((uint)(auVar139._0_4_ + auVar197._0_4_));
            auVar197 = vminss_avx(auVar139,auVar11);
            auVar412._8_4_ = 0x7fffffff;
            auVar412._0_8_ = 0x7fffffff7fffffff;
            auVar412._12_4_ = 0x7fffffff;
            if (auVar111._0_4_ <= auVar197._0_4_) {
              uVar89 = 0;
              auVar403 = ZEXT864(0) << 0x20;
              if ((fVar210 < fVar394) && (fVar211 < fVar209)) {
                auVar111 = vcmpps_avx(auVar139,auVar11,1);
                auVar197 = vcmpps_avx(_local_5c8,auVar196,1);
                auVar111 = vandps_avx(auVar197,auVar111);
                uVar89 = auVar111._0_4_;
              }
              if (((uint)uVar91 < 4 && 0.001 <= fVar180) && (uVar89 & 1) == 0) {
                bVar76 = false;
              }
              else {
                lVar96 = 200;
                do {
                  fVar394 = auVar10._0_4_;
                  fVar180 = 1.0 - fVar394;
                  auVar111 = ZEXT416((uint)(fVar180 * fVar180 * fVar180));
                  auVar111 = vshufps_avx(auVar111,auVar111,0);
                  auVar197 = ZEXT416((uint)(fVar394 * 3.0 * fVar180 * fVar180));
                  auVar197 = vshufps_avx(auVar197,auVar197,0);
                  auVar139 = ZEXT416((uint)(fVar180 * fVar394 * fVar394 * 3.0));
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  auVar196 = ZEXT416((uint)(fVar394 * fVar394 * fVar394));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  fVar180 = local_518 * auVar111._0_4_ +
                            local_528 * auVar197._0_4_ +
                            (float)local_3c8._0_4_ * auVar196._0_4_ + local_538 * auVar139._0_4_;
                  fVar394 = fStack_514 * auVar111._4_4_ +
                            fStack_524 * auVar197._4_4_ +
                            (float)local_3c8._4_4_ * auVar196._4_4_ + fStack_534 * auVar139._4_4_;
                  auVar147._0_8_ = CONCAT44(fVar394,fVar180);
                  auVar147._8_4_ =
                       fStack_510 * auVar111._8_4_ +
                       fStack_520 * auVar197._8_4_ +
                       fStack_3c0 * auVar196._8_4_ + fStack_530 * auVar139._8_4_;
                  auVar147._12_4_ =
                       fStack_50c * auVar111._12_4_ +
                       fStack_51c * auVar197._12_4_ +
                       fStack_3bc * auVar196._12_4_ + fStack_52c * auVar139._12_4_;
                  auVar198._8_8_ = auVar147._0_8_;
                  auVar198._0_8_ = auVar147._0_8_;
                  auVar197 = vshufpd_avx(auVar147,auVar147,1);
                  auVar111 = vmovshdup_avx(auVar10);
                  auVar197 = vsubps_avx(auVar197,auVar198);
                  auVar148._0_4_ = auVar111._0_4_ * auVar197._0_4_ + fVar180;
                  auVar148._4_4_ = auVar111._4_4_ * auVar197._4_4_ + fVar394;
                  auVar148._8_4_ = auVar111._8_4_ * auVar197._8_4_ + fVar180;
                  auVar148._12_4_ = auVar111._12_4_ * auVar197._12_4_ + fVar394;
                  auVar111 = vshufps_avx(auVar148,auVar148,0);
                  auVar197 = vshufps_avx(auVar148,auVar148,0x55);
                  auVar199._0_4_ = auVar140._0_4_ * auVar111._0_4_ + auVar131._0_4_ * auVar197._0_4_
                  ;
                  auVar199._4_4_ = auVar140._4_4_ * auVar111._4_4_ + auVar131._4_4_ * auVar197._4_4_
                  ;
                  auVar199._8_4_ = auVar140._8_4_ * auVar111._8_4_ + auVar131._8_4_ * auVar197._8_4_
                  ;
                  auVar199._12_4_ =
                       auVar140._12_4_ * auVar111._12_4_ + auVar131._12_4_ * auVar197._12_4_;
                  auVar10 = vsubps_avx(auVar10,auVar199);
                  auVar111 = vandps_avx(auVar412,auVar148);
                  auVar197 = vshufps_avx(auVar111,auVar111,0xf5);
                  auVar111 = vmaxss_avx(auVar197,auVar111);
                  if (auVar111._0_4_ < fVar154) {
                    fVar180 = auVar10._0_4_;
                    if ((0.0 <= fVar180) && (fVar180 <= 1.0)) {
                      auVar140 = vmovshdup_avx(auVar10);
                      fVar394 = auVar140._0_4_;
                      if ((0.0 <= fVar394) && (fVar394 <= 1.0)) {
                        auVar140 = vinsertps_avx(ZEXT416((uint)(pLVar98->vx).field_0.m128[2]),
                                                 ZEXT416((uint)(pLVar98->vy).field_0.m128[2]),0x1c);
                        auVar166 = vinsertps_avx(auVar140,ZEXT416((uint)(pLVar98->vz).field_0.m128
                                                                        [2]),0x28);
                        auVar140 = vdpps_avx(auVar166,local_288,0x7f);
                        auVar131 = vdpps_avx(auVar166,local_298,0x7f);
                        auVar111 = vdpps_avx(auVar166,local_2c8,0x7f);
                        auVar197 = vdpps_avx(auVar166,local_2d8,0x7f);
                        auVar139 = vdpps_avx(auVar166,local_2e8,0x7f);
                        auVar196 = vdpps_avx(auVar166,local_2f8,0x7f);
                        fVar214 = 1.0 - fVar394;
                        auVar115 = vdpps_avx(auVar166,local_2a8,0x7f);
                        auVar166 = vdpps_avx(auVar166,local_2b8,0x7f);
                        fVar215 = 1.0 - fVar180;
                        fVar211 = auVar10._4_4_;
                        fVar405 = auVar10._8_4_;
                        fVar212 = auVar10._12_4_;
                        fVar213 = fVar215 * fVar180 * fVar180 * 3.0;
                        auVar260._0_4_ = fVar180 * fVar180 * fVar180;
                        auVar260._4_4_ = fVar211 * fVar211 * fVar211;
                        auVar260._8_4_ = fVar405 * fVar405 * fVar405;
                        auVar260._12_4_ = fVar212 * fVar212 * fVar212;
                        fVar211 = fVar180 * 3.0 * fVar215 * fVar215;
                        fVar405 = fVar215 * fVar215 * fVar215;
                        fVar180 = (fVar214 * auVar140._0_4_ + fVar394 * auVar111._0_4_) * fVar405 +
                                  (fVar214 * auVar131._0_4_ + fVar394 * auVar197._0_4_) * fVar211 +
                                  fVar213 * (fVar214 * auVar115._0_4_ + fVar394 * auVar139._0_4_) +
                                  auVar260._0_4_ *
                                  (auVar196._0_4_ * fVar394 + fVar214 * auVar166._0_4_);
                        if ((fVar181 <= fVar180) &&
                           (fVar394 = *(float *)(ray + k * 4 + 0x80), fVar180 <= fVar394)) {
                          pGVar23 = (context->scene->geometries).items[local_420].ptr;
                          if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar99 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar99 = true,
                                  pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1c8 = vshufps_avx(auVar10,auVar10,0x55);
                            auVar305._8_4_ = 0x3f800000;
                            auVar305._0_8_ = &DAT_3f8000003f800000;
                            auVar305._12_4_ = 0x3f800000;
                            auVar140 = vsubps_avx(auVar305,local_1c8);
                            fVar212 = local_1c8._0_4_;
                            fVar214 = local_1c8._4_4_;
                            fVar263 = local_1c8._8_4_;
                            fVar341 = local_1c8._12_4_;
                            fVar353 = auVar140._0_4_;
                            fVar355 = auVar140._4_4_;
                            fVar357 = auVar140._8_4_;
                            fVar359 = auVar140._12_4_;
                            auVar323._0_4_ =
                                 fVar212 * (float)local_408._0_4_ + fVar353 * (float)local_3d8._0_4_
                            ;
                            auVar323._4_4_ =
                                 fVar214 * (float)local_408._4_4_ + fVar355 * (float)local_3d8._4_4_
                            ;
                            auVar323._8_4_ = fVar263 * fStack_400 + fVar357 * fStack_3d0;
                            auVar323._12_4_ = fVar341 * fStack_3fc + fVar359 * fStack_3cc;
                            auVar335._0_4_ = fVar212 * (float)local_418._0_4_ + fVar353 * fVar264;
                            auVar335._4_4_ = fVar214 * (float)local_418._4_4_ + fVar355 * fVar265;
                            auVar335._8_4_ = fVar263 * fStack_410 + fVar357 * fVar266;
                            auVar335._12_4_ = fVar341 * fStack_40c + fVar359 * fVar267;
                            auVar347._0_4_ = fVar212 * fVar244 + fVar353 * (float)local_3e8._0_4_;
                            auVar347._4_4_ = fVar214 * fVar245 + fVar355 * (float)local_3e8._4_4_;
                            auVar347._8_4_ = fVar263 * fVar246 + fVar357 * fStack_3e0;
                            auVar347._12_4_ = fVar341 * fVar262 + fVar359 * fStack_3dc;
                            auVar306._0_4_ = fVar212 * fVar240 + fVar353 * (float)local_3f8._0_4_;
                            auVar306._4_4_ = fVar214 * fVar241 + fVar355 * (float)local_3f8._4_4_;
                            auVar306._8_4_ = fVar263 * fVar242 + fVar357 * fStack_3f0;
                            auVar306._12_4_ = fVar341 * fVar243 + fVar359 * fStack_3ec;
                            auVar197 = vsubps_avx(auVar335,auVar323);
                            auVar139 = vsubps_avx(auVar347,auVar335);
                            auVar196 = vsubps_avx(auVar306,auVar347);
                            local_1d8 = vshufps_avx(auVar10,auVar10,0);
                            fVar212 = local_1d8._0_4_;
                            fVar263 = local_1d8._4_4_;
                            fVar341 = local_1d8._8_4_;
                            fVar355 = local_1d8._12_4_;
                            auVar140 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
                            fVar214 = auVar140._0_4_;
                            fVar215 = auVar140._4_4_;
                            fVar353 = auVar140._8_4_;
                            fVar357 = auVar140._12_4_;
                            auVar140 = vshufps_avx(auVar260,auVar260,0);
                            auVar131 = vshufps_avx(ZEXT416((uint)fVar213),ZEXT416((uint)fVar213),0);
                            auVar111 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
                            auVar235._0_4_ =
                                 ((auVar139._0_4_ * fVar214 + auVar196._0_4_ * fVar212) * fVar212 +
                                 (auVar197._0_4_ * fVar214 + auVar139._0_4_ * fVar212) * fVar214) *
                                 3.0;
                            auVar235._4_4_ =
                                 ((auVar139._4_4_ * fVar215 + auVar196._4_4_ * fVar263) * fVar263 +
                                 (auVar197._4_4_ * fVar215 + auVar139._4_4_ * fVar263) * fVar215) *
                                 3.0;
                            auVar235._8_4_ =
                                 ((auVar139._8_4_ * fVar353 + auVar196._8_4_ * fVar341) * fVar341 +
                                 (auVar197._8_4_ * fVar353 + auVar139._8_4_ * fVar341) * fVar353) *
                                 3.0;
                            auVar235._12_4_ =
                                 ((auVar139._12_4_ * fVar357 + auVar196._12_4_ * fVar355) * fVar355
                                 + (auVar197._12_4_ * fVar357 + auVar139._12_4_ * fVar355) * fVar357
                                 ) * 3.0;
                            auVar197 = vshufps_avx(ZEXT416((uint)fVar405),ZEXT416((uint)fVar405),0);
                            auVar171._0_4_ =
                                 auVar197._0_4_ * (float)local_338._0_4_ +
                                 auVar111._0_4_ * (float)local_348._0_4_ +
                                 auVar140._0_4_ * (float)local_368._0_4_ +
                                 auVar131._0_4_ * (float)local_358._0_4_;
                            auVar171._4_4_ =
                                 auVar197._4_4_ * (float)local_338._4_4_ +
                                 auVar111._4_4_ * (float)local_348._4_4_ +
                                 auVar140._4_4_ * (float)local_368._4_4_ +
                                 auVar131._4_4_ * (float)local_358._4_4_;
                            auVar171._8_4_ =
                                 auVar197._8_4_ * fStack_330 +
                                 auVar111._8_4_ * fStack_340 +
                                 auVar140._8_4_ * fStack_360 + auVar131._8_4_ * fStack_350;
                            auVar171._12_4_ =
                                 auVar197._12_4_ * fStack_32c +
                                 auVar111._12_4_ * fStack_33c +
                                 auVar140._12_4_ * fStack_35c + auVar131._12_4_ * fStack_34c;
                            auVar140 = vshufps_avx(auVar235,auVar235,0xc9);
                            auVar200._0_4_ = auVar171._0_4_ * auVar140._0_4_;
                            auVar200._4_4_ = auVar171._4_4_ * auVar140._4_4_;
                            auVar200._8_4_ = auVar171._8_4_ * auVar140._8_4_;
                            auVar200._12_4_ = auVar171._12_4_ * auVar140._12_4_;
                            auVar140 = vshufps_avx(auVar171,auVar171,0xc9);
                            auVar172._0_4_ = auVar235._0_4_ * auVar140._0_4_;
                            auVar172._4_4_ = auVar235._4_4_ * auVar140._4_4_;
                            auVar172._8_4_ = auVar235._8_4_ * auVar140._8_4_;
                            auVar172._12_4_ = auVar235._12_4_ * auVar140._12_4_;
                            auVar131 = vsubps_avx(auVar172,auVar200);
                            auVar140 = vshufps_avx(auVar131,auVar131,0x55);
                            local_208[0] = (RTCHitN)auVar140[0];
                            local_208[1] = (RTCHitN)auVar140[1];
                            local_208[2] = (RTCHitN)auVar140[2];
                            local_208[3] = (RTCHitN)auVar140[3];
                            local_208[4] = (RTCHitN)auVar140[4];
                            local_208[5] = (RTCHitN)auVar140[5];
                            local_208[6] = (RTCHitN)auVar140[6];
                            local_208[7] = (RTCHitN)auVar140[7];
                            local_208[8] = (RTCHitN)auVar140[8];
                            local_208[9] = (RTCHitN)auVar140[9];
                            local_208[10] = (RTCHitN)auVar140[10];
                            local_208[0xb] = (RTCHitN)auVar140[0xb];
                            local_208[0xc] = (RTCHitN)auVar140[0xc];
                            local_208[0xd] = (RTCHitN)auVar140[0xd];
                            local_208[0xe] = (RTCHitN)auVar140[0xe];
                            local_208[0xf] = (RTCHitN)auVar140[0xf];
                            local_1f8 = vshufps_avx(auVar131,auVar131,0xaa);
                            local_1e8 = vshufps_avx(auVar131,auVar131,0);
                            local_1b8 = local_328._0_8_;
                            uStack_1b0 = local_328._8_8_;
                            local_1a8 = local_318._0_8_;
                            uStack_1a0 = local_318._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_194 = context->user->instID[0];
                            local_198 = uStack_194;
                            uStack_190 = uStack_194;
                            uStack_18c = uStack_194;
                            uStack_188 = context->user->instPrimID[0];
                            uStack_184 = uStack_188;
                            uStack_180 = uStack_188;
                            uStack_17c = uStack_188;
                            *(float *)(ray + k * 4 + 0x80) = fVar180;
                            local_448 = *local_438;
                            uStack_440 = local_438[1];
                            local_398.valid = (int *)&local_448;
                            local_398.geometryUserPtr = pGVar23->userPtr;
                            local_398.context = context->user;
                            local_398.ray = (RTCRayN *)ray;
                            local_398.hit = local_208;
                            local_398.N = 4;
                            if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar23->occlusionFilterN)(&local_398);
                            }
                            auVar85._8_8_ = uStack_440;
                            auVar85._0_8_ = local_448;
                            if (auVar85 == (undefined1  [16])0x0) {
                              auVar403 = ZEXT1664(ZEXT816(0));
                              auVar140 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar140 = auVar140 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var28 = context->args->filter;
                              auVar403 = ZEXT1664(ZEXT816(0));
                              if ((p_Var28 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var28)(&local_398);
                                auVar403 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar86._8_8_ = uStack_440;
                              auVar86._0_8_ = local_448;
                              auVar131 = vpcmpeqd_avx(auVar403._0_16_,auVar86);
                              auVar140 = auVar131 ^ _DAT_01febe20;
                              auVar173._8_4_ = 0xff800000;
                              auVar173._0_8_ = 0xff800000ff800000;
                              auVar173._12_4_ = 0xff800000;
                              auVar131 = vblendvps_avx(auVar173,*(undefined1 (*) [16])
                                                                 (local_398.ray + 0x80),auVar131);
                              *(undefined1 (*) [16])(local_398.ray + 0x80) = auVar131;
                            }
                            auVar140 = vpslld_avx(auVar140,0x1f);
                            iVar90 = vmovmskps_avx(auVar140);
                            if (iVar90 == 0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar394;
                            }
                            bVar99 = (char)iVar90 != '\0';
                          }
                          bVar87 = (bool)(bVar87 | bVar99);
                          pLVar98 = local_430;
                        }
                      }
                    }
                    break;
                  }
                  lVar96 = lVar96 + -1;
                } while (lVar96 != 0);
              }
              goto LAB_0120c31d;
            }
          }
          goto LAB_0120c6c8;
        }
      }
LAB_0120c31d:
    } while (bVar76);
    _local_508 = ZEXT416((uint)fVar210);
    local_308 = vinsertps_avx(_local_508,ZEXT416((uint)fVar209),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }